

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Primitive PVar26;
  Geometry *pGVar27;
  __int_type_conflict _Var28;
  long lVar29;
  long lVar30;
  RTCFilterFunctionN p_Var31;
  uint uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  bool bVar100;
  bool bVar101;
  bool bVar102;
  bool bVar103;
  bool bVar104;
  bool bVar105;
  bool bVar106;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  uint uVar120;
  ulong uVar121;
  uint uVar122;
  long lVar123;
  long lVar124;
  long lVar125;
  ulong uVar126;
  ulong uVar127;
  bool bVar128;
  float fVar129;
  float fVar157;
  float fVar159;
  __m128 a;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar163;
  float fVar165;
  float fVar166;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar161;
  undefined1 auVar147 [32];
  float fVar158;
  float fVar160;
  float fVar162;
  float fVar164;
  undefined1 auVar148 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar167;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar207;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar210;
  undefined1 auVar186 [32];
  float fVar168;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar206;
  float fVar208;
  float fVar209;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar179 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  float fVar233;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar234;
  float fVar250;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [28];
  float fVar249;
  float fVar251;
  float fVar252;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar253;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar254;
  float fVar271;
  float fVar272;
  float fVar273;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar269 [32];
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar270 [64];
  float fVar277;
  float fVar292;
  float fVar293;
  undefined1 auVar278 [16];
  float fVar294;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar295;
  float fVar296;
  float fVar298;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar297;
  float fVar299;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar300;
  float fVar301;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar313;
  float fVar315;
  float fVar319;
  float fVar322;
  float fVar326;
  undefined1 auVar305 [32];
  float fVar317;
  float fVar320;
  float fVar323;
  float fVar324;
  float fVar327;
  float fVar328;
  float fVar330;
  undefined1 auVar306 [32];
  float fVar314;
  float fVar316;
  float fVar318;
  float fVar321;
  float fVar325;
  float fVar329;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [64];
  float fVar331;
  float fVar341;
  float fVar342;
  float fVar344;
  float fVar346;
  float fVar348;
  float fVar350;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar343;
  float fVar345;
  float fVar347;
  float fVar349;
  float fVar351;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [64];
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar366;
  float fVar371;
  float fVar376;
  float fVar381;
  float fVar386;
  float fVar391;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar387;
  float fVar388;
  float fVar389;
  float fVar390;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  float fVar410;
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  float fVar411;
  float fVar412;
  undefined1 auVar408 [32];
  undefined1 auVar413 [16];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar421 [16];
  float fVar420;
  float fVar429;
  float fVar430;
  float fVar432;
  float fVar433;
  float fVar434;
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  float fVar431;
  float fVar435;
  undefined1 auVar427 [32];
  float fVar436;
  float fVar443;
  float fVar444;
  float fVar445;
  float fVar446;
  float fVar447;
  float fVar448;
  float in_register_0000151c;
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [64];
  float fVar449;
  float fVar450;
  float fVar457;
  float fVar460;
  float fVar462;
  float fVar464;
  float fVar466;
  float fVar468;
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  float fVar458;
  float fVar461;
  float fVar463;
  float fVar465;
  float fVar467;
  float fVar469;
  undefined1 auVar454 [32];
  float fVar451;
  float fVar459;
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  float in_register_0000159c;
  undefined1 auVar470 [32];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  float in_register_000015dc;
  undefined1 auVar474 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_be0;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined8 local_b40;
  undefined8 uStack_b38;
  float local_b28;
  float local_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined8 *local_a10;
  ulong local_a08;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined8 local_910;
  undefined8 uStack_908;
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined4 uStack_564;
  float local_560 [4];
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540 [4];
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar409 [64];
  undefined1 auVar419 [64];
  undefined1 auVar428 [64];
  
  PVar26 = prim[1];
  uVar126 = (ulong)(byte)PVar26;
  lVar125 = uVar126 * 0x25;
  auVar172 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar172 = vinsertps_avx(auVar172,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar213 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar213 = vinsertps_avx(auVar213,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar172 = vsubps_avx(auVar172,*(undefined1 (*) [16])(prim + lVar125 + 6));
  fVar234 = *(float *)(prim + lVar125 + 0x12);
  auVar169._0_4_ = fVar234 * auVar172._0_4_;
  auVar169._4_4_ = fVar234 * auVar172._4_4_;
  auVar169._8_4_ = fVar234 * auVar172._8_4_;
  auVar169._12_4_ = fVar234 * auVar172._12_4_;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 4 + 6)));
  auVar278._0_4_ = fVar234 * auVar213._0_4_;
  auVar278._4_4_ = fVar234 * auVar213._4_4_;
  auVar278._8_4_ = fVar234 * auVar213._8_4_;
  auVar278._12_4_ = fVar234 * auVar213._12_4_;
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 4 + 10)));
  auVar142._16_16_ = auVar213;
  auVar142._0_16_ = auVar172;
  auVar142 = vcvtdq2ps_avx(auVar142);
  lVar29 = uVar126 * 5;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar29 + 6)));
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar29 + 10)));
  auVar223._16_16_ = auVar213;
  auVar223._0_16_ = auVar172;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 6 + 6)));
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 6 + 10)));
  auVar153 = vcvtdq2ps_avx(auVar223);
  auVar242._16_16_ = auVar213;
  auVar242._0_16_ = auVar172;
  auVar33 = vcvtdq2ps_avx(auVar242);
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xf + 6)));
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0xf + 10)));
  auVar243._16_16_ = auVar213;
  auVar243._0_16_ = auVar172;
  auVar34 = vcvtdq2ps_avx(auVar243);
  lVar123 = (ulong)(byte)PVar26 * 0x10;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + 6)));
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + 10)));
  auVar305._16_16_ = auVar213;
  auVar305._0_16_ = auVar172;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + uVar126 + 6)));
  auVar190 = vcvtdq2ps_avx(auVar305);
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar123 + uVar126 + 10)));
  auVar332._16_16_ = auVar213;
  auVar332._0_16_ = auVar172;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1a + 6)));
  auVar193 = vcvtdq2ps_avx(auVar332);
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1a + 10)));
  auVar333._16_16_ = auVar213;
  auVar333._0_16_ = auVar172;
  auVar456 = vcvtdq2ps_avx(auVar333);
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1b + 6)));
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1b + 10)));
  auVar404._16_16_ = auVar213;
  auVar404._0_16_ = auVar172;
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1c + 6)));
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar126 * 0x1c + 10)));
  auVar35 = vcvtdq2ps_avx(auVar404);
  auVar414._16_16_ = auVar213;
  auVar414._0_16_ = auVar172;
  auVar191 = vcvtdq2ps_avx(auVar414);
  auVar172 = vshufps_avx(auVar278,auVar278,0);
  auVar213 = vshufps_avx(auVar278,auVar278,0x55);
  auVar134 = vshufps_avx(auVar278,auVar278,0xaa);
  fVar234 = auVar134._0_4_;
  fVar168 = auVar134._4_4_;
  fVar249 = auVar134._8_4_;
  fVar208 = auVar134._12_4_;
  fVar233 = auVar213._0_4_;
  fVar210 = auVar213._4_4_;
  fVar250 = auVar213._8_4_;
  fVar163 = auVar213._12_4_;
  fVar251 = auVar172._0_4_;
  fVar252 = auVar172._4_4_;
  fVar253 = auVar172._8_4_;
  fVar254 = auVar172._12_4_;
  auVar437._0_4_ = fVar251 * auVar142._0_4_ + fVar233 * auVar153._0_4_ + fVar234 * auVar33._0_4_;
  auVar437._4_4_ = fVar252 * auVar142._4_4_ + fVar210 * auVar153._4_4_ + fVar168 * auVar33._4_4_;
  auVar437._8_4_ = fVar253 * auVar142._8_4_ + fVar250 * auVar153._8_4_ + fVar249 * auVar33._8_4_;
  auVar437._12_4_ = fVar254 * auVar142._12_4_ + fVar163 * auVar153._12_4_ + fVar208 * auVar33._12_4_
  ;
  auVar437._16_4_ = fVar251 * auVar142._16_4_ + fVar233 * auVar153._16_4_ + fVar234 * auVar33._16_4_
  ;
  auVar437._20_4_ = fVar252 * auVar142._20_4_ + fVar210 * auVar153._20_4_ + fVar168 * auVar33._20_4_
  ;
  auVar437._24_4_ = fVar253 * auVar142._24_4_ + fVar250 * auVar153._24_4_ + fVar249 * auVar33._24_4_
  ;
  auVar437._28_4_ = fVar163 + in_register_000015dc + in_register_0000151c;
  auVar422._0_4_ = fVar251 * auVar34._0_4_ + fVar233 * auVar190._0_4_ + auVar193._0_4_ * fVar234;
  auVar422._4_4_ = fVar252 * auVar34._4_4_ + fVar210 * auVar190._4_4_ + auVar193._4_4_ * fVar168;
  auVar422._8_4_ = fVar253 * auVar34._8_4_ + fVar250 * auVar190._8_4_ + auVar193._8_4_ * fVar249;
  auVar422._12_4_ = fVar254 * auVar34._12_4_ + fVar163 * auVar190._12_4_ + auVar193._12_4_ * fVar208
  ;
  auVar422._16_4_ = fVar251 * auVar34._16_4_ + fVar233 * auVar190._16_4_ + auVar193._16_4_ * fVar234
  ;
  auVar422._20_4_ = fVar252 * auVar34._20_4_ + fVar210 * auVar190._20_4_ + auVar193._20_4_ * fVar168
  ;
  auVar422._24_4_ = fVar253 * auVar34._24_4_ + fVar250 * auVar190._24_4_ + auVar193._24_4_ * fVar249
  ;
  auVar422._28_4_ = fVar163 + in_register_000015dc + in_register_0000159c;
  auVar284._0_4_ = fVar251 * auVar456._0_4_ + fVar233 * auVar35._0_4_ + auVar191._0_4_ * fVar234;
  auVar284._4_4_ = fVar252 * auVar456._4_4_ + fVar210 * auVar35._4_4_ + auVar191._4_4_ * fVar168;
  auVar284._8_4_ = fVar253 * auVar456._8_4_ + fVar250 * auVar35._8_4_ + auVar191._8_4_ * fVar249;
  auVar284._12_4_ = fVar254 * auVar456._12_4_ + fVar163 * auVar35._12_4_ + auVar191._12_4_ * fVar208
  ;
  auVar284._16_4_ = fVar251 * auVar456._16_4_ + fVar233 * auVar35._16_4_ + auVar191._16_4_ * fVar234
  ;
  auVar284._20_4_ = fVar252 * auVar456._20_4_ + fVar210 * auVar35._20_4_ + auVar191._20_4_ * fVar168
  ;
  auVar284._24_4_ = fVar253 * auVar456._24_4_ + fVar250 * auVar35._24_4_ + auVar191._24_4_ * fVar249
  ;
  auVar284._28_4_ = fVar254 + fVar163 + fVar208;
  auVar172 = vshufps_avx(auVar169,auVar169,0);
  auVar213 = vshufps_avx(auVar169,auVar169,0x55);
  auVar134 = vshufps_avx(auVar169,auVar169,0xaa);
  fVar234 = auVar134._0_4_;
  fVar168 = auVar134._4_4_;
  fVar249 = auVar134._8_4_;
  fVar208 = auVar134._12_4_;
  fVar252 = auVar213._0_4_;
  fVar253 = auVar213._4_4_;
  fVar254 = auVar213._8_4_;
  fVar271 = auVar213._12_4_;
  fVar233 = auVar153._28_4_ + auVar33._28_4_;
  fVar210 = auVar172._0_4_;
  fVar250 = auVar172._4_4_;
  fVar163 = auVar172._8_4_;
  fVar251 = auVar172._12_4_;
  auVar186._0_4_ = fVar210 * auVar142._0_4_ + fVar252 * auVar153._0_4_ + fVar234 * auVar33._0_4_;
  auVar186._4_4_ = fVar250 * auVar142._4_4_ + fVar253 * auVar153._4_4_ + fVar168 * auVar33._4_4_;
  auVar186._8_4_ = fVar163 * auVar142._8_4_ + fVar254 * auVar153._8_4_ + fVar249 * auVar33._8_4_;
  auVar186._12_4_ = fVar251 * auVar142._12_4_ + fVar271 * auVar153._12_4_ + fVar208 * auVar33._12_4_
  ;
  auVar186._16_4_ = fVar210 * auVar142._16_4_ + fVar252 * auVar153._16_4_ + fVar234 * auVar33._16_4_
  ;
  auVar186._20_4_ = fVar250 * auVar142._20_4_ + fVar253 * auVar153._20_4_ + fVar168 * auVar33._20_4_
  ;
  auVar186._24_4_ = fVar163 * auVar142._24_4_ + fVar254 * auVar153._24_4_ + fVar249 * auVar33._24_4_
  ;
  auVar186._28_4_ = auVar142._28_4_ + fVar233;
  auVar143._0_4_ = fVar210 * auVar34._0_4_ + auVar193._0_4_ * fVar234 + fVar252 * auVar190._0_4_;
  auVar143._4_4_ = fVar250 * auVar34._4_4_ + auVar193._4_4_ * fVar168 + fVar253 * auVar190._4_4_;
  auVar143._8_4_ = fVar163 * auVar34._8_4_ + auVar193._8_4_ * fVar249 + fVar254 * auVar190._8_4_;
  auVar143._12_4_ = fVar251 * auVar34._12_4_ + auVar193._12_4_ * fVar208 + fVar271 * auVar190._12_4_
  ;
  auVar143._16_4_ = fVar210 * auVar34._16_4_ + auVar193._16_4_ * fVar234 + fVar252 * auVar190._16_4_
  ;
  auVar143._20_4_ = fVar250 * auVar34._20_4_ + auVar193._20_4_ * fVar168 + fVar253 * auVar190._20_4_
  ;
  auVar143._24_4_ = fVar163 * auVar34._24_4_ + auVar193._24_4_ * fVar249 + fVar254 * auVar190._24_4_
  ;
  auVar143._28_4_ = auVar142._28_4_ + auVar193._28_4_ + auVar33._28_4_;
  auVar334._8_4_ = 0x7fffffff;
  auVar334._0_8_ = 0x7fffffff7fffffff;
  auVar334._12_4_ = 0x7fffffff;
  auVar334._16_4_ = 0x7fffffff;
  auVar334._20_4_ = 0x7fffffff;
  auVar334._24_4_ = 0x7fffffff;
  auVar334._28_4_ = 0x7fffffff;
  auVar357._8_4_ = 0x219392ef;
  auVar357._0_8_ = 0x219392ef219392ef;
  auVar357._12_4_ = 0x219392ef;
  auVar357._16_4_ = 0x219392ef;
  auVar357._20_4_ = 0x219392ef;
  auVar357._24_4_ = 0x219392ef;
  auVar357._28_4_ = 0x219392ef;
  auVar142 = vandps_avx(auVar437,auVar334);
  auVar142 = vcmpps_avx(auVar142,auVar357,1);
  auVar153 = vblendvps_avx(auVar437,auVar357,auVar142);
  auVar142 = vandps_avx(auVar422,auVar334);
  auVar142 = vcmpps_avx(auVar142,auVar357,1);
  auVar33 = vblendvps_avx(auVar422,auVar357,auVar142);
  auVar142 = vandps_avx(auVar284,auVar334);
  auVar142 = vcmpps_avx(auVar142,auVar357,1);
  auVar142 = vblendvps_avx(auVar284,auVar357,auVar142);
  auVar224._0_4_ = fVar210 * auVar456._0_4_ + fVar252 * auVar35._0_4_ + auVar191._0_4_ * fVar234;
  auVar224._4_4_ = fVar250 * auVar456._4_4_ + fVar253 * auVar35._4_4_ + auVar191._4_4_ * fVar168;
  auVar224._8_4_ = fVar163 * auVar456._8_4_ + fVar254 * auVar35._8_4_ + auVar191._8_4_ * fVar249;
  auVar224._12_4_ = fVar251 * auVar456._12_4_ + fVar271 * auVar35._12_4_ + auVar191._12_4_ * fVar208
  ;
  auVar224._16_4_ = fVar210 * auVar456._16_4_ + fVar252 * auVar35._16_4_ + auVar191._16_4_ * fVar234
  ;
  auVar224._20_4_ = fVar250 * auVar456._20_4_ + fVar253 * auVar35._20_4_ + auVar191._20_4_ * fVar168
  ;
  auVar224._24_4_ = fVar163 * auVar456._24_4_ + fVar254 * auVar35._24_4_ + auVar191._24_4_ * fVar249
  ;
  auVar224._28_4_ = fVar233 + auVar190._28_4_ + fVar208;
  auVar34 = vrcpps_avx(auVar153);
  fVar234 = auVar34._0_4_;
  fVar249 = auVar34._4_4_;
  auVar190._4_4_ = auVar153._4_4_ * fVar249;
  auVar190._0_4_ = auVar153._0_4_ * fVar234;
  fVar233 = auVar34._8_4_;
  auVar190._8_4_ = auVar153._8_4_ * fVar233;
  fVar250 = auVar34._12_4_;
  auVar190._12_4_ = auVar153._12_4_ * fVar250;
  fVar251 = auVar34._16_4_;
  auVar190._16_4_ = auVar153._16_4_ * fVar251;
  fVar252 = auVar34._20_4_;
  auVar190._20_4_ = auVar153._20_4_ * fVar252;
  fVar253 = auVar34._24_4_;
  auVar190._24_4_ = auVar153._24_4_ * fVar253;
  auVar190._28_4_ = auVar153._28_4_;
  auVar358._8_4_ = 0x3f800000;
  auVar358._0_8_ = &DAT_3f8000003f800000;
  auVar358._12_4_ = 0x3f800000;
  auVar358._16_4_ = 0x3f800000;
  auVar358._20_4_ = 0x3f800000;
  auVar358._24_4_ = 0x3f800000;
  auVar358._28_4_ = 0x3f800000;
  auVar193 = vsubps_avx(auVar358,auVar190);
  auVar190 = vrcpps_avx(auVar33);
  fVar234 = fVar234 + fVar234 * auVar193._0_4_;
  fVar249 = fVar249 + fVar249 * auVar193._4_4_;
  fVar233 = fVar233 + fVar233 * auVar193._8_4_;
  fVar250 = fVar250 + fVar250 * auVar193._12_4_;
  fVar251 = fVar251 + fVar251 * auVar193._16_4_;
  fVar252 = fVar252 + fVar252 * auVar193._20_4_;
  fVar253 = fVar253 + fVar253 * auVar193._24_4_;
  fVar254 = auVar190._0_4_;
  fVar271 = auVar190._4_4_;
  auVar153._4_4_ = fVar271 * auVar33._4_4_;
  auVar153._0_4_ = fVar254 * auVar33._0_4_;
  fVar272 = auVar190._8_4_;
  auVar153._8_4_ = fVar272 * auVar33._8_4_;
  fVar273 = auVar190._12_4_;
  auVar153._12_4_ = fVar273 * auVar33._12_4_;
  fVar274 = auVar190._16_4_;
  auVar153._16_4_ = fVar274 * auVar33._16_4_;
  fVar275 = auVar190._20_4_;
  auVar153._20_4_ = fVar275 * auVar33._20_4_;
  fVar276 = auVar190._24_4_;
  auVar153._24_4_ = fVar276 * auVar33._24_4_;
  auVar153._28_4_ = auVar33._28_4_;
  auVar33 = vsubps_avx(auVar358,auVar153);
  fVar254 = fVar254 + fVar254 * auVar33._0_4_;
  fVar271 = fVar271 + fVar271 * auVar33._4_4_;
  fVar272 = fVar272 + fVar272 * auVar33._8_4_;
  fVar273 = fVar273 + fVar273 * auVar33._12_4_;
  fVar274 = fVar274 + fVar274 * auVar33._16_4_;
  fVar275 = fVar275 + fVar275 * auVar33._20_4_;
  fVar276 = fVar276 + fVar276 * auVar33._24_4_;
  auVar153 = vrcpps_avx(auVar142);
  fVar277 = auVar153._0_4_;
  fVar292 = auVar153._4_4_;
  auVar456._4_4_ = fVar292 * auVar142._4_4_;
  auVar456._0_4_ = fVar277 * auVar142._0_4_;
  fVar293 = auVar153._8_4_;
  auVar456._8_4_ = fVar293 * auVar142._8_4_;
  fVar294 = auVar153._12_4_;
  auVar456._12_4_ = fVar294 * auVar142._12_4_;
  fVar295 = auVar153._16_4_;
  auVar456._16_4_ = fVar295 * auVar142._16_4_;
  fVar296 = auVar153._20_4_;
  auVar456._20_4_ = fVar296 * auVar142._20_4_;
  fVar298 = auVar153._24_4_;
  auVar456._24_4_ = fVar298 * auVar142._24_4_;
  auVar456._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar358,auVar456);
  fVar277 = fVar277 + fVar277 * auVar142._0_4_;
  fVar292 = fVar292 + fVar292 * auVar142._4_4_;
  fVar293 = fVar293 + fVar293 * auVar142._8_4_;
  fVar294 = fVar294 + fVar294 * auVar142._12_4_;
  fVar295 = fVar295 + fVar295 * auVar142._16_4_;
  fVar296 = fVar296 + fVar296 * auVar142._20_4_;
  fVar298 = fVar298 + fVar298 * auVar142._24_4_;
  auVar172 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar125 + 0x16)) *
                           *(float *)(prim + lVar125 + 0x1a)));
  auVar173 = vshufps_avx(auVar172,auVar172,0);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *(ulong *)(prim + uVar126 * 7 + 6);
  auVar172 = vpmovsxwd_avx(auVar172);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar126 * 7 + 0xe);
  auVar213 = vpmovsxwd_avx(auVar213);
  auVar335._16_16_ = auVar213;
  auVar335._0_16_ = auVar172;
  auVar142 = vcvtdq2ps_avx(auVar335);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar126 * 0xb + 6);
  auVar172 = vpmovsxwd_avx(auVar134);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar126 * 0xb + 0xe);
  auVar213 = vpmovsxwd_avx(auVar215);
  auVar359._16_16_ = auVar213;
  auVar359._0_16_ = auVar172;
  auVar153 = vcvtdq2ps_avx(auVar359);
  auVar153 = vsubps_avx(auVar153,auVar142);
  fVar168 = auVar173._0_4_;
  fVar208 = auVar173._4_4_;
  fVar210 = auVar173._8_4_;
  fVar163 = auVar173._12_4_;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar126 * 9 + 6);
  auVar172 = vpmovsxwd_avx(auVar173);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar126 * 9 + 0xe);
  auVar213 = vpmovsxwd_avx(auVar133);
  auVar336._0_4_ = auVar153._0_4_ * fVar168 + auVar142._0_4_;
  auVar336._4_4_ = auVar153._4_4_ * fVar208 + auVar142._4_4_;
  auVar336._8_4_ = auVar153._8_4_ * fVar210 + auVar142._8_4_;
  auVar336._12_4_ = auVar153._12_4_ * fVar163 + auVar142._12_4_;
  auVar336._16_4_ = auVar153._16_4_ * fVar168 + auVar142._16_4_;
  auVar336._20_4_ = auVar153._20_4_ * fVar208 + auVar142._20_4_;
  auVar336._24_4_ = auVar153._24_4_ * fVar210 + auVar142._24_4_;
  auVar336._28_4_ = auVar153._28_4_ + auVar142._28_4_;
  auVar360._16_16_ = auVar213;
  auVar360._0_16_ = auVar172;
  auVar142 = vcvtdq2ps_avx(auVar360);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar126 * 0xd + 6);
  auVar172 = vpmovsxwd_avx(auVar176);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar126 * 0xd + 0xe);
  auVar213 = vpmovsxwd_avx(auVar182);
  auVar405._16_16_ = auVar213;
  auVar405._0_16_ = auVar172;
  auVar153 = vcvtdq2ps_avx(auVar405);
  auVar153 = vsubps_avx(auVar153,auVar142);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar126 * 0x12 + 6);
  auVar172 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar126 * 0x12 + 0xe);
  auVar213 = vpmovsxwd_avx(auVar11);
  auVar361._0_4_ = auVar142._0_4_ + auVar153._0_4_ * fVar168;
  auVar361._4_4_ = auVar142._4_4_ + auVar153._4_4_ * fVar208;
  auVar361._8_4_ = auVar142._8_4_ + auVar153._8_4_ * fVar210;
  auVar361._12_4_ = auVar142._12_4_ + auVar153._12_4_ * fVar163;
  auVar361._16_4_ = auVar142._16_4_ + auVar153._16_4_ * fVar168;
  auVar361._20_4_ = auVar142._20_4_ + auVar153._20_4_ * fVar208;
  auVar361._24_4_ = auVar142._24_4_ + auVar153._24_4_ * fVar210;
  auVar361._28_4_ = auVar142._28_4_ + auVar153._28_4_;
  auVar406._16_16_ = auVar213;
  auVar406._0_16_ = auVar172;
  auVar142 = vcvtdq2ps_avx(auVar406);
  uVar121 = (ulong)(uint)((int)lVar29 << 2);
  lVar125 = uVar126 * 2 + uVar121;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar172 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar213 = vpmovsxwd_avx(auVar13);
  auVar415._16_16_ = auVar213;
  auVar415._0_16_ = auVar172;
  auVar153 = vcvtdq2ps_avx(auVar415);
  auVar153 = vsubps_avx(auVar153,auVar142);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar121 + 6);
  auVar172 = vpmovsxwd_avx(auVar14);
  auVar407._0_4_ = auVar142._0_4_ + auVar153._0_4_ * fVar168;
  auVar407._4_4_ = auVar142._4_4_ + auVar153._4_4_ * fVar208;
  auVar407._8_4_ = auVar142._8_4_ + auVar153._8_4_ * fVar210;
  auVar407._12_4_ = auVar142._12_4_ + auVar153._12_4_ * fVar163;
  auVar407._16_4_ = auVar142._16_4_ + auVar153._16_4_ * fVar168;
  auVar407._20_4_ = auVar142._20_4_ + auVar153._20_4_ * fVar208;
  auVar407._24_4_ = auVar142._24_4_ + auVar153._24_4_ * fVar210;
  auVar407._28_4_ = auVar142._28_4_ + auVar153._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar121 + 0xe);
  auVar213 = vpmovsxwd_avx(auVar15);
  auVar416._16_16_ = auVar213;
  auVar416._0_16_ = auVar172;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar126 * 0x18 + 6);
  auVar172 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar126 * 0x18 + 0xe);
  auVar213 = vpmovsxwd_avx(auVar17);
  auVar142 = vcvtdq2ps_avx(auVar416);
  auVar423._16_16_ = auVar213;
  auVar423._0_16_ = auVar172;
  auVar153 = vcvtdq2ps_avx(auVar423);
  auVar153 = vsubps_avx(auVar153,auVar142);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar126 * 0x1d + 6);
  auVar172 = vpmovsxwd_avx(auVar18);
  auVar417._0_4_ = auVar142._0_4_ + auVar153._0_4_ * fVar168;
  auVar417._4_4_ = auVar142._4_4_ + auVar153._4_4_ * fVar208;
  auVar417._8_4_ = auVar142._8_4_ + auVar153._8_4_ * fVar210;
  auVar417._12_4_ = auVar142._12_4_ + auVar153._12_4_ * fVar163;
  auVar417._16_4_ = auVar142._16_4_ + auVar153._16_4_ * fVar168;
  auVar417._20_4_ = auVar142._20_4_ + auVar153._20_4_ * fVar208;
  auVar417._24_4_ = auVar142._24_4_ + auVar153._24_4_ * fVar210;
  auVar417._28_4_ = auVar142._28_4_ + auVar153._28_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar126 * 0x1d + 0xe);
  auVar213 = vpmovsxwd_avx(auVar19);
  lVar125 = uVar126 + (ulong)(byte)PVar26 * 0x20;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar134 = vpmovsxwd_avx(auVar20);
  auVar424._16_16_ = auVar213;
  auVar424._0_16_ = auVar172;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar172 = vpmovsxwd_avx(auVar21);
  auVar438._16_16_ = auVar172;
  auVar438._0_16_ = auVar134;
  auVar142 = vcvtdq2ps_avx(auVar424);
  auVar153 = vcvtdq2ps_avx(auVar438);
  auVar153 = vsubps_avx(auVar153,auVar142);
  auVar425._0_4_ = auVar142._0_4_ + auVar153._0_4_ * fVar168;
  auVar425._4_4_ = auVar142._4_4_ + auVar153._4_4_ * fVar208;
  auVar425._8_4_ = auVar142._8_4_ + auVar153._8_4_ * fVar210;
  auVar425._12_4_ = auVar142._12_4_ + auVar153._12_4_ * fVar163;
  auVar425._16_4_ = auVar142._16_4_ + auVar153._16_4_ * fVar168;
  auVar425._20_4_ = auVar142._20_4_ + auVar153._20_4_ * fVar208;
  auVar425._24_4_ = auVar142._24_4_ + auVar153._24_4_ * fVar210;
  auVar425._28_4_ = auVar142._28_4_ + auVar153._28_4_;
  lVar125 = (ulong)(byte)PVar26 * 0x20 - uVar126;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar125 + 6);
  auVar172 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar125 + 0xe);
  auVar213 = vpmovsxwd_avx(auVar23);
  auVar439._16_16_ = auVar213;
  auVar439._0_16_ = auVar172;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar126 * 0x23 + 6);
  auVar172 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar126 * 0x23 + 0xe);
  auVar213 = vpmovsxwd_avx(auVar25);
  auVar452._16_16_ = auVar213;
  auVar452._0_16_ = auVar172;
  auVar142 = vcvtdq2ps_avx(auVar439);
  auVar153 = vcvtdq2ps_avx(auVar452);
  auVar153 = vsubps_avx(auVar153,auVar142);
  auVar440._0_4_ = auVar142._0_4_ + auVar153._0_4_ * fVar168;
  auVar440._4_4_ = auVar142._4_4_ + auVar153._4_4_ * fVar208;
  auVar440._8_4_ = auVar142._8_4_ + auVar153._8_4_ * fVar210;
  auVar440._12_4_ = auVar142._12_4_ + auVar153._12_4_ * fVar163;
  auVar440._16_4_ = auVar142._16_4_ + auVar153._16_4_ * fVar168;
  auVar440._20_4_ = auVar142._20_4_ + auVar153._20_4_ * fVar208;
  auVar440._24_4_ = auVar142._24_4_ + auVar153._24_4_ * fVar210;
  auVar440._28_4_ = auVar142._28_4_ + fVar163;
  auVar142 = vsubps_avx(auVar336,auVar186);
  auVar302._0_4_ = fVar234 * auVar142._0_4_;
  auVar302._4_4_ = fVar249 * auVar142._4_4_;
  auVar302._8_4_ = fVar233 * auVar142._8_4_;
  auVar302._12_4_ = fVar250 * auVar142._12_4_;
  auVar35._16_4_ = fVar251 * auVar142._16_4_;
  auVar35._0_16_ = auVar302;
  auVar35._20_4_ = fVar252 * auVar142._20_4_;
  auVar35._24_4_ = fVar253 * auVar142._24_4_;
  auVar35._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar361,auVar186);
  auVar235._0_4_ = fVar234 * auVar142._0_4_;
  auVar235._4_4_ = fVar249 * auVar142._4_4_;
  auVar235._8_4_ = fVar233 * auVar142._8_4_;
  auVar235._12_4_ = fVar250 * auVar142._12_4_;
  auVar191._16_4_ = fVar251 * auVar142._16_4_;
  auVar191._0_16_ = auVar235;
  auVar191._20_4_ = fVar252 * auVar142._20_4_;
  auVar191._24_4_ = fVar253 * auVar142._24_4_;
  auVar191._28_4_ = auVar34._28_4_ + auVar193._28_4_;
  auVar142 = vsubps_avx(auVar407,auVar143);
  auVar170._0_4_ = fVar254 * auVar142._0_4_;
  auVar170._4_4_ = fVar271 * auVar142._4_4_;
  auVar170._8_4_ = fVar272 * auVar142._8_4_;
  auVar170._12_4_ = fVar273 * auVar142._12_4_;
  auVar34._16_4_ = fVar274 * auVar142._16_4_;
  auVar34._0_16_ = auVar170;
  auVar34._20_4_ = fVar275 * auVar142._20_4_;
  auVar34._24_4_ = fVar276 * auVar142._24_4_;
  auVar34._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar417,auVar143);
  auVar255._0_4_ = fVar254 * auVar142._0_4_;
  auVar255._4_4_ = fVar271 * auVar142._4_4_;
  auVar255._8_4_ = fVar272 * auVar142._8_4_;
  auVar255._12_4_ = fVar273 * auVar142._12_4_;
  auVar193._16_4_ = fVar274 * auVar142._16_4_;
  auVar193._0_16_ = auVar255;
  auVar193._20_4_ = fVar275 * auVar142._20_4_;
  auVar193._24_4_ = fVar276 * auVar142._24_4_;
  auVar193._28_4_ = auVar190._28_4_ + auVar33._28_4_;
  auVar142 = vsubps_avx(auVar425,auVar224);
  auVar130._0_4_ = fVar277 * auVar142._0_4_;
  auVar130._4_4_ = fVar292 * auVar142._4_4_;
  auVar130._8_4_ = fVar293 * auVar142._8_4_;
  auVar130._12_4_ = fVar294 * auVar142._12_4_;
  auVar33._16_4_ = fVar295 * auVar142._16_4_;
  auVar33._0_16_ = auVar130;
  auVar33._20_4_ = fVar296 * auVar142._20_4_;
  auVar33._24_4_ = fVar298 * auVar142._24_4_;
  auVar33._28_4_ = auVar142._28_4_;
  auVar142 = vsubps_avx(auVar440,auVar224);
  auVar211._0_4_ = fVar277 * auVar142._0_4_;
  auVar211._4_4_ = fVar292 * auVar142._4_4_;
  auVar211._8_4_ = fVar293 * auVar142._8_4_;
  auVar211._12_4_ = fVar294 * auVar142._12_4_;
  auVar44._16_4_ = fVar295 * auVar142._16_4_;
  auVar44._0_16_ = auVar211;
  auVar44._20_4_ = fVar296 * auVar142._20_4_;
  auVar44._24_4_ = fVar298 * auVar142._24_4_;
  auVar44._28_4_ = auVar142._28_4_;
  auVar172 = vpminsd_avx(auVar35._16_16_,auVar191._16_16_);
  auVar213 = vpminsd_avx(auVar302,auVar235);
  auVar362._16_16_ = auVar172;
  auVar362._0_16_ = auVar213;
  auVar172 = vpminsd_avx(auVar34._16_16_,auVar193._16_16_);
  auVar213 = vpminsd_avx(auVar170,auVar255);
  auVar426._16_16_ = auVar172;
  auVar426._0_16_ = auVar213;
  auVar142 = vmaxps_avx(auVar362,auVar426);
  auVar172 = vpminsd_avx(auVar33._16_16_,auVar44._16_16_);
  auVar213 = vpminsd_avx(auVar130,auVar211);
  auVar453._16_16_ = auVar172;
  auVar453._0_16_ = auVar213;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar470._4_4_ = uVar8;
  auVar470._0_4_ = uVar8;
  auVar470._8_4_ = uVar8;
  auVar470._12_4_ = uVar8;
  auVar470._16_4_ = uVar8;
  auVar470._20_4_ = uVar8;
  auVar470._24_4_ = uVar8;
  auVar470._28_4_ = uVar8;
  auVar153 = vmaxps_avx(auVar453,auVar470);
  auVar142 = vmaxps_avx(auVar142,auVar153);
  local_2c0._4_4_ = auVar142._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar142._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar142._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar142._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar142._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar142._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar142._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar142._28_4_;
  auVar172 = vpmaxsd_avx(auVar35._16_16_,auVar191._16_16_);
  auVar213 = vpmaxsd_avx(auVar302,auVar235);
  auVar244._16_16_ = auVar172;
  auVar244._0_16_ = auVar213;
  auVar172 = vpmaxsd_avx(auVar34._16_16_,auVar193._16_16_);
  auVar213 = vpmaxsd_avx(auVar170,auVar255);
  auVar187._16_16_ = auVar172;
  auVar187._0_16_ = auVar213;
  auVar142 = vminps_avx(auVar244,auVar187);
  auVar172 = vpmaxsd_avx(auVar33._16_16_,auVar44._16_16_);
  auVar213 = vpmaxsd_avx(auVar130,auVar211);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar225._4_4_ = uVar8;
  auVar225._0_4_ = uVar8;
  auVar225._8_4_ = uVar8;
  auVar225._12_4_ = uVar8;
  auVar225._16_4_ = uVar8;
  auVar225._20_4_ = uVar8;
  auVar225._24_4_ = uVar8;
  auVar225._28_4_ = uVar8;
  auVar144._16_16_ = auVar172;
  auVar144._0_16_ = auVar213;
  auVar153 = vminps_avx(auVar144,auVar225);
  auVar142 = vminps_avx(auVar142,auVar153);
  auVar45._4_4_ = auVar142._4_4_ * 1.0000004;
  auVar45._0_4_ = auVar142._0_4_ * 1.0000004;
  auVar45._8_4_ = auVar142._8_4_ * 1.0000004;
  auVar45._12_4_ = auVar142._12_4_ * 1.0000004;
  auVar45._16_4_ = auVar142._16_4_ * 1.0000004;
  auVar45._20_4_ = auVar142._20_4_ * 1.0000004;
  auVar45._24_4_ = auVar142._24_4_ * 1.0000004;
  auVar45._28_4_ = auVar142._28_4_;
  auVar142 = vcmpps_avx(local_2c0,auVar45,2);
  auVar172 = vpshufd_avx(ZEXT116((byte)PVar26),0);
  auVar188._16_16_ = auVar172;
  auVar188._0_16_ = auVar172;
  auVar153 = vcvtdq2ps_avx(auVar188);
  auVar153 = vcmpps_avx(_DAT_02020f40,auVar153,1);
  auVar142 = vandps_avx(auVar142,auVar153);
  uVar120 = vmovmskps_avx(auVar142);
  if (uVar120 == 0) {
    return;
  }
  uVar120 = uVar120 & 0xff;
  auVar145._16_16_ = mm_lookupmask_ps._240_16_;
  auVar145._0_16_ = mm_lookupmask_ps._240_16_;
  local_280 = vblendps_avx(auVar145,ZEXT832(0) << 0x20,0x80);
  local_a10 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar340 = ZEXT1664((undefined1  [16])0x0);
  local_8f0 = prim;
LAB_012183f2:
  local_8e8 = (ulong)uVar120;
  lVar125 = 0;
  if (local_8e8 != 0) {
    for (; (uVar120 >> lVar125 & 1) == 0; lVar125 = lVar125 + 1) {
    }
  }
  uVar120 = *(uint *)(local_8f0 + 2);
  local_a08 = (ulong)*(uint *)(local_8f0 + lVar125 * 4 + 6);
  pGVar27 = (context->scene->geometries).items[uVar120].ptr;
  uVar126 = (ulong)*(uint *)(*(long *)&pGVar27->field_0x58 +
                            local_a08 *
                            pGVar27[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar234 = (pGVar27->time_range).lower;
  fVar234 = pGVar27->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar234) / ((pGVar27->time_range).upper - fVar234));
  auVar172 = vroundss_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),9);
  auVar172 = vminss_avx(auVar172,ZEXT416((uint)(pGVar27->fnumTimeSegments + -1.0)));
  auVar172 = vmaxss_avx(auVar340._0_16_,auVar172);
  fVar234 = fVar234 - auVar172._0_4_;
  _Var28 = pGVar27[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar124 = (long)(int)auVar172._0_4_ * 0x38;
  lVar29 = *(long *)(_Var28 + 0x10 + lVar124);
  lVar123 = *(long *)(_Var28 + 0x38 + lVar124);
  lVar30 = *(long *)(_Var28 + 0x48 + lVar124);
  auVar172 = vshufps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),0);
  pfVar1 = (float *)(lVar123 + uVar126 * lVar30);
  fVar210 = auVar172._0_4_;
  fVar250 = auVar172._4_4_;
  fVar163 = auVar172._8_4_;
  fVar251 = auVar172._12_4_;
  pfVar2 = (float *)(lVar123 + (uVar126 + 1) * lVar30);
  pfVar3 = (float *)(lVar123 + (uVar126 + 2) * lVar30);
  pfVar4 = (float *)(lVar123 + lVar30 * (uVar126 + 3));
  lVar123 = *(long *)(_Var28 + lVar124);
  auVar172 = vshufps_avx(ZEXT416((uint)(1.0 - fVar234)),ZEXT416((uint)(1.0 - fVar234)),0);
  pfVar5 = (float *)(lVar123 + lVar29 * uVar126);
  fVar168 = auVar172._0_4_;
  fVar249 = auVar172._4_4_;
  fVar208 = auVar172._8_4_;
  fVar233 = auVar172._12_4_;
  pfVar6 = (float *)(lVar123 + lVar29 * (uVar126 + 1));
  pfVar7 = (float *)(lVar123 + lVar29 * (uVar126 + 2));
  auVar212._0_4_ = fVar210 * *pfVar1 + fVar168 * *pfVar5;
  auVar212._4_4_ = fVar250 * pfVar1[1] + fVar249 * pfVar5[1];
  auVar212._8_4_ = fVar163 * pfVar1[2] + fVar208 * pfVar5[2];
  auVar212._12_4_ = fVar251 * pfVar1[3] + fVar233 * pfVar5[3];
  auVar171._0_4_ = fVar168 * *pfVar6 + fVar210 * *pfVar2;
  auVar171._4_4_ = fVar249 * pfVar6[1] + fVar250 * pfVar2[1];
  auVar171._8_4_ = fVar208 * pfVar6[2] + fVar163 * pfVar2[2];
  auVar171._12_4_ = fVar233 * pfVar6[3] + fVar251 * pfVar2[3];
  pfVar1 = (float *)(lVar123 + lVar29 * (uVar126 + 3));
  auVar236._0_4_ = fVar168 * *pfVar7 + fVar210 * *pfVar3;
  auVar236._4_4_ = fVar249 * pfVar7[1] + fVar250 * pfVar3[1];
  auVar236._8_4_ = fVar208 * pfVar7[2] + fVar163 * pfVar3[2];
  auVar236._12_4_ = fVar233 * pfVar7[3] + fVar251 * pfVar3[3];
  auVar172 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar213 = vinsertps_avx(auVar172,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar234 = *(float *)(ray + k * 4 + 0x40);
  auVar401._4_4_ = fVar234;
  auVar401._0_4_ = fVar234;
  auVar401._8_4_ = fVar234;
  auVar401._12_4_ = fVar234;
  fStack_7f0 = fVar234;
  _local_800 = auVar401;
  fStack_7ec = fVar234;
  fStack_7e8 = fVar234;
  fStack_7e4 = fVar234;
  auVar409 = ZEXT3264(_local_800);
  auVar279._0_4_ = fVar168 * *pfVar1 + fVar210 * *pfVar4;
  auVar279._4_4_ = fVar249 * pfVar1[1] + fVar250 * pfVar4[1];
  auVar279._8_4_ = fVar208 * pfVar1[2] + fVar163 * pfVar4[2];
  auVar279._12_4_ = fVar233 * pfVar1[3] + fVar251 * pfVar4[3];
  fVar168 = *(float *)(ray + k * 4 + 0x50);
  auVar413._4_4_ = fVar168;
  auVar413._0_4_ = fVar168;
  auVar413._8_4_ = fVar168;
  auVar413._12_4_ = fVar168;
  fStack_810 = fVar168;
  _local_820 = auVar413;
  fStack_80c = fVar168;
  fStack_808 = fVar168;
  fStack_804 = fVar168;
  auVar419 = ZEXT3264(_local_820);
  auVar172 = vunpcklps_avx(auVar401,auVar413);
  fVar249 = *(float *)(ray + k * 4 + 0x60);
  auVar421._4_4_ = fVar249;
  auVar421._0_4_ = fVar249;
  auVar421._8_4_ = fVar249;
  auVar421._12_4_ = fVar249;
  fStack_830 = fVar249;
  _local_840 = auVar421;
  fStack_82c = fVar249;
  fStack_828 = fVar249;
  fStack_824 = fVar249;
  auVar428 = ZEXT3264(_local_840);
  _local_970 = vinsertps_avx(auVar172,auVar421,0x28);
  auVar442 = ZEXT1664(_local_970);
  auVar131._0_4_ = (auVar212._0_4_ + auVar171._0_4_ + auVar236._0_4_ + auVar279._0_4_) * 0.25;
  auVar131._4_4_ = (auVar212._4_4_ + auVar171._4_4_ + auVar236._4_4_ + auVar279._4_4_) * 0.25;
  auVar131._8_4_ = (auVar212._8_4_ + auVar171._8_4_ + auVar236._8_4_ + auVar279._8_4_) * 0.25;
  auVar131._12_4_ = (auVar212._12_4_ + auVar171._12_4_ + auVar236._12_4_ + auVar279._12_4_) * 0.25;
  auVar172 = vsubps_avx(auVar131,auVar213);
  auVar172 = vdpps_avx(auVar172,_local_970,0x7f);
  local_980 = vdpps_avx(_local_970,_local_970,0x7f);
  auVar134 = vrcpss_avx(local_980,local_980);
  fVar208 = auVar172._0_4_ * auVar134._0_4_ * (2.0 - local_980._0_4_ * auVar134._0_4_);
  auVar340 = ZEXT464((uint)fVar208);
  auVar134 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
  auVar256._0_4_ = auVar213._0_4_ + local_970._0_4_ * auVar134._0_4_;
  auVar256._4_4_ = auVar213._4_4_ + local_970._4_4_ * auVar134._4_4_;
  auVar256._8_4_ = auVar213._8_4_ + local_970._8_4_ * auVar134._8_4_;
  auVar256._12_4_ = auVar213._12_4_ + local_970._12_4_ * auVar134._12_4_;
  auVar172 = vblendps_avx(auVar256,_DAT_01feba10,8);
  _local_a80 = vsubps_avx(auVar212,auVar172);
  _local_a90 = vsubps_avx(auVar236,auVar172);
  _local_aa0 = vsubps_avx(auVar171,auVar172);
  _local_ab0 = vsubps_avx(auVar279,auVar172);
  auVar172 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001250 = auVar172;
  _local_1a0 = auVar172;
  auVar172 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001250 = auVar172;
  _local_1c0 = auVar172;
  auVar172 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001250 = auVar172;
  _local_1e0 = auVar172;
  auVar172 = vshufps_avx(_local_a80,_local_a80,0xff);
  register0x00001290 = auVar172;
  _local_3a0 = auVar172;
  auVar172 = vshufps_avx(_local_aa0,_local_aa0,0);
  register0x00001290 = auVar172;
  _local_200 = auVar172;
  auVar172 = vshufps_avx(_local_aa0,_local_aa0,0x55);
  register0x00001290 = auVar172;
  _local_220 = auVar172;
  auVar172 = vshufps_avx(_local_aa0,_local_aa0,0xaa);
  register0x00001290 = auVar172;
  _local_240 = auVar172;
  auVar172 = vshufps_avx(_local_aa0,_local_aa0,0xff);
  register0x00001290 = auVar172;
  _local_3c0 = auVar172;
  auVar172 = vshufps_avx(_local_a90,_local_a90,0);
  register0x00001290 = auVar172;
  _local_3e0 = auVar172;
  auVar172 = vshufps_avx(_local_a90,_local_a90,0x55);
  register0x00001290 = auVar172;
  _local_400 = auVar172;
  auVar172 = vshufps_avx(_local_a90,_local_a90,0xaa);
  register0x00001290 = auVar172;
  _local_420 = auVar172;
  auVar172 = vshufps_avx(_local_a90,_local_a90,0xff);
  register0x00001290 = auVar172;
  _local_440 = auVar172;
  auVar172 = vshufps_avx(_local_ab0,_local_ab0,0);
  register0x00001290 = auVar172;
  _local_460 = auVar172;
  auVar172 = vshufps_avx(_local_ab0,_local_ab0,0x55);
  register0x00001290 = auVar172;
  _local_480 = auVar172;
  auVar172 = vshufps_avx(_local_ab0,_local_ab0,0xaa);
  register0x00001290 = auVar172;
  _local_4a0 = auVar172;
  auVar172 = vshufps_avx(_local_ab0,_local_ab0,0xff);
  register0x00001290 = auVar172;
  _local_4c0 = auVar172;
  auVar172 = ZEXT416((uint)(fVar234 * fVar234 + fVar168 * fVar168 + fVar249 * fVar249));
  auVar172 = vshufps_avx(auVar172,auVar172,0);
  local_260._16_16_ = auVar172;
  local_260._0_16_ = auVar172;
  fVar234 = *(float *)(ray + k * 4 + 0x30);
  local_900 = ZEXT416((uint)fVar208);
  auVar172 = vshufps_avx(ZEXT416((uint)(fVar234 - fVar208)),ZEXT416((uint)(fVar234 - fVar208)),0);
  local_2a0._16_16_ = auVar172;
  local_2a0._0_16_ = auVar172;
  local_750 = vpshufd_avx(ZEXT416(uVar120),0);
  local_760 = vpshufd_avx(ZEXT416(*(uint *)(local_8f0 + lVar125 * 4 + 6)),0);
  local_940._16_16_ = auVar134;
  local_940._0_16_ = auVar134;
  auVar312 = ZEXT3264(local_940);
  uVar121 = 0;
  uVar126 = 1;
  auVar146._8_4_ = 0x7fffffff;
  auVar146._0_8_ = 0x7fffffff7fffffff;
  auVar146._12_4_ = 0x7fffffff;
  auVar146._16_4_ = 0x7fffffff;
  auVar146._20_4_ = 0x7fffffff;
  auVar146._24_4_ = 0x7fffffff;
  auVar146._28_4_ = 0x7fffffff;
  local_4e0 = vandps_avx(local_260,auVar146);
  auVar172 = vsqrtss_avx(local_980,local_980);
  local_b24 = auVar172._0_4_;
  auVar172 = vsqrtss_avx(local_980,local_980);
  local_b28 = auVar172._0_4_;
  local_910 = 0x3f80000000000000;
  uStack_908 = 0;
  auVar270 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar116._8_8_ = uStack_908;
    auVar116._0_8_ = local_910;
    auVar172 = vmovshdup_avx(auVar116);
    fVar251 = auVar172._0_4_ - (float)local_910;
    auVar172 = vshufps_avx(auVar116,auVar116,0);
    local_7a0._16_16_ = auVar172;
    local_7a0._0_16_ = auVar172;
    auVar213 = vshufps_avx(ZEXT416((uint)fVar251),ZEXT416((uint)fVar251),0);
    local_7c0._16_16_ = auVar213;
    local_7c0._0_16_ = auVar213;
    fVar167 = auVar213._0_4_;
    fVar206 = auVar213._4_4_;
    fVar207 = auVar213._8_4_;
    fVar209 = auVar213._12_4_;
    fVar129 = auVar172._0_4_;
    auVar245._0_4_ = fVar129 + fVar167 * 0.0;
    fVar157 = auVar172._4_4_;
    auVar245._4_4_ = fVar157 + fVar206 * 0.14285715;
    fVar159 = auVar172._8_4_;
    auVar245._8_4_ = fVar159 + fVar207 * 0.2857143;
    fVar161 = auVar172._12_4_;
    auVar245._12_4_ = fVar161 + fVar209 * 0.42857146;
    auVar245._16_4_ = fVar129 + fVar167 * 0.5714286;
    auVar245._20_4_ = fVar157 + fVar206 * 0.71428573;
    auVar245._24_4_ = fVar159 + fVar207 * 0.8571429;
    auVar245._28_4_ = fVar161 + fVar209;
    auVar142 = vsubps_avx(auVar270._0_32_,auVar245);
    fVar168 = auVar142._0_4_;
    fVar249 = auVar142._4_4_;
    fVar208 = auVar142._8_4_;
    fVar233 = auVar142._12_4_;
    fVar210 = auVar142._16_4_;
    fVar250 = auVar142._20_4_;
    fVar163 = auVar142._24_4_;
    fVar253 = fVar168 * fVar168 * fVar168;
    fVar277 = fVar249 * fVar249 * fVar249;
    fVar293 = fVar208 * fVar208 * fVar208;
    fVar295 = fVar233 * fVar233 * fVar233;
    fVar298 = fVar210 * fVar210 * fVar210;
    fVar322 = fVar250 * fVar250 * fVar250;
    fVar326 = fVar163 * fVar163 * fVar163;
    fVar331 = auVar245._0_4_ * auVar245._0_4_ * auVar245._0_4_;
    fVar341 = auVar245._4_4_ * auVar245._4_4_ * auVar245._4_4_;
    fVar342 = auVar245._8_4_ * auVar245._8_4_ * auVar245._8_4_;
    fVar344 = auVar245._12_4_ * auVar245._12_4_ * auVar245._12_4_;
    fVar346 = auVar245._16_4_ * auVar245._16_4_ * auVar245._16_4_;
    fVar348 = auVar245._20_4_ * auVar245._20_4_ * auVar245._20_4_;
    fVar350 = auVar245._24_4_ * auVar245._24_4_ * auVar245._24_4_;
    fVar252 = auVar245._0_4_ * fVar168;
    fVar254 = auVar245._4_4_ * fVar249;
    fVar271 = auVar245._8_4_ * fVar208;
    fVar272 = auVar245._12_4_ * fVar233;
    fVar273 = auVar245._16_4_ * fVar210;
    fVar274 = auVar245._20_4_ * fVar250;
    fVar276 = auVar245._24_4_ * fVar163;
    fVar275 = auVar419._28_4_ + auVar442._28_4_;
    fVar396 = auVar340._28_4_ + 1.0 + fVar275;
    fVar411 = fVar275 + auVar312._28_4_ + auVar428._28_4_ + auVar409._28_4_;
    fVar275 = fVar253 * 0.16666667;
    fVar292 = fVar277 * 0.16666667;
    fVar294 = fVar293 * 0.16666667;
    fVar296 = fVar295 * 0.16666667;
    fVar319 = fVar298 * 0.16666667;
    fVar323 = fVar322 * 0.16666667;
    fVar327 = fVar326 * 0.16666667;
    fVar352 = (fVar331 + fVar253 * 4.0 + fVar168 * fVar252 * 12.0 + auVar245._0_4_ * fVar252 * 6.0)
              * 0.16666667;
    fVar366 = (fVar341 + fVar277 * 4.0 + fVar249 * fVar254 * 12.0 + auVar245._4_4_ * fVar254 * 6.0)
              * 0.16666667;
    fVar371 = (fVar342 + fVar293 * 4.0 + fVar208 * fVar271 * 12.0 + auVar245._8_4_ * fVar271 * 6.0)
              * 0.16666667;
    fVar376 = (fVar344 + fVar295 * 4.0 + fVar233 * fVar272 * 12.0 + auVar245._12_4_ * fVar272 * 6.0)
              * 0.16666667;
    fVar381 = (fVar346 + fVar298 * 4.0 + fVar210 * fVar273 * 12.0 + auVar245._16_4_ * fVar273 * 6.0)
              * 0.16666667;
    fVar386 = (fVar348 + fVar322 * 4.0 + fVar250 * fVar274 * 12.0 + auVar245._20_4_ * fVar274 * 6.0)
              * 0.16666667;
    fVar391 = (fVar350 + fVar326 * 4.0 + fVar163 * fVar276 * 12.0 + auVar245._24_4_ * fVar276 * 6.0)
              * 0.16666667;
    fVar253 = (fVar331 * 4.0 + fVar253 + auVar245._0_4_ * fVar252 * 12.0 + fVar168 * fVar252 * 6.0)
              * 0.16666667;
    fVar277 = (fVar341 * 4.0 + fVar277 + auVar245._4_4_ * fVar254 * 12.0 + fVar249 * fVar254 * 6.0)
              * 0.16666667;
    fVar293 = (fVar342 * 4.0 + fVar293 + auVar245._8_4_ * fVar271 * 12.0 + fVar208 * fVar271 * 6.0)
              * 0.16666667;
    fVar295 = (fVar344 * 4.0 + fVar295 + auVar245._12_4_ * fVar272 * 12.0 + fVar233 * fVar272 * 6.0)
              * 0.16666667;
    fVar298 = (fVar346 * 4.0 + fVar298 + auVar245._16_4_ * fVar273 * 12.0 + fVar210 * fVar273 * 6.0)
              * 0.16666667;
    fVar322 = (fVar348 * 4.0 + fVar322 + auVar245._20_4_ * fVar274 * 12.0 + fVar250 * fVar274 * 6.0)
              * 0.16666667;
    fVar326 = (fVar350 * 4.0 + fVar326 + auVar245._24_4_ * fVar276 * 12.0 + fVar163 * fVar276 * 6.0)
              * 0.16666667;
    fVar331 = fVar331 * 0.16666667;
    fVar341 = fVar341 * 0.16666667;
    fVar342 = fVar342 * 0.16666667;
    fVar344 = fVar344 * 0.16666667;
    fVar346 = fVar346 * 0.16666667;
    fVar348 = fVar348 * 0.16666667;
    fVar350 = fVar350 * 0.16666667;
    fVar435 = auVar428._28_4_ + 12.0;
    fVar412 = fVar411 + 12.166667;
    fVar353 = (float)local_1a0._0_4_ * fVar275 +
              (float)local_200._0_4_ * fVar352 +
              fVar331 * (float)local_460._0_4_ + fVar253 * (float)local_3e0._0_4_;
    fVar367 = (float)local_1a0._4_4_ * fVar292 +
              (float)local_200._4_4_ * fVar366 +
              fVar341 * (float)local_460._4_4_ + fVar277 * (float)local_3e0._4_4_;
    fVar372 = fStack_198 * fVar294 +
              fStack_1f8 * fVar371 + fVar342 * fStack_458 + fVar293 * fStack_3d8;
    fVar377 = fStack_194 * fVar296 +
              fStack_1f4 * fVar376 + fVar344 * fStack_454 + fVar295 * fStack_3d4;
    fVar382 = fStack_190 * fVar319 +
              fStack_1f0 * fVar381 + fVar346 * fStack_450 + fVar298 * fStack_3d0;
    fVar387 = fStack_18c * fVar323 +
              fStack_1ec * fVar386 + fVar348 * fStack_44c + fVar322 * fStack_3cc;
    fVar392 = fStack_188 * fVar327 +
              fStack_1e8 * fVar391 + fVar350 * fStack_448 + fVar326 * fStack_3c8;
    fVar397 = fVar396 + fVar412;
    fVar354 = (float)local_1c0._0_4_ * fVar275 +
              (float)local_220._0_4_ * fVar352 +
              fVar331 * (float)local_480._0_4_ + fVar253 * (float)local_400._0_4_;
    fVar368 = (float)local_1c0._4_4_ * fVar292 +
              (float)local_220._4_4_ * fVar366 +
              fVar341 * (float)local_480._4_4_ + fVar277 * (float)local_400._4_4_;
    fVar373 = fStack_1b8 * fVar294 +
              fStack_218 * fVar371 + fVar342 * fStack_478 + fVar293 * fStack_3f8;
    fVar378 = fStack_1b4 * fVar296 +
              fStack_214 * fVar376 + fVar344 * fStack_474 + fVar295 * fStack_3f4;
    fVar383 = fStack_1b0 * fVar319 +
              fStack_210 * fVar381 + fVar346 * fStack_470 + fVar298 * fStack_3f0;
    fVar388 = fStack_1ac * fVar323 +
              fStack_20c * fVar386 + fVar348 * fStack_46c + fVar322 * fStack_3ec;
    fVar393 = fStack_1a8 * fVar327 +
              fStack_208 * fVar391 + fVar350 * fStack_468 + fVar326 * fStack_3e8;
    fVar398 = fVar397 + fVar435 + 12.166667;
    fVar355 = (float)local_1e0._0_4_ * fVar275 +
              fVar352 * (float)local_240._0_4_ +
              fVar331 * (float)local_4a0._0_4_ + fVar253 * (float)local_420._0_4_;
    fVar369 = (float)local_1e0._4_4_ * fVar292 +
              fVar366 * (float)local_240._4_4_ +
              fVar341 * (float)local_4a0._4_4_ + fVar277 * (float)local_420._4_4_;
    fVar374 = fStack_1d8 * fVar294 +
              fVar371 * fStack_238 + fVar342 * fStack_498 + fVar293 * fStack_418;
    fVar379 = fStack_1d4 * fVar296 +
              fVar376 * fStack_234 + fVar344 * fStack_494 + fVar295 * fStack_414;
    fVar384 = fStack_1d0 * fVar319 +
              fVar381 * fStack_230 + fVar346 * fStack_490 + fVar298 * fStack_410;
    fVar389 = fStack_1cc * fVar323 +
              fVar386 * fStack_22c + fVar348 * fStack_48c + fVar322 * fStack_40c;
    fVar394 = fStack_1c8 * fVar327 +
              fVar391 * fStack_228 + fVar350 * fStack_488 + fVar326 * fStack_408;
    fVar399 = fVar398 + fVar435 + auVar442._28_4_ + 12.0;
    local_7e0._0_4_ =
         fVar275 * (float)local_3a0._0_4_ +
         fVar352 * (float)local_3c0._0_4_ +
         fVar253 * (float)local_440._0_4_ + fVar331 * (float)local_4c0._0_4_;
    local_7e0._4_4_ =
         fVar292 * (float)local_3a0._4_4_ +
         fVar366 * (float)local_3c0._4_4_ +
         fVar277 * (float)local_440._4_4_ + fVar341 * (float)local_4c0._4_4_;
    local_7e0._8_4_ =
         fVar294 * fStack_398 + fVar371 * fStack_3b8 + fVar293 * fStack_438 + fVar342 * fStack_4b8;
    local_7e0._12_4_ =
         fVar296 * fStack_394 + fVar376 * fStack_3b4 + fVar295 * fStack_434 + fVar344 * fStack_4b4;
    local_7e0._16_4_ =
         fVar319 * fStack_390 + fVar381 * fStack_3b0 + fVar298 * fStack_430 + fVar346 * fStack_4b0;
    local_7e0._20_4_ =
         fVar323 * fStack_38c + fVar386 * fStack_3ac + fVar322 * fStack_42c + fVar348 * fStack_4ac;
    local_7e0._24_4_ =
         fVar327 * fStack_388 + fVar391 * fStack_3a8 + fVar326 * fStack_428 + fVar350 * fStack_4a8;
    local_7e0._28_4_ = auVar312._28_4_ + fVar396 + fVar411 + auVar340._28_4_;
    auVar46._4_4_ = auVar245._4_4_ * -auVar245._4_4_;
    auVar46._0_4_ = auVar245._0_4_ * -auVar245._0_4_;
    auVar46._8_4_ = auVar245._8_4_ * -auVar245._8_4_;
    auVar46._12_4_ = auVar245._12_4_ * -auVar245._12_4_;
    auVar46._16_4_ = auVar245._16_4_ * -auVar245._16_4_;
    auVar46._20_4_ = auVar245._20_4_ * -auVar245._20_4_;
    auVar46._24_4_ = auVar245._24_4_ * -auVar245._24_4_;
    auVar46._28_4_ = auVar245._28_4_;
    auVar47._4_4_ = fVar254 * 4.0;
    auVar47._0_4_ = fVar252 * 4.0;
    auVar47._8_4_ = fVar271 * 4.0;
    auVar47._12_4_ = fVar272 * 4.0;
    auVar47._16_4_ = fVar273 * 4.0;
    auVar47._20_4_ = fVar274 * 4.0;
    auVar47._24_4_ = fVar276 * 4.0;
    auVar47._28_4_ = 0x3f800000;
    auVar142 = vsubps_avx(auVar46,auVar47);
    fVar296 = fVar168 * -fVar168 * 0.5;
    fVar319 = fVar249 * -fVar249 * 0.5;
    fVar327 = fVar208 * -fVar208 * 0.5;
    fVar331 = fVar233 * -fVar233 * 0.5;
    fVar341 = fVar210 * -fVar210 * 0.5;
    fVar342 = fVar250 * -fVar250 * 0.5;
    fVar344 = fVar163 * -fVar163 * 0.5;
    fVar275 = auVar142._0_4_ * 0.5;
    fVar293 = auVar142._4_4_ * 0.5;
    fVar294 = auVar142._8_4_ * 0.5;
    fVar295 = auVar142._12_4_ * 0.5;
    fVar322 = auVar142._16_4_ * 0.5;
    fVar323 = auVar142._20_4_ * 0.5;
    fVar326 = auVar142._24_4_ * 0.5;
    fVar253 = (fVar168 * fVar168 + fVar252 * 4.0) * 0.5;
    fVar254 = (fVar249 * fVar249 + fVar254 * 4.0) * 0.5;
    fVar271 = (fVar208 * fVar208 + fVar271 * 4.0) * 0.5;
    fVar272 = (fVar233 * fVar233 + fVar272 * 4.0) * 0.5;
    fVar273 = (fVar210 * fVar210 + fVar273 * 4.0) * 0.5;
    fVar277 = (fVar250 * fVar250 + fVar274 * 4.0) * 0.5;
    fVar292 = (fVar163 * fVar163 + fVar276 * 4.0) * 0.5;
    fVar168 = auVar245._0_4_ * auVar245._0_4_ * 0.5;
    fVar249 = auVar245._4_4_ * auVar245._4_4_ * 0.5;
    fVar208 = auVar245._8_4_ * auVar245._8_4_ * 0.5;
    fVar233 = auVar245._12_4_ * auVar245._12_4_ * 0.5;
    fVar210 = auVar245._16_4_ * auVar245._16_4_ * 0.5;
    fVar250 = auVar245._20_4_ * auVar245._20_4_ * 0.5;
    fVar252 = auVar245._24_4_ * auVar245._24_4_ * 0.5;
    fVar330 = fVar399 + fVar412 + fVar412 + 4.0;
    auVar172 = vpermilps_avx(ZEXT416((uint)(fVar251 * 0.04761905)),0);
    fVar163 = auVar172._0_4_;
    fVar300 = fVar163 * ((float)local_1a0._0_4_ * fVar296 +
                        (float)local_200._0_4_ * fVar275 +
                        fVar253 * (float)local_3e0._0_4_ + fVar168 * (float)local_460._0_4_);
    fVar274 = auVar172._4_4_;
    fVar313 = fVar274 * ((float)local_1a0._4_4_ * fVar319 +
                        (float)local_200._4_4_ * fVar293 +
                        fVar254 * (float)local_3e0._4_4_ + fVar249 * (float)local_460._4_4_);
    local_960._4_4_ = fVar313;
    local_960._0_4_ = fVar300;
    fVar276 = auVar172._8_4_;
    fVar315 = fVar276 * (fStack_198 * fVar327 +
                        fStack_1f8 * fVar294 + fVar271 * fStack_3d8 + fVar208 * fStack_458);
    local_960._8_4_ = fVar315;
    fVar298 = auVar172._12_4_;
    fVar317 = fVar298 * (fStack_194 * fVar331 +
                        fStack_1f4 * fVar295 + fVar272 * fStack_3d4 + fVar233 * fStack_454);
    local_960._12_4_ = fVar317;
    fVar320 = fVar163 * (fStack_190 * fVar341 +
                        fStack_1f0 * fVar322 + fVar273 * fStack_3d0 + fVar210 * fStack_450);
    local_960._16_4_ = fVar320;
    fVar324 = fVar274 * (fStack_18c * fVar342 +
                        fStack_1ec * fVar323 + fVar277 * fStack_3cc + fVar250 * fStack_44c);
    local_960._20_4_ = fVar324;
    fVar328 = fVar276 * (fStack_188 * fVar344 +
                        fStack_1e8 * fVar326 + fVar292 * fStack_3c8 + fVar252 * fStack_448);
    local_960._24_4_ = fVar328;
    local_960._28_4_ = fVar330;
    fVar436 = fVar163 * ((float)local_1c0._0_4_ * fVar296 +
                        (float)local_220._0_4_ * fVar275 +
                        fVar253 * (float)local_400._0_4_ + fVar168 * (float)local_480._0_4_);
    fVar443 = fVar274 * ((float)local_1c0._4_4_ * fVar319 +
                        (float)local_220._4_4_ * fVar293 +
                        fVar254 * (float)local_400._4_4_ + fVar249 * (float)local_480._4_4_);
    auVar48._4_4_ = fVar443;
    auVar48._0_4_ = fVar436;
    fVar444 = fVar276 * (fStack_1b8 * fVar327 +
                        fStack_218 * fVar294 + fVar271 * fStack_3f8 + fVar208 * fStack_478);
    auVar48._8_4_ = fVar444;
    fVar445 = fVar298 * (fStack_1b4 * fVar331 +
                        fStack_214 * fVar295 + fVar272 * fStack_3f4 + fVar233 * fStack_474);
    auVar48._12_4_ = fVar445;
    fVar446 = fVar163 * (fStack_1b0 * fVar341 +
                        fStack_210 * fVar322 + fVar273 * fStack_3f0 + fVar210 * fStack_470);
    auVar48._16_4_ = fVar446;
    fVar447 = fVar274 * (fStack_1ac * fVar342 +
                        fStack_20c * fVar323 + fVar277 * fStack_3ec + fVar250 * fStack_46c);
    auVar48._20_4_ = fVar447;
    fVar448 = fVar276 * (fStack_1a8 * fVar344 +
                        fStack_208 * fVar326 + fVar292 * fStack_3e8 + fVar252 * fStack_468);
    auVar48._24_4_ = fVar448;
    auVar48._28_4_ = fStack_184;
    fVar449 = fVar163 * ((float)local_1e0._0_4_ * fVar296 +
                        fVar168 * (float)local_4a0._0_4_ + fVar253 * (float)local_420._0_4_ +
                        (float)local_240._0_4_ * fVar275);
    fVar457 = fVar274 * ((float)local_1e0._4_4_ * fVar319 +
                        fVar249 * (float)local_4a0._4_4_ + fVar254 * (float)local_420._4_4_ +
                        (float)local_240._4_4_ * fVar293);
    auVar49._4_4_ = fVar457;
    auVar49._0_4_ = fVar449;
    fVar460 = fVar276 * (fStack_1d8 * fVar327 +
                        fVar208 * fStack_498 + fVar271 * fStack_418 + fStack_238 * fVar294);
    auVar49._8_4_ = fVar460;
    fVar462 = fVar298 * (fStack_1d4 * fVar331 +
                        fVar233 * fStack_494 + fVar272 * fStack_414 + fStack_234 * fVar295);
    auVar49._12_4_ = fVar462;
    fVar464 = fVar163 * (fStack_1d0 * fVar341 +
                        fVar210 * fStack_490 + fVar273 * fStack_410 + fStack_230 * fVar322);
    auVar49._16_4_ = fVar464;
    fVar466 = fVar274 * (fStack_1cc * fVar342 +
                        fVar250 * fStack_48c + fVar277 * fStack_40c + fStack_22c * fVar323);
    auVar49._20_4_ = fVar466;
    fVar468 = fVar276 * (fStack_1c8 * fVar344 +
                        fVar252 * fStack_488 + fVar292 * fStack_408 + fStack_228 * fVar326);
    auVar49._24_4_ = fVar468;
    auVar49._28_4_ = uStack_1a4;
    fVar251 = fVar163 * (fVar296 * (float)local_3a0._0_4_ +
                        fVar275 * (float)local_3c0._0_4_ +
                        fVar168 * (float)local_4c0._0_4_ + fVar253 * (float)local_440._0_4_);
    fVar275 = fVar274 * (fVar319 * (float)local_3a0._4_4_ +
                        fVar293 * (float)local_3c0._4_4_ +
                        fVar249 * (float)local_4c0._4_4_ + fVar254 * (float)local_440._4_4_);
    auVar50._4_4_ = fVar275;
    auVar50._0_4_ = fVar251;
    fVar296 = fVar276 * (fVar327 * fStack_398 +
                        fVar294 * fStack_3b8 + fVar208 * fStack_4b8 + fVar271 * fStack_438);
    auVar50._8_4_ = fVar296;
    fVar319 = fVar298 * (fVar331 * fStack_394 +
                        fVar295 * fStack_3b4 + fVar233 * fStack_4b4 + fVar272 * fStack_434);
    auVar50._12_4_ = fVar319;
    fVar163 = fVar163 * (fVar341 * fStack_390 +
                        fVar322 * fStack_3b0 + fVar210 * fStack_4b0 + fVar273 * fStack_430);
    auVar50._16_4_ = fVar163;
    fVar274 = fVar274 * (fVar342 * fStack_38c +
                        fVar323 * fStack_3ac + fVar250 * fStack_4ac + fVar277 * fStack_42c);
    auVar50._20_4_ = fVar274;
    fVar276 = fVar276 * (fVar344 * fStack_388 +
                        fVar326 * fStack_3a8 + fVar252 * fStack_4a8 + fVar292 * fStack_428);
    auVar50._24_4_ = fVar276;
    auVar50._28_4_ = fVar298;
    auVar107._4_4_ = fVar368;
    auVar107._0_4_ = fVar354;
    auVar107._8_4_ = fVar373;
    auVar107._12_4_ = fVar378;
    auVar107._16_4_ = fVar383;
    auVar107._20_4_ = fVar388;
    auVar107._24_4_ = fVar393;
    auVar107._28_4_ = fVar398;
    auVar142 = vperm2f128_avx(auVar107,auVar107,1);
    auVar142 = vshufps_avx(auVar142,auVar107,0x30);
    _local_a00 = vshufps_avx(auVar107,auVar142,0x29);
    auVar109._4_4_ = fVar369;
    auVar109._0_4_ = fVar355;
    auVar109._8_4_ = fVar374;
    auVar109._12_4_ = fVar379;
    auVar109._16_4_ = fVar384;
    auVar109._20_4_ = fVar389;
    auVar109._24_4_ = fVar394;
    auVar109._28_4_ = fVar399;
    auVar142 = vperm2f128_avx(auVar109,auVar109,1);
    auVar142 = vshufps_avx(auVar142,auVar109,0x30);
    local_b20 = vshufps_avx(auVar109,auVar142,0x29);
    auVar153 = vsubps_avx(local_7e0,auVar50);
    auVar142 = vperm2f128_avx(auVar153,auVar153,1);
    auVar142 = vshufps_avx(auVar142,auVar153,0x30);
    local_680 = vshufps_avx(auVar153,auVar142,0x29);
    local_5e0 = vsubps_avx(_local_a00,auVar107);
    _local_5c0 = vsubps_avx(local_b20,auVar109);
    fVar249 = local_5e0._0_4_;
    fVar253 = local_5e0._4_4_;
    auVar51._4_4_ = fVar457 * fVar253;
    auVar51._0_4_ = fVar449 * fVar249;
    fVar277 = local_5e0._8_4_;
    auVar51._8_4_ = fVar460 * fVar277;
    fVar322 = local_5e0._12_4_;
    auVar51._12_4_ = fVar462 * fVar322;
    fVar346 = local_5e0._16_4_;
    auVar51._16_4_ = fVar464 * fVar346;
    fVar386 = local_5e0._20_4_;
    auVar51._20_4_ = fVar466 * fVar386;
    fVar37 = local_5e0._24_4_;
    auVar51._24_4_ = fVar468 * fVar37;
    auVar51._28_4_ = auVar153._28_4_;
    fVar208 = local_5c0._0_4_;
    fVar254 = local_5c0._4_4_;
    auVar52._4_4_ = fVar443 * fVar254;
    auVar52._0_4_ = fVar436 * fVar208;
    fVar292 = local_5c0._8_4_;
    auVar52._8_4_ = fVar444 * fVar292;
    fVar323 = local_5c0._12_4_;
    auVar52._12_4_ = fVar445 * fVar323;
    fVar348 = local_5c0._16_4_;
    auVar52._16_4_ = fVar446 * fVar348;
    fVar391 = local_5c0._20_4_;
    auVar52._20_4_ = fVar447 * fVar391;
    fVar38 = local_5c0._24_4_;
    auVar52._24_4_ = fVar448 * fVar38;
    auVar52._28_4_ = auVar142._28_4_;
    auVar33 = vsubps_avx(auVar52,auVar51);
    auVar111._4_4_ = fVar367;
    auVar111._0_4_ = fVar353;
    auVar111._8_4_ = fVar372;
    auVar111._12_4_ = fVar377;
    auVar111._16_4_ = fVar382;
    auVar111._20_4_ = fVar387;
    auVar111._24_4_ = fVar392;
    auVar111._28_4_ = fVar397;
    auVar142 = vperm2f128_avx(auVar111,auVar111,1);
    auVar142 = vshufps_avx(auVar142,auVar111,0x30);
    local_9a0 = vshufps_avx(auVar111,auVar142,0x29);
    local_600 = vsubps_avx(local_9a0,auVar111);
    auVar53._4_4_ = fVar254 * fVar313;
    auVar53._0_4_ = fVar208 * fVar300;
    auVar53._8_4_ = fVar292 * fVar315;
    auVar53._12_4_ = fVar323 * fVar317;
    auVar53._16_4_ = fVar348 * fVar320;
    auVar53._20_4_ = fVar391 * fVar324;
    auVar53._24_4_ = fVar38 * fVar328;
    auVar53._28_4_ = auVar142._28_4_;
    fVar233 = local_600._0_4_;
    fVar271 = local_600._4_4_;
    auVar54._4_4_ = fVar457 * fVar271;
    auVar54._0_4_ = fVar449 * fVar233;
    fVar293 = local_600._8_4_;
    auVar54._8_4_ = fVar460 * fVar293;
    fVar326 = local_600._12_4_;
    auVar54._12_4_ = fVar462 * fVar326;
    fVar350 = local_600._16_4_;
    auVar54._16_4_ = fVar464 * fVar350;
    fVar396 = local_600._20_4_;
    auVar54._20_4_ = fVar466 * fVar396;
    fVar39 = local_600._24_4_;
    auVar54._24_4_ = fVar468 * fVar39;
    auVar54._28_4_ = local_b20._28_4_;
    auVar34 = vsubps_avx(auVar54,auVar53);
    auVar55._4_4_ = fVar443 * fVar271;
    auVar55._0_4_ = fVar436 * fVar233;
    auVar55._8_4_ = fVar444 * fVar293;
    auVar55._12_4_ = fVar445 * fVar326;
    auVar55._16_4_ = fVar446 * fVar350;
    auVar55._20_4_ = fVar447 * fVar396;
    auVar55._24_4_ = fVar448 * fVar39;
    auVar55._28_4_ = local_b20._28_4_;
    auVar56._4_4_ = fVar253 * fVar313;
    auVar56._0_4_ = fVar249 * fVar300;
    auVar56._8_4_ = fVar277 * fVar315;
    auVar56._12_4_ = fVar322 * fVar317;
    auVar56._16_4_ = fVar346 * fVar320;
    auVar56._20_4_ = fVar386 * fVar324;
    auVar56._24_4_ = fVar37 * fVar328;
    auVar56._28_4_ = uStack_1c4;
    auVar190 = vsubps_avx(auVar56,auVar55);
    fVar168 = auVar190._28_4_;
    auVar189._0_4_ = fVar233 * fVar233 + fVar249 * fVar249 + fVar208 * fVar208;
    auVar189._4_4_ = fVar271 * fVar271 + fVar253 * fVar253 + fVar254 * fVar254;
    auVar189._8_4_ = fVar293 * fVar293 + fVar277 * fVar277 + fVar292 * fVar292;
    auVar189._12_4_ = fVar326 * fVar326 + fVar322 * fVar322 + fVar323 * fVar323;
    auVar189._16_4_ = fVar350 * fVar350 + fVar346 * fVar346 + fVar348 * fVar348;
    auVar189._20_4_ = fVar396 * fVar396 + fVar386 * fVar386 + fVar391 * fVar391;
    auVar189._24_4_ = fVar39 * fVar39 + fVar37 * fVar37 + fVar38 * fVar38;
    auVar189._28_4_ = fVar168 + fVar168 + auVar33._28_4_;
    auVar142 = vrcpps_avx(auVar189);
    fVar341 = auVar142._0_4_;
    fVar342 = auVar142._4_4_;
    auVar57._4_4_ = fVar342 * auVar189._4_4_;
    auVar57._0_4_ = fVar341 * auVar189._0_4_;
    fVar344 = auVar142._8_4_;
    auVar57._8_4_ = fVar344 * auVar189._8_4_;
    fVar371 = auVar142._12_4_;
    auVar57._12_4_ = fVar371 * auVar189._12_4_;
    fVar376 = auVar142._16_4_;
    auVar57._16_4_ = fVar376 * auVar189._16_4_;
    fVar381 = auVar142._20_4_;
    auVar57._20_4_ = fVar381 * auVar189._20_4_;
    fVar435 = auVar142._24_4_;
    auVar57._24_4_ = fVar435 * auVar189._24_4_;
    auVar57._28_4_ = uStack_1c4;
    auVar226._8_4_ = 0x3f800000;
    auVar226._0_8_ = &DAT_3f8000003f800000;
    auVar226._12_4_ = 0x3f800000;
    auVar226._16_4_ = 0x3f800000;
    auVar226._20_4_ = 0x3f800000;
    auVar226._24_4_ = 0x3f800000;
    auVar226._28_4_ = 0x3f800000;
    auVar193 = vsubps_avx(auVar226,auVar57);
    fVar341 = auVar193._0_4_ * fVar341 + fVar341;
    fVar342 = auVar193._4_4_ * fVar342 + fVar342;
    fVar344 = auVar193._8_4_ * fVar344 + fVar344;
    fVar371 = auVar193._12_4_ * fVar371 + fVar371;
    fVar376 = auVar193._16_4_ * fVar376 + fVar376;
    fVar381 = auVar193._20_4_ * fVar381 + fVar381;
    fVar435 = auVar193._24_4_ * fVar435 + fVar435;
    auVar153 = vperm2f128_avx(auVar48,auVar48,1);
    auVar153 = vshufps_avx(auVar153,auVar48,0x30);
    local_b00 = vshufps_avx(auVar48,auVar153,0x29);
    auVar153 = vperm2f128_avx(auVar49,auVar49,1);
    auVar153 = vshufps_avx(auVar153,auVar49,0x30);
    local_9e0 = vshufps_avx(auVar49,auVar153,0x29);
    fVar450 = local_9e0._0_4_;
    fVar458 = local_9e0._4_4_;
    auVar58._4_4_ = fVar458 * fVar253;
    auVar58._0_4_ = fVar450 * fVar249;
    fVar461 = local_9e0._8_4_;
    auVar58._8_4_ = fVar461 * fVar277;
    fVar463 = local_9e0._12_4_;
    auVar58._12_4_ = fVar463 * fVar322;
    fVar465 = local_9e0._16_4_;
    auVar58._16_4_ = fVar465 * fVar346;
    fVar467 = local_9e0._20_4_;
    auVar58._20_4_ = fVar467 * fVar386;
    fVar469 = local_9e0._24_4_;
    auVar58._24_4_ = fVar469 * fVar37;
    auVar58._28_4_ = auVar153._28_4_;
    fVar210 = local_b00._0_4_;
    fVar272 = local_b00._4_4_;
    auVar59._4_4_ = fVar254 * fVar272;
    auVar59._0_4_ = fVar208 * fVar210;
    fVar294 = local_b00._8_4_;
    auVar59._8_4_ = fVar292 * fVar294;
    fVar327 = local_b00._12_4_;
    auVar59._12_4_ = fVar323 * fVar327;
    fVar352 = local_b00._16_4_;
    auVar59._16_4_ = fVar348 * fVar352;
    fVar411 = local_b00._20_4_;
    auVar59._20_4_ = fVar391 * fVar411;
    fVar40 = local_b00._24_4_;
    auVar59._24_4_ = fVar38 * fVar40;
    auVar59._28_4_ = fStack_184;
    auVar456 = vsubps_avx(auVar59,auVar58);
    auVar153 = vperm2f128_avx(local_960,local_960,1);
    auVar153 = vshufps_avx(auVar153,local_960,0x30);
    local_9c0 = vshufps_avx(local_960,auVar153,0x29);
    fVar250 = local_9c0._0_4_;
    fVar273 = local_9c0._4_4_;
    auVar60._4_4_ = fVar254 * fVar273;
    auVar60._0_4_ = fVar208 * fVar250;
    fVar295 = local_9c0._8_4_;
    auVar60._8_4_ = fVar292 * fVar295;
    fVar331 = local_9c0._12_4_;
    auVar60._12_4_ = fVar323 * fVar331;
    fVar366 = local_9c0._16_4_;
    auVar60._16_4_ = fVar348 * fVar366;
    fVar412 = local_9c0._20_4_;
    auVar60._20_4_ = fVar391 * fVar412;
    fVar41 = local_9c0._24_4_;
    auVar60._24_4_ = fVar38 * fVar41;
    auVar60._28_4_ = auVar153._28_4_;
    auVar61._4_4_ = fVar458 * fVar271;
    auVar61._0_4_ = fVar450 * fVar233;
    auVar61._8_4_ = fVar461 * fVar293;
    auVar61._12_4_ = fVar463 * fVar326;
    auVar61._16_4_ = fVar465 * fVar350;
    auVar61._20_4_ = fVar467 * fVar396;
    uVar32 = local_9e0._28_4_;
    auVar61._24_4_ = fVar469 * fVar39;
    auVar61._28_4_ = uVar32;
    auVar35 = vsubps_avx(auVar61,auVar60);
    auVar62._4_4_ = fVar271 * fVar272;
    auVar62._0_4_ = fVar233 * fVar210;
    auVar62._8_4_ = fVar293 * fVar294;
    auVar62._12_4_ = fVar326 * fVar327;
    auVar62._16_4_ = fVar350 * fVar352;
    auVar62._20_4_ = fVar396 * fVar411;
    auVar62._24_4_ = fVar39 * fVar40;
    auVar62._28_4_ = uVar32;
    auVar63._4_4_ = fVar253 * fVar273;
    auVar63._0_4_ = fVar249 * fVar250;
    auVar63._8_4_ = fVar277 * fVar295;
    auVar63._12_4_ = fVar322 * fVar331;
    auVar63._16_4_ = fVar346 * fVar366;
    auVar63._20_4_ = fVar386 * fVar412;
    auVar63._24_4_ = fVar37 * fVar41;
    auVar63._28_4_ = fStack_1e4;
    auVar153 = vsubps_avx(auVar63,auVar62);
    fVar252 = auVar153._28_4_;
    auVar64._4_4_ =
         (auVar33._4_4_ * auVar33._4_4_ +
         auVar34._4_4_ * auVar34._4_4_ + auVar190._4_4_ * auVar190._4_4_) * fVar342;
    auVar64._0_4_ =
         (auVar33._0_4_ * auVar33._0_4_ +
         auVar34._0_4_ * auVar34._0_4_ + auVar190._0_4_ * auVar190._0_4_) * fVar341;
    auVar64._8_4_ =
         (auVar33._8_4_ * auVar33._8_4_ +
         auVar34._8_4_ * auVar34._8_4_ + auVar190._8_4_ * auVar190._8_4_) * fVar344;
    auVar64._12_4_ =
         (auVar33._12_4_ * auVar33._12_4_ +
         auVar34._12_4_ * auVar34._12_4_ + auVar190._12_4_ * auVar190._12_4_) * fVar371;
    auVar64._16_4_ =
         (auVar33._16_4_ * auVar33._16_4_ +
         auVar34._16_4_ * auVar34._16_4_ + auVar190._16_4_ * auVar190._16_4_) * fVar376;
    auVar64._20_4_ =
         (auVar33._20_4_ * auVar33._20_4_ +
         auVar34._20_4_ * auVar34._20_4_ + auVar190._20_4_ * auVar190._20_4_) * fVar381;
    auVar64._24_4_ =
         (auVar33._24_4_ * auVar33._24_4_ +
         auVar34._24_4_ * auVar34._24_4_ + auVar190._24_4_ * auVar190._24_4_) * fVar435;
    auVar64._28_4_ = auVar33._28_4_ + auVar34._28_4_ + fVar168;
    auVar65._4_4_ =
         (auVar456._4_4_ * auVar456._4_4_ +
         auVar35._4_4_ * auVar35._4_4_ + auVar153._4_4_ * auVar153._4_4_) * fVar342;
    auVar65._0_4_ =
         (auVar456._0_4_ * auVar456._0_4_ +
         auVar35._0_4_ * auVar35._0_4_ + auVar153._0_4_ * auVar153._0_4_) * fVar341;
    auVar65._8_4_ =
         (auVar456._8_4_ * auVar456._8_4_ +
         auVar35._8_4_ * auVar35._8_4_ + auVar153._8_4_ * auVar153._8_4_) * fVar344;
    auVar65._12_4_ =
         (auVar456._12_4_ * auVar456._12_4_ +
         auVar35._12_4_ * auVar35._12_4_ + auVar153._12_4_ * auVar153._12_4_) * fVar371;
    auVar65._16_4_ =
         (auVar456._16_4_ * auVar456._16_4_ +
         auVar35._16_4_ * auVar35._16_4_ + auVar153._16_4_ * auVar153._16_4_) * fVar376;
    auVar65._20_4_ =
         (auVar456._20_4_ * auVar456._20_4_ +
         auVar35._20_4_ * auVar35._20_4_ + auVar153._20_4_ * auVar153._20_4_) * fVar381;
    auVar65._24_4_ =
         (auVar456._24_4_ * auVar456._24_4_ +
         auVar35._24_4_ * auVar35._24_4_ + auVar153._24_4_ * auVar153._24_4_) * fVar435;
    auVar65._28_4_ = auVar193._28_4_ + auVar142._28_4_;
    auVar142 = vmaxps_avx(auVar64,auVar65);
    auVar153 = vperm2f128_avx(local_7e0,local_7e0,1);
    auVar153 = vshufps_avx(auVar153,local_7e0,0x30);
    auVar34 = vshufps_avx(local_7e0,auVar153,0x29);
    auVar147._0_4_ = (float)local_7e0._0_4_ + fVar251;
    auVar147._4_4_ = local_7e0._4_4_ + fVar275;
    auVar147._8_4_ = local_7e0._8_4_ + fVar296;
    auVar147._12_4_ = local_7e0._12_4_ + fVar319;
    auVar147._16_4_ = local_7e0._16_4_ + fVar163;
    auVar147._20_4_ = local_7e0._20_4_ + fVar274;
    auVar147._24_4_ = local_7e0._24_4_ + fVar276;
    auVar147._28_4_ = local_7e0._28_4_ + fVar298;
    auVar153 = vmaxps_avx(local_7e0,auVar147);
    auVar33 = vmaxps_avx(local_680,auVar34);
    auVar33 = vmaxps_avx(auVar153,auVar33);
    auVar153 = vrsqrtps_avx(auVar189);
    fVar168 = auVar153._0_4_;
    fVar163 = auVar153._4_4_;
    fVar251 = auVar153._8_4_;
    fVar274 = auVar153._12_4_;
    fVar275 = auVar153._16_4_;
    fVar276 = auVar153._20_4_;
    fVar296 = auVar153._24_4_;
    auVar66._4_4_ = fVar163 * fVar163 * fVar163 * auVar189._4_4_ * 0.5;
    auVar66._0_4_ = fVar168 * fVar168 * fVar168 * auVar189._0_4_ * 0.5;
    auVar66._8_4_ = fVar251 * fVar251 * fVar251 * auVar189._8_4_ * 0.5;
    auVar66._12_4_ = fVar274 * fVar274 * fVar274 * auVar189._12_4_ * 0.5;
    auVar66._16_4_ = fVar275 * fVar275 * fVar275 * auVar189._16_4_ * 0.5;
    auVar66._20_4_ = fVar276 * fVar276 * fVar276 * auVar189._20_4_ * 0.5;
    auVar66._24_4_ = fVar296 * fVar296 * fVar296 * auVar189._24_4_ * 0.5;
    auVar66._28_4_ = auVar189._28_4_;
    auVar67._4_4_ = fVar163 * 1.5;
    auVar67._0_4_ = fVar168 * 1.5;
    auVar67._8_4_ = fVar251 * 1.5;
    auVar67._12_4_ = fVar274 * 1.5;
    auVar67._16_4_ = fVar275 * 1.5;
    auVar67._20_4_ = fVar276 * 1.5;
    auVar67._24_4_ = fVar296 * 1.5;
    auVar67._28_4_ = auVar153._28_4_;
    auVar153 = vsubps_avx(auVar67,auVar66);
    auVar108._4_4_ = fVar368;
    auVar108._0_4_ = fVar354;
    auVar108._8_4_ = fVar373;
    auVar108._12_4_ = fVar378;
    auVar108._16_4_ = fVar383;
    auVar108._20_4_ = fVar388;
    auVar108._24_4_ = fVar393;
    auVar108._28_4_ = fVar398;
    auVar190 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_780 = vsubps_avx(auVar190,auVar108);
    auVar110._4_4_ = fVar369;
    auVar110._0_4_ = fVar355;
    auVar110._8_4_ = fVar374;
    auVar110._12_4_ = fVar379;
    auVar110._16_4_ = fVar384;
    auVar110._20_4_ = fVar389;
    auVar110._24_4_ = fVar394;
    auVar110._28_4_ = fVar399;
    auVar190 = vsubps_avx(auVar190,auVar110);
    fVar163 = auVar190._0_4_;
    fVar274 = auVar190._4_4_;
    fVar296 = auVar190._8_4_;
    fVar341 = auVar190._12_4_;
    fVar371 = auVar190._16_4_;
    fVar435 = auVar190._20_4_;
    fVar42 = auVar190._24_4_;
    fVar251 = local_780._0_4_;
    fVar275 = local_780._4_4_;
    fVar298 = local_780._8_4_;
    fVar342 = local_780._12_4_;
    fVar376 = local_780._16_4_;
    fVar36 = local_780._20_4_;
    fVar43 = local_780._24_4_;
    auVar191 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar193 = vsubps_avx(auVar191,auVar111);
    auVar428 = ZEXT3264(auVar193);
    fVar420 = auVar193._0_4_;
    fVar429 = auVar193._4_4_;
    fVar430 = auVar193._8_4_;
    fVar431 = auVar193._12_4_;
    fVar432 = auVar193._16_4_;
    fVar433 = auVar193._20_4_;
    fVar434 = auVar193._24_4_;
    auVar441._0_4_ =
         fVar420 * (float)local_800._0_4_ +
         (float)local_820._0_4_ * fVar251 + (float)local_840._0_4_ * fVar163;
    auVar441._4_4_ =
         fVar429 * (float)local_800._4_4_ +
         (float)local_820._4_4_ * fVar275 + (float)local_840._4_4_ * fVar274;
    auVar441._8_4_ = fVar430 * fStack_7f8 + fStack_818 * fVar298 + fStack_838 * fVar296;
    auVar441._12_4_ = fVar431 * fStack_7f4 + fStack_814 * fVar342 + fStack_834 * fVar341;
    auVar441._16_4_ = fVar432 * fStack_7f0 + fStack_810 * fVar376 + fStack_830 * fVar371;
    auVar441._20_4_ = fVar433 * fStack_7ec + fStack_80c * fVar36 + fStack_82c * fVar435;
    auVar441._24_4_ = fVar434 * fStack_7e8 + fStack_808 * fVar43 + fStack_828 * fVar42;
    auVar441._28_4_ = fVar252 + fVar252 + auVar35._28_4_ + fVar252;
    auVar454._0_4_ = fVar420 * fVar420 + fVar251 * fVar251 + fVar163 * fVar163;
    auVar454._4_4_ = fVar429 * fVar429 + fVar275 * fVar275 + fVar274 * fVar274;
    auVar454._8_4_ = fVar430 * fVar430 + fVar298 * fVar298 + fVar296 * fVar296;
    auVar454._12_4_ = fVar431 * fVar431 + fVar342 * fVar342 + fVar341 * fVar341;
    auVar454._16_4_ = fVar432 * fVar432 + fVar376 * fVar376 + fVar371 * fVar371;
    auVar454._20_4_ = fVar433 * fVar433 + fVar36 * fVar36 + fVar435 * fVar435;
    auVar454._24_4_ = fVar434 * fVar434 + fVar43 * fVar43 + fVar42 * fVar42;
    auVar454._28_4_ = fStack_1e4 + fStack_1e4 + fVar252;
    fVar252 = auVar153._0_4_;
    fVar276 = auVar153._4_4_;
    fVar319 = auVar153._8_4_;
    fVar344 = auVar153._12_4_;
    fVar381 = auVar153._16_4_;
    fVar297 = auVar153._20_4_;
    fVar299 = auVar153._24_4_;
    fVar356 = (float)local_800._0_4_ * fVar233 * fVar252 +
              fVar249 * fVar252 * (float)local_820._0_4_ +
              fVar208 * fVar252 * (float)local_840._0_4_;
    fVar370 = (float)local_800._4_4_ * fVar271 * fVar276 +
              fVar253 * fVar276 * (float)local_820._4_4_ +
              fVar254 * fVar276 * (float)local_840._4_4_;
    fVar375 = fStack_7f8 * fVar293 * fVar319 +
              fVar277 * fVar319 * fStack_818 + fVar292 * fVar319 * fStack_838;
    fVar380 = fStack_7f4 * fVar326 * fVar344 +
              fVar322 * fVar344 * fStack_814 + fVar323 * fVar344 * fStack_834;
    fVar385 = fStack_7f0 * fVar350 * fVar381 +
              fVar346 * fVar381 * fStack_810 + fVar348 * fVar381 * fStack_830;
    fVar390 = fStack_7ec * fVar396 * fVar297 +
              fVar386 * fVar297 * fStack_80c + fVar391 * fVar297 * fStack_82c;
    fVar395 = fStack_7e8 * fVar39 * fVar299 +
              fVar37 * fVar299 * fStack_808 + fVar38 * fVar299 * fStack_828;
    fVar400 = fStack_7e4 + fStack_804 + fStack_824;
    fVar168 = fStack_7e4 + fStack_804 + fStack_824;
    local_520._0_4_ =
         fVar420 * fVar233 * fVar252 + fVar249 * fVar252 * fVar251 + fVar208 * fVar252 * fVar163;
    local_520._4_4_ =
         fVar429 * fVar271 * fVar276 + fVar253 * fVar276 * fVar275 + fVar254 * fVar276 * fVar274;
    local_520._8_4_ =
         fVar430 * fVar293 * fVar319 + fVar277 * fVar319 * fVar298 + fVar292 * fVar319 * fVar296;
    local_520._12_4_ =
         fVar431 * fVar326 * fVar344 + fVar322 * fVar344 * fVar342 + fVar323 * fVar344 * fVar341;
    local_520._16_4_ =
         fVar432 * fVar350 * fVar381 + fVar346 * fVar381 * fVar376 + fVar348 * fVar381 * fVar371;
    local_520._20_4_ =
         fVar433 * fVar396 * fVar297 + fVar386 * fVar297 * fVar36 + fVar391 * fVar297 * fVar435;
    local_520._24_4_ =
         fVar434 * fVar39 * fVar299 + fVar37 * fVar299 * fVar43 + fVar38 * fVar299 * fVar42;
    local_520._28_4_ = fStack_804 + fVar168;
    auVar419 = ZEXT3264(local_520);
    auVar68._4_4_ = fVar370 * local_520._4_4_;
    auVar68._0_4_ = fVar356 * local_520._0_4_;
    auVar68._8_4_ = fVar375 * local_520._8_4_;
    auVar68._12_4_ = fVar380 * local_520._12_4_;
    auVar68._16_4_ = fVar385 * local_520._16_4_;
    auVar68._20_4_ = fVar390 * local_520._20_4_;
    auVar68._24_4_ = fVar395 * local_520._24_4_;
    auVar68._28_4_ = fVar168;
    auVar193 = vsubps_avx(auVar441,auVar68);
    auVar69._4_4_ = local_520._4_4_ * local_520._4_4_;
    auVar69._0_4_ = local_520._0_4_ * local_520._0_4_;
    auVar69._8_4_ = local_520._8_4_ * local_520._8_4_;
    auVar69._12_4_ = local_520._12_4_ * local_520._12_4_;
    auVar69._16_4_ = local_520._16_4_ * local_520._16_4_;
    auVar69._20_4_ = local_520._20_4_ * local_520._20_4_;
    auVar69._24_4_ = local_520._24_4_ * local_520._24_4_;
    auVar69._28_4_ = fStack_804;
    auVar456 = vsubps_avx(auVar454,auVar69);
    local_5a0 = vsqrtps_avx(auVar142);
    local_b80._0_4_ = auVar33._0_4_;
    local_b80._4_4_ = auVar33._4_4_;
    fStack_b78 = auVar33._8_4_;
    fStack_b74 = auVar33._12_4_;
    fStack_b70 = auVar33._16_4_;
    fStack_b6c = auVar33._20_4_;
    fStack_b68 = auVar33._24_4_;
    fStack_b64 = auVar33._28_4_;
    fVar168 = (local_5a0._0_4_ + (float)local_b80._0_4_) * 1.0000002;
    fVar158 = (local_5a0._4_4_ + (float)local_b80._4_4_) * 1.0000002;
    fVar160 = (local_5a0._8_4_ + fStack_b78) * 1.0000002;
    fVar162 = (local_5a0._12_4_ + fStack_b74) * 1.0000002;
    fVar164 = (local_5a0._16_4_ + fStack_b70) * 1.0000002;
    fVar165 = (local_5a0._20_4_ + fStack_b6c) * 1.0000002;
    fVar166 = (local_5a0._24_4_ + fStack_b68) * 1.0000002;
    auVar70._4_4_ = fVar158 * fVar158;
    auVar70._0_4_ = fVar168 * fVar168;
    auVar70._8_4_ = fVar160 * fVar160;
    auVar70._12_4_ = fVar162 * fVar162;
    auVar70._16_4_ = fVar164 * fVar164;
    auVar70._20_4_ = fVar165 * fVar165;
    auVar70._24_4_ = fVar166 * fVar166;
    auVar70._28_4_ = local_5a0._28_4_ + fStack_b64;
    fVar451 = auVar193._0_4_ + auVar193._0_4_;
    fVar459 = auVar193._4_4_ + auVar193._4_4_;
    local_620._0_8_ = CONCAT44(fVar459,fVar451);
    local_620._8_4_ = auVar193._8_4_ + auVar193._8_4_;
    local_620._12_4_ = auVar193._12_4_ + auVar193._12_4_;
    local_620._16_4_ = auVar193._16_4_ + auVar193._16_4_;
    local_620._20_4_ = auVar193._20_4_ + auVar193._20_4_;
    local_620._24_4_ = auVar193._24_4_ + auVar193._24_4_;
    fVar168 = auVar193._28_4_;
    local_620._28_4_ = fVar168 + fVar168;
    auVar33 = vsubps_avx(auVar456,auVar70);
    local_300._4_4_ = fVar370 * fVar370;
    local_300._0_4_ = fVar356 * fVar356;
    local_300._8_4_ = fVar375 * fVar375;
    local_300._12_4_ = fVar380 * fVar380;
    local_300._16_4_ = fVar385 * fVar385;
    local_300._20_4_ = fVar390 * fVar390;
    local_300._24_4_ = fVar395 * fVar395;
    local_300._28_4_ = local_600._28_4_;
    local_6a0 = vsubps_avx(local_260,local_300);
    auVar409 = ZEXT3264(local_6a0);
    auVar71._4_4_ = fVar459 * fVar459;
    auVar71._0_4_ = fVar451 * fVar451;
    auVar71._8_4_ = local_620._8_4_ * local_620._8_4_;
    auVar71._12_4_ = local_620._12_4_ * local_620._12_4_;
    auVar71._16_4_ = local_620._16_4_ * local_620._16_4_;
    auVar71._20_4_ = local_620._20_4_ * local_620._20_4_;
    auVar71._24_4_ = local_620._24_4_ * local_620._24_4_;
    auVar71._28_4_ = fVar168;
    fVar158 = local_6a0._0_4_;
    local_580._0_4_ = fVar158 * 4.0;
    fVar160 = local_6a0._4_4_;
    local_580._4_4_ = fVar160 * 4.0;
    fVar162 = local_6a0._8_4_;
    fStack_578 = fVar162 * 4.0;
    fVar164 = local_6a0._12_4_;
    fStack_574 = fVar164 * 4.0;
    fVar165 = local_6a0._16_4_;
    fStack_570 = fVar165 * 4.0;
    fVar166 = local_6a0._20_4_;
    fStack_56c = fVar166 * 4.0;
    fVar410 = local_6a0._24_4_;
    fStack_568 = fVar410 * 4.0;
    uStack_564 = 0x40800000;
    auVar72._4_4_ = (float)local_580._4_4_ * auVar33._4_4_;
    auVar72._0_4_ = (float)local_580._0_4_ * auVar33._0_4_;
    auVar72._8_4_ = fStack_578 * auVar33._8_4_;
    auVar72._12_4_ = fStack_574 * auVar33._12_4_;
    auVar72._16_4_ = fStack_570 * auVar33._16_4_;
    auVar72._20_4_ = fStack_56c * auVar33._20_4_;
    auVar72._24_4_ = fStack_568 * auVar33._24_4_;
    auVar72._28_4_ = 0x40800000;
    auVar193 = vsubps_avx(auVar71,auVar72);
    auVar142 = vcmpps_avx(auVar193,auVar191,5);
    fVar168 = local_6a0._28_4_;
    if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar142 >> 0x7f,0) == '\0') &&
          (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar142 >> 0xbf,0) == '\0') &&
        (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar142[0x1f])
    {
      fStack_b78 = INFINITY;
      local_b80 = (undefined1  [8])0x7f8000007f800000;
      fStack_b74 = INFINITY;
      fStack_b70 = INFINITY;
      fStack_b6c = INFINITY;
      fStack_b68 = INFINITY;
      fStack_b64 = INFINITY;
      auVar471._8_4_ = 0xff800000;
      auVar471._0_8_ = 0xff800000ff800000;
      auVar471._12_4_ = 0xff800000;
      auVar471._16_4_ = 0xff800000;
      auVar471._20_4_ = 0xff800000;
      auVar471._24_4_ = 0xff800000;
      auVar471._28_4_ = 0xff800000;
      fVar400 = 0.0;
    }
    else {
      auVar45 = vsqrtps_avx(auVar193);
      auVar306._0_4_ = fVar158 + fVar158;
      auVar306._4_4_ = fVar160 + fVar160;
      auVar306._8_4_ = fVar162 + fVar162;
      auVar306._12_4_ = fVar164 + fVar164;
      auVar306._16_4_ = fVar165 + fVar165;
      auVar306._20_4_ = fVar166 + fVar166;
      auVar306._24_4_ = fVar410 + fVar410;
      auVar306._28_4_ = fVar168 + fVar168;
      auVar44 = vrcpps_avx(auVar306);
      auVar35 = vcmpps_avx(auVar193,auVar191,5);
      fVar301 = auVar44._0_4_;
      fVar314 = auVar44._4_4_;
      auVar73._4_4_ = auVar306._4_4_ * fVar314;
      auVar73._0_4_ = auVar306._0_4_ * fVar301;
      fVar316 = auVar44._8_4_;
      auVar73._8_4_ = auVar306._8_4_ * fVar316;
      fVar318 = auVar44._12_4_;
      auVar73._12_4_ = auVar306._12_4_ * fVar318;
      fVar321 = auVar44._16_4_;
      auVar73._16_4_ = auVar306._16_4_ * fVar321;
      fVar325 = auVar44._20_4_;
      auVar73._20_4_ = auVar306._20_4_ * fVar325;
      fVar329 = auVar44._24_4_;
      auVar73._24_4_ = auVar306._24_4_ * fVar329;
      auVar73._28_4_ = auVar306._28_4_;
      auVar192._8_4_ = 0x3f800000;
      auVar192._0_8_ = &DAT_3f8000003f800000;
      auVar192._12_4_ = 0x3f800000;
      auVar192._16_4_ = 0x3f800000;
      auVar192._20_4_ = 0x3f800000;
      auVar192._24_4_ = 0x3f800000;
      auVar192._28_4_ = 0x3f800000;
      auVar193 = vsubps_avx(auVar192,auVar73);
      fVar301 = fVar301 + fVar301 * auVar193._0_4_;
      fVar314 = fVar314 + fVar314 * auVar193._4_4_;
      fVar316 = fVar316 + fVar316 * auVar193._8_4_;
      fVar318 = fVar318 + fVar318 * auVar193._12_4_;
      fVar321 = fVar321 + fVar321 * auVar193._16_4_;
      fVar325 = fVar325 + fVar325 * auVar193._20_4_;
      fVar329 = fVar329 + fVar329 * auVar193._24_4_;
      auVar337._0_8_ = CONCAT44(fVar459,fVar451) ^ 0x8000000080000000;
      auVar337._8_4_ = -local_620._8_4_;
      auVar337._12_4_ = -local_620._12_4_;
      auVar337._16_4_ = -local_620._16_4_;
      auVar337._20_4_ = -local_620._20_4_;
      auVar337._24_4_ = -local_620._24_4_;
      auVar337._28_4_ = -local_620._28_4_;
      auVar191 = vsubps_avx(auVar337,auVar45);
      fVar451 = auVar191._0_4_ * fVar301;
      fVar459 = auVar191._4_4_ * fVar314;
      auVar74._4_4_ = fVar459;
      auVar74._0_4_ = fVar451;
      fVar343 = auVar191._8_4_ * fVar316;
      auVar74._8_4_ = fVar343;
      fVar345 = auVar191._12_4_ * fVar318;
      auVar74._12_4_ = fVar345;
      fVar347 = auVar191._16_4_ * fVar321;
      auVar74._16_4_ = fVar347;
      fVar349 = auVar191._20_4_ * fVar325;
      auVar74._20_4_ = fVar349;
      fVar351 = auVar191._24_4_ * fVar329;
      auVar74._24_4_ = fVar351;
      auVar74._28_4_ = auVar191._28_4_;
      auVar191 = vsubps_avx(auVar45,local_620);
      fVar301 = auVar191._0_4_ * fVar301;
      fVar314 = auVar191._4_4_ * fVar314;
      auVar75._4_4_ = fVar314;
      auVar75._0_4_ = fVar301;
      fVar316 = auVar191._8_4_ * fVar316;
      auVar75._8_4_ = fVar316;
      fVar318 = auVar191._12_4_ * fVar318;
      auVar75._12_4_ = fVar318;
      fVar321 = auVar191._16_4_ * fVar321;
      auVar75._16_4_ = fVar321;
      fVar325 = auVar191._20_4_ * fVar325;
      auVar75._20_4_ = fVar325;
      fVar329 = auVar191._24_4_ * fVar329;
      auVar75._24_4_ = fVar329;
      auVar75._28_4_ = auVar191._28_4_;
      fStack_524 = local_520._28_4_ + auVar44._28_4_ + auVar193._28_4_;
      local_540[0] = fVar252 * (local_520._0_4_ + fVar356 * fVar451);
      local_540[1] = fVar276 * (local_520._4_4_ + fVar370 * fVar459);
      local_540[2] = fVar319 * (local_520._8_4_ + fVar375 * fVar343);
      local_540[3] = fVar344 * (local_520._12_4_ + fVar380 * fVar345);
      fStack_530 = fVar381 * (local_520._16_4_ + fVar385 * fVar347);
      fStack_52c = fVar297 * (local_520._20_4_ + fVar390 * fVar349);
      fStack_528 = fVar299 * (local_520._24_4_ + fVar395 * fVar351);
      local_560[0] = fVar252 * (local_520._0_4_ + fVar356 * fVar301);
      local_560[1] = fVar276 * (local_520._4_4_ + fVar370 * fVar314);
      local_560[2] = fVar319 * (local_520._8_4_ + fVar375 * fVar316);
      local_560[3] = fVar344 * (local_520._12_4_ + fVar380 * fVar318);
      fStack_550 = fVar381 * (local_520._16_4_ + fVar385 * fVar321);
      fStack_54c = fVar297 * (local_520._20_4_ + fVar390 * fVar325);
      fStack_548 = fVar299 * (local_520._24_4_ + fVar395 * fVar329);
      fStack_544 = local_520._28_4_ + fStack_524;
      auVar307._8_4_ = 0x7f800000;
      auVar307._0_8_ = 0x7f8000007f800000;
      auVar307._12_4_ = 0x7f800000;
      auVar307._16_4_ = 0x7f800000;
      auVar307._20_4_ = 0x7f800000;
      auVar307._24_4_ = 0x7f800000;
      auVar307._28_4_ = 0x7f800000;
      _local_b80 = vblendvps_avx(auVar307,auVar74,auVar35);
      auVar338._8_4_ = 0x7fffffff;
      auVar338._0_8_ = 0x7fffffff7fffffff;
      auVar338._12_4_ = 0x7fffffff;
      auVar338._16_4_ = 0x7fffffff;
      auVar338._20_4_ = 0x7fffffff;
      auVar338._24_4_ = 0x7fffffff;
      auVar338._28_4_ = 0x7fffffff;
      auVar193 = vandps_avx(local_300,auVar338);
      auVar193 = vmaxps_avx(local_4e0,auVar193);
      auVar76._4_4_ = auVar193._4_4_ * 1.9073486e-06;
      auVar76._0_4_ = auVar193._0_4_ * 1.9073486e-06;
      auVar76._8_4_ = auVar193._8_4_ * 1.9073486e-06;
      auVar76._12_4_ = auVar193._12_4_ * 1.9073486e-06;
      auVar76._16_4_ = auVar193._16_4_ * 1.9073486e-06;
      auVar76._20_4_ = auVar193._20_4_ * 1.9073486e-06;
      auVar76._24_4_ = auVar193._24_4_ * 1.9073486e-06;
      auVar76._28_4_ = auVar193._28_4_;
      auVar193 = vandps_avx(local_6a0,auVar338);
      auVar193 = vcmpps_avx(auVar193,auVar76,1);
      auVar308._8_4_ = 0xff800000;
      auVar308._0_8_ = 0xff800000ff800000;
      auVar308._12_4_ = 0xff800000;
      auVar308._16_4_ = 0xff800000;
      auVar308._20_4_ = 0xff800000;
      auVar308._24_4_ = 0xff800000;
      auVar308._28_4_ = 0xff800000;
      auVar471 = vblendvps_avx(auVar308,auVar75,auVar35);
      auVar191 = auVar35 & auVar193;
      if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar191 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar191 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar191 >> 0x7f,0) != '\0') ||
            (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar191 >> 0xbf,0) != '\0') ||
          (auVar191 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar191[0x1f] < '\0') {
        auVar142 = vandps_avx(auVar193,auVar35);
        auVar172 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
        auVar193 = vcmpps_avx(auVar33,ZEXT832(0) << 0x20,2);
        auVar364._8_4_ = 0xff800000;
        auVar364._0_8_ = 0xff800000ff800000;
        auVar364._12_4_ = 0xff800000;
        auVar364._16_4_ = 0xff800000;
        auVar364._20_4_ = 0xff800000;
        auVar364._24_4_ = 0xff800000;
        auVar364._28_4_ = 0xff800000;
        auVar455._8_4_ = 0x7f800000;
        auVar455._0_8_ = 0x7f8000007f800000;
        auVar455._12_4_ = 0x7f800000;
        auVar455._16_4_ = 0x7f800000;
        auVar455._20_4_ = 0x7f800000;
        auVar455._24_4_ = 0x7f800000;
        auVar455._28_4_ = 0x7f800000;
        auVar33 = vblendvps_avx(auVar455,auVar364,auVar193);
        auVar213 = vpmovsxwd_avx(auVar172);
        auVar172 = vpunpckhwd_avx(auVar172,auVar172);
        auVar291._16_16_ = auVar172;
        auVar291._0_16_ = auVar213;
        _local_b80 = vblendvps_avx(_local_b80,auVar33,auVar291);
        auVar33 = vblendvps_avx(auVar364,auVar455,auVar193);
        auVar471 = vblendvps_avx(auVar471,auVar33,auVar291);
        auVar33 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar154._0_4_ = auVar142._0_4_ ^ auVar33._0_4_;
        auVar154._4_4_ = auVar142._4_4_ ^ auVar33._4_4_;
        auVar154._8_4_ = auVar142._8_4_ ^ auVar33._8_4_;
        auVar154._12_4_ = auVar142._12_4_ ^ auVar33._12_4_;
        auVar154._16_4_ = auVar142._16_4_ ^ auVar33._16_4_;
        auVar154._20_4_ = auVar142._20_4_ ^ auVar33._20_4_;
        auVar154._24_4_ = auVar142._24_4_ ^ auVar33._24_4_;
        auVar154._28_4_ = auVar142._28_4_ ^ auVar33._28_4_;
        auVar142 = vorps_avx(auVar193,auVar154);
        auVar142 = vandps_avx(auVar35,auVar142);
      }
    }
    auVar442 = ZEXT3264(local_280);
    auVar33 = local_280 & auVar142;
    auVar265._8_4_ = 0x3f800000;
    auVar265._0_8_ = &DAT_3f8000003f800000;
    auVar265._12_4_ = 0x3f800000;
    auVar265._16_4_ = 0x3f800000;
    auVar265._20_4_ = 0x3f800000;
    auVar265._24_4_ = 0x3f800000;
    auVar265._28_4_ = 0x3f800000;
    auVar270 = ZEXT3264(auVar265);
    auVar312 = ZEXT3264(local_940);
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0x7f,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar33 >> 0xbf,0) == '\0') &&
        (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f]) {
      auVar340 = ZEXT864(0) << 0x40;
    }
    else {
      local_2e0 = auVar153;
      auVar172 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_900._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_900._0_4_)),0);
      auVar266._16_16_ = auVar172;
      auVar266._0_16_ = auVar172;
      auVar35 = vminps_avx(auVar266,auVar471);
      fVar321 = auVar190._28_4_;
      auVar227._0_4_ =
           (float)local_800._0_4_ * fVar300 +
           (float)local_820._0_4_ * fVar436 + (float)local_840._0_4_ * fVar449;
      auVar227._4_4_ =
           (float)local_800._4_4_ * fVar313 +
           (float)local_820._4_4_ * fVar443 + (float)local_840._4_4_ * fVar457;
      auVar227._8_4_ = fStack_7f8 * fVar315 + fStack_818 * fVar444 + fStack_838 * fVar460;
      auVar227._12_4_ = fStack_7f4 * fVar317 + fStack_814 * fVar445 + fStack_834 * fVar462;
      auVar227._16_4_ = fStack_7f0 * fVar320 + fStack_810 * fVar446 + fStack_830 * fVar464;
      auVar227._20_4_ = fStack_7ec * fVar324 + fStack_80c * fVar447 + fStack_82c * fVar466;
      auVar227._24_4_ = fStack_7e8 * fVar328 + fStack_808 * fVar448 + fStack_828 * fVar468;
      auVar227._28_4_ = fVar330 + fStack_184 + fVar321;
      auVar33 = vrcpps_avx(auVar227);
      fVar330 = auVar33._0_4_;
      fVar451 = auVar33._4_4_;
      auVar77._4_4_ = auVar227._4_4_ * fVar451;
      auVar77._0_4_ = auVar227._0_4_ * fVar330;
      fVar459 = auVar33._8_4_;
      auVar77._8_4_ = auVar227._8_4_ * fVar459;
      fVar301 = auVar33._12_4_;
      auVar77._12_4_ = auVar227._12_4_ * fVar301;
      fVar314 = auVar33._16_4_;
      auVar77._16_4_ = auVar227._16_4_ * fVar314;
      fVar316 = auVar33._20_4_;
      auVar77._20_4_ = auVar227._20_4_ * fVar316;
      fVar318 = auVar33._24_4_;
      auVar77._24_4_ = auVar227._24_4_ * fVar318;
      auVar77._28_4_ = fStack_184;
      auVar193 = vsubps_avx(auVar265,auVar77);
      auVar339._8_4_ = 0x7fffffff;
      auVar339._0_8_ = 0x7fffffff7fffffff;
      auVar339._12_4_ = 0x7fffffff;
      auVar339._16_4_ = 0x7fffffff;
      auVar339._20_4_ = 0x7fffffff;
      auVar339._24_4_ = 0x7fffffff;
      auVar339._28_4_ = 0x7fffffff;
      auVar33 = vandps_avx(auVar227,auVar339);
      auVar408._8_4_ = 0x219392ef;
      auVar408._0_8_ = 0x219392ef219392ef;
      auVar408._12_4_ = 0x219392ef;
      auVar408._16_4_ = 0x219392ef;
      auVar408._20_4_ = 0x219392ef;
      auVar408._24_4_ = 0x219392ef;
      auVar408._28_4_ = 0x219392ef;
      auVar409 = ZEXT3264(auVar408);
      auVar190 = vcmpps_avx(auVar33,auVar408,1);
      auVar78._4_4_ =
           (fVar451 + fVar451 * auVar193._4_4_) *
           -(fVar429 * fVar313 + fVar443 * fVar275 + fVar457 * fVar274);
      auVar78._0_4_ =
           (fVar330 + fVar330 * auVar193._0_4_) *
           -(fVar420 * fVar300 + fVar436 * fVar251 + fVar449 * fVar163);
      auVar78._8_4_ =
           (fVar459 + fVar459 * auVar193._8_4_) *
           -(fVar430 * fVar315 + fVar444 * fVar298 + fVar460 * fVar296);
      auVar78._12_4_ =
           (fVar301 + fVar301 * auVar193._12_4_) *
           -(fVar431 * fVar317 + fVar445 * fVar342 + fVar462 * fVar341);
      auVar78._16_4_ =
           (fVar314 + fVar314 * auVar193._16_4_) *
           -(fVar432 * fVar320 + fVar446 * fVar376 + fVar464 * fVar371);
      auVar78._20_4_ =
           (fVar316 + fVar316 * auVar193._20_4_) *
           -(fVar433 * fVar324 + fVar447 * fVar36 + fVar466 * fVar435);
      auVar78._24_4_ =
           (fVar318 + fVar318 * auVar193._24_4_) *
           -(fVar434 * fVar328 + fVar448 * fVar43 + fVar468 * fVar42);
      auVar78._28_4_ = -(fVar321 + fVar400 + fVar321);
      auVar33 = vcmpps_avx(auVar227,ZEXT832(0) << 0x20,1);
      auVar33 = vorps_avx(auVar190,auVar33);
      auVar427._8_4_ = 0xff800000;
      auVar427._0_8_ = 0xff800000ff800000;
      auVar427._12_4_ = 0xff800000;
      auVar427._16_4_ = 0xff800000;
      auVar427._20_4_ = 0xff800000;
      auVar427._24_4_ = 0xff800000;
      auVar427._28_4_ = 0xff800000;
      auVar428 = ZEXT3264(auVar427);
      auVar33 = vblendvps_avx(auVar78,auVar427,auVar33);
      auVar193 = vcmpps_avx(auVar227,ZEXT832(0) << 0x20,6);
      auVar190 = vorps_avx(auVar190,auVar193);
      auVar472._8_4_ = 0x7f800000;
      auVar472._0_8_ = 0x7f8000007f800000;
      auVar472._12_4_ = 0x7f800000;
      auVar472._16_4_ = 0x7f800000;
      auVar472._20_4_ = 0x7f800000;
      auVar472._24_4_ = 0x7f800000;
      auVar472._28_4_ = 0x7f800000;
      auVar190 = vblendvps_avx(auVar78,auVar472,auVar190);
      auVar193 = vmaxps_avx(local_2a0,_local_b80);
      auVar193 = vmaxps_avx(auVar193,auVar33);
      auVar35 = vminps_avx(auVar35,auVar190);
      auVar191 = ZEXT832(0) << 0x20;
      auVar33 = vsubps_avx(auVar191,_local_a00);
      auVar190 = vsubps_avx(auVar191,local_b20);
      auVar79._4_4_ = auVar190._4_4_ * -fVar458;
      auVar79._0_4_ = auVar190._0_4_ * -fVar450;
      auVar79._8_4_ = auVar190._8_4_ * -fVar461;
      auVar79._12_4_ = auVar190._12_4_ * -fVar463;
      auVar79._16_4_ = auVar190._16_4_ * -fVar465;
      auVar79._20_4_ = auVar190._20_4_ * -fVar467;
      auVar79._24_4_ = auVar190._24_4_ * -fVar469;
      auVar79._28_4_ = auVar190._28_4_;
      auVar80._4_4_ = fVar272 * auVar33._4_4_;
      auVar80._0_4_ = fVar210 * auVar33._0_4_;
      auVar80._8_4_ = fVar294 * auVar33._8_4_;
      auVar80._12_4_ = fVar327 * auVar33._12_4_;
      auVar80._16_4_ = fVar352 * auVar33._16_4_;
      auVar80._20_4_ = fVar411 * auVar33._20_4_;
      auVar80._24_4_ = fVar40 * auVar33._24_4_;
      auVar80._28_4_ = auVar33._28_4_;
      auVar33 = vsubps_avx(auVar79,auVar80);
      auVar190 = vsubps_avx(auVar191,local_9a0);
      auVar81._4_4_ = fVar273 * auVar190._4_4_;
      auVar81._0_4_ = fVar250 * auVar190._0_4_;
      auVar81._8_4_ = fVar295 * auVar190._8_4_;
      auVar81._12_4_ = fVar331 * auVar190._12_4_;
      auVar81._16_4_ = fVar366 * auVar190._16_4_;
      auVar81._20_4_ = fVar412 * auVar190._20_4_;
      uVar8 = auVar190._28_4_;
      auVar81._24_4_ = fVar41 * auVar190._24_4_;
      auVar81._28_4_ = uVar8;
      auVar191 = vsubps_avx(auVar33,auVar81);
      auVar82._4_4_ = (float)local_840._4_4_ * -fVar458;
      auVar82._0_4_ = (float)local_840._0_4_ * -fVar450;
      auVar82._8_4_ = fStack_838 * -fVar461;
      auVar82._12_4_ = fStack_834 * -fVar463;
      auVar82._16_4_ = fStack_830 * -fVar465;
      auVar82._20_4_ = fStack_82c * -fVar467;
      auVar82._24_4_ = fStack_828 * -fVar469;
      auVar82._28_4_ = uVar32 ^ 0x80000000;
      auVar418._8_4_ = 0x3f800000;
      auVar418._0_8_ = &DAT_3f8000003f800000;
      auVar418._12_4_ = 0x3f800000;
      auVar418._16_4_ = 0x3f800000;
      auVar418._20_4_ = 0x3f800000;
      auVar418._24_4_ = 0x3f800000;
      auVar418._28_4_ = 0x3f800000;
      auVar419 = ZEXT3264(auVar418);
      auVar83._4_4_ = (float)local_820._4_4_ * fVar272;
      auVar83._0_4_ = (float)local_820._0_4_ * fVar210;
      auVar83._8_4_ = fStack_818 * fVar294;
      auVar83._12_4_ = fStack_814 * fVar327;
      auVar83._16_4_ = fStack_810 * fVar352;
      auVar83._20_4_ = fStack_80c * fVar411;
      auVar83._24_4_ = fStack_808 * fVar40;
      auVar83._28_4_ = uVar8;
      auVar33 = vsubps_avx(auVar82,auVar83);
      auVar84._4_4_ = (float)local_800._4_4_ * fVar273;
      auVar84._0_4_ = (float)local_800._0_4_ * fVar250;
      auVar84._8_4_ = fStack_7f8 * fVar295;
      auVar84._12_4_ = fStack_7f4 * fVar331;
      auVar84._16_4_ = fStack_7f0 * fVar366;
      auVar84._20_4_ = fStack_7ec * fVar412;
      auVar84._24_4_ = fStack_7e8 * fVar41;
      auVar84._28_4_ = uVar8;
      auVar44 = vsubps_avx(auVar33,auVar84);
      auVar33 = vrcpps_avx(auVar44);
      fVar210 = auVar33._0_4_;
      fVar250 = auVar33._4_4_;
      auVar85._4_4_ = auVar44._4_4_ * fVar250;
      auVar85._0_4_ = auVar44._0_4_ * fVar210;
      fVar163 = auVar33._8_4_;
      auVar85._8_4_ = auVar44._8_4_ * fVar163;
      fVar251 = auVar33._12_4_;
      auVar85._12_4_ = auVar44._12_4_ * fVar251;
      fVar272 = auVar33._16_4_;
      auVar85._16_4_ = auVar44._16_4_ * fVar272;
      fVar273 = auVar33._20_4_;
      auVar85._20_4_ = auVar44._20_4_ * fVar273;
      fVar274 = auVar33._24_4_;
      auVar85._24_4_ = auVar44._24_4_ * fVar274;
      auVar85._28_4_ = local_9c0._28_4_;
      auVar45 = vsubps_avx(auVar418,auVar85);
      auVar309._8_4_ = 0x7fffffff;
      auVar309._0_8_ = 0x7fffffff7fffffff;
      auVar309._12_4_ = 0x7fffffff;
      auVar309._16_4_ = 0x7fffffff;
      auVar309._20_4_ = 0x7fffffff;
      auVar309._24_4_ = 0x7fffffff;
      auVar309._28_4_ = 0x7fffffff;
      auVar33 = vandps_avx(auVar44,auVar309);
      auVar190 = vcmpps_avx(auVar33,auVar408,1);
      auVar86._4_4_ = (fVar250 + fVar250 * auVar45._4_4_) * -auVar191._4_4_;
      auVar86._0_4_ = (fVar210 + fVar210 * auVar45._0_4_) * -auVar191._0_4_;
      auVar86._8_4_ = (fVar163 + fVar163 * auVar45._8_4_) * -auVar191._8_4_;
      auVar86._12_4_ = (fVar251 + fVar251 * auVar45._12_4_) * -auVar191._12_4_;
      auVar86._16_4_ = (fVar272 + fVar272 * auVar45._16_4_) * -auVar191._16_4_;
      auVar86._20_4_ = (fVar273 + fVar273 * auVar45._20_4_) * -auVar191._20_4_;
      auVar86._24_4_ = (fVar274 + fVar274 * auVar45._24_4_) * -auVar191._24_4_;
      auVar86._28_4_ = auVar191._28_4_ ^ 0x80000000;
      auVar33 = vcmpps_avx(auVar44,ZEXT832(0) << 0x20,1);
      auVar33 = vorps_avx(auVar190,auVar33);
      auVar33 = vblendvps_avx(auVar86,auVar427,auVar33);
      local_500 = vmaxps_avx(auVar193,auVar33);
      auVar33 = vcmpps_avx(auVar44,ZEXT832(0) << 0x20,6);
      auVar33 = vorps_avx(auVar190,auVar33);
      auVar33 = vblendvps_avx(auVar86,auVar472,auVar33);
      auVar142 = vandps_avx(local_280,auVar142);
      local_320 = vminps_avx(auVar35,auVar33);
      auVar33 = vcmpps_avx(local_500,local_320,2);
      auVar190 = auVar142 & auVar33;
      if ((((((((auVar190 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar190 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar190 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar190 >> 0x7f,0) == '\0') &&
            (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar190 >> 0xbf,0) == '\0') &&
          (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar190[0x1f]) {
        auVar270 = ZEXT3264(auVar418);
        auVar340 = ZEXT864(0) << 0x20;
        auVar312 = ZEXT3264(local_940);
      }
      else {
        auVar190 = vminps_avx(local_7e0,auVar147);
        auVar34 = vminps_avx(local_680,auVar34);
        auVar34 = vminps_avx(auVar190,auVar34);
        auVar34 = vsubps_avx(auVar34,local_5a0);
        auVar142 = vandps_avx(auVar33,auVar142);
        auVar119._4_4_ = local_540[1];
        auVar119._0_4_ = local_540[0];
        auVar119._8_4_ = local_540[2];
        auVar119._12_4_ = local_540[3];
        auVar119._16_4_ = fStack_530;
        auVar119._20_4_ = fStack_52c;
        auVar119._24_4_ = fStack_528;
        auVar119._28_4_ = fStack_524;
        auVar33 = vminps_avx(auVar119,auVar418);
        auVar33 = vmaxps_avx(auVar33,ZEXT832(0) << 0x20);
        local_540[0] = fVar129 + fVar167 * (auVar33._0_4_ + 0.0) * 0.125;
        local_540[1] = fVar157 + fVar206 * (auVar33._4_4_ + 1.0) * 0.125;
        local_540[2] = fVar159 + fVar207 * (auVar33._8_4_ + 2.0) * 0.125;
        local_540[3] = fVar161 + fVar209 * (auVar33._12_4_ + 3.0) * 0.125;
        fStack_530 = fVar129 + fVar167 * (auVar33._16_4_ + 4.0) * 0.125;
        fStack_52c = fVar157 + fVar206 * (auVar33._20_4_ + 5.0) * 0.125;
        fStack_528 = fVar159 + fVar207 * (auVar33._24_4_ + 6.0) * 0.125;
        fStack_524 = fVar161 + auVar33._28_4_ + 7.0;
        auVar118._4_4_ = local_560[1];
        auVar118._0_4_ = local_560[0];
        auVar118._8_4_ = local_560[2];
        auVar118._12_4_ = local_560[3];
        auVar118._16_4_ = fStack_550;
        auVar118._20_4_ = fStack_54c;
        auVar118._24_4_ = fStack_548;
        auVar118._28_4_ = fStack_544;
        auVar33 = vminps_avx(auVar118,auVar418);
        auVar33 = vmaxps_avx(auVar33,ZEXT832(0) << 0x20);
        local_560[0] = fVar129 + fVar167 * (auVar33._0_4_ + 0.0) * 0.125;
        local_560[1] = fVar157 + fVar206 * (auVar33._4_4_ + 1.0) * 0.125;
        local_560[2] = fVar159 + fVar207 * (auVar33._8_4_ + 2.0) * 0.125;
        local_560[3] = fVar161 + fVar209 * (auVar33._12_4_ + 3.0) * 0.125;
        fStack_550 = fVar129 + fVar167 * (auVar33._16_4_ + 4.0) * 0.125;
        fStack_54c = fVar157 + fVar206 * (auVar33._20_4_ + 5.0) * 0.125;
        fStack_548 = fVar159 + fVar207 * (auVar33._24_4_ + 6.0) * 0.125;
        fStack_544 = fVar161 + auVar33._28_4_ + 7.0;
        auVar87._4_4_ = auVar34._4_4_ * 0.99999976;
        auVar87._0_4_ = auVar34._0_4_ * 0.99999976;
        auVar87._8_4_ = auVar34._8_4_ * 0.99999976;
        auVar87._12_4_ = auVar34._12_4_ * 0.99999976;
        auVar87._16_4_ = auVar34._16_4_ * 0.99999976;
        auVar87._20_4_ = auVar34._20_4_ * 0.99999976;
        auVar87._24_4_ = auVar34._24_4_ * 0.99999976;
        auVar87._28_4_ = 0x3f7ffffc;
        auVar33 = vmaxps_avx(ZEXT832(0) << 0x20,auVar87);
        auVar88._4_4_ = auVar33._4_4_ * auVar33._4_4_;
        auVar88._0_4_ = auVar33._0_4_ * auVar33._0_4_;
        auVar88._8_4_ = auVar33._8_4_ * auVar33._8_4_;
        auVar88._12_4_ = auVar33._12_4_ * auVar33._12_4_;
        auVar88._16_4_ = auVar33._16_4_ * auVar33._16_4_;
        auVar88._20_4_ = auVar33._20_4_ * auVar33._20_4_;
        auVar88._24_4_ = auVar33._24_4_ * auVar33._24_4_;
        auVar88._28_4_ = auVar33._28_4_;
        local_a40 = vsubps_avx(auVar456,auVar88);
        auVar89._4_4_ = local_a40._4_4_ * (float)local_580._4_4_;
        auVar89._0_4_ = local_a40._0_4_ * (float)local_580._0_4_;
        auVar89._8_4_ = local_a40._8_4_ * fStack_578;
        auVar89._12_4_ = local_a40._12_4_ * fStack_574;
        auVar89._16_4_ = local_a40._16_4_ * fStack_570;
        auVar89._20_4_ = local_a40._20_4_ * fStack_56c;
        auVar89._24_4_ = local_a40._24_4_ * fStack_568;
        auVar89._28_4_ = auVar33._28_4_;
        auVar34 = vsubps_avx(auVar71,auVar89);
        local_ae0 = vcmpps_avx(auVar34,ZEXT832(0) << 0x20,5);
        fVar210 = local_940._28_4_;
        auVar33 = local_ae0;
        if ((((((((local_ae0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_ae0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_ae0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_ae0 >> 0x7f,0) == '\0') &&
              (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_ae0 >> 0xbf,0) == '\0') &&
            (local_ae0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_ae0[0x1f]) {
          auVar193 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_8c0 = ZEXT832(0) << 0x20;
          _local_8e0 = ZEXT832(0) << 0x20;
          auVar241 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar409 = ZEXT864(0) << 0x20;
          auVar267._8_4_ = 0x7f800000;
          auVar267._0_8_ = 0x7f8000007f800000;
          auVar267._12_4_ = 0x7f800000;
          auVar267._16_4_ = 0x7f800000;
          auVar267._20_4_ = 0x7f800000;
          auVar267._24_4_ = 0x7f800000;
          auVar267._28_4_ = 0x7f800000;
          auVar285._8_4_ = 0xff800000;
          auVar285._0_8_ = 0xff800000ff800000;
          auVar285._12_4_ = 0xff800000;
          auVar285._16_4_ = 0xff800000;
          auVar285._20_4_ = 0xff800000;
          auVar285._24_4_ = 0xff800000;
          auVar285._28_4_ = 0xff800000;
          local_ae0 = auVar48;
          local_a40 = auVar49;
          _local_8a0 = _local_8c0;
        }
        else {
          auVar193 = vsqrtps_avx(auVar34);
          auVar246._0_4_ = fVar158 + fVar158;
          auVar246._4_4_ = fVar160 + fVar160;
          auVar246._8_4_ = fVar162 + fVar162;
          auVar246._12_4_ = fVar164 + fVar164;
          auVar246._16_4_ = fVar165 + fVar165;
          auVar246._20_4_ = fVar166 + fVar166;
          auVar246._24_4_ = fVar410 + fVar410;
          auVar246._28_4_ = fVar168 + fVar168;
          auVar190 = vrcpps_avx(auVar246);
          fVar168 = auVar190._0_4_;
          fVar250 = auVar190._4_4_;
          auVar90._4_4_ = auVar246._4_4_ * fVar250;
          auVar90._0_4_ = auVar246._0_4_ * fVar168;
          fVar163 = auVar190._8_4_;
          auVar90._8_4_ = auVar246._8_4_ * fVar163;
          fVar251 = auVar190._12_4_;
          auVar90._12_4_ = auVar246._12_4_ * fVar251;
          fVar272 = auVar190._16_4_;
          auVar90._16_4_ = auVar246._16_4_ * fVar272;
          fVar273 = auVar190._20_4_;
          auVar90._20_4_ = auVar246._20_4_ * fVar273;
          fVar274 = auVar190._24_4_;
          auVar90._24_4_ = auVar246._24_4_ * fVar274;
          auVar90._28_4_ = auVar246._28_4_;
          auVar456 = vsubps_avx(auVar418,auVar90);
          fVar168 = fVar168 + fVar168 * auVar456._0_4_;
          fVar250 = fVar250 + fVar250 * auVar456._4_4_;
          fVar163 = fVar163 + fVar163 * auVar456._8_4_;
          fVar251 = fVar251 + fVar251 * auVar456._12_4_;
          fVar272 = fVar272 + fVar272 * auVar456._16_4_;
          fVar273 = fVar273 + fVar273 * auVar456._20_4_;
          fVar274 = fVar274 + fVar274 * auVar456._24_4_;
          fVar275 = auVar190._28_4_ + auVar456._28_4_;
          auVar286._0_8_ = local_620._0_8_ ^ 0x8000000080000000;
          auVar286._8_4_ = -local_620._8_4_;
          auVar286._12_4_ = -local_620._12_4_;
          auVar286._16_4_ = -local_620._16_4_;
          auVar286._20_4_ = -local_620._20_4_;
          auVar286._24_4_ = -local_620._24_4_;
          auVar286._28_4_ = -local_620._28_4_;
          auVar190 = vsubps_avx(auVar286,auVar193);
          fVar342 = auVar190._0_4_ * fVar168;
          fVar352 = auVar190._4_4_ * fVar250;
          auVar91._4_4_ = fVar352;
          auVar91._0_4_ = fVar342;
          fVar366 = auVar190._8_4_ * fVar163;
          auVar91._8_4_ = fVar366;
          fVar371 = auVar190._12_4_ * fVar251;
          auVar91._12_4_ = fVar371;
          fVar376 = auVar190._16_4_ * fVar272;
          auVar91._16_4_ = fVar376;
          fVar411 = auVar190._20_4_ * fVar273;
          auVar91._20_4_ = fVar411;
          fVar412 = auVar190._24_4_ * fVar274;
          auVar91._24_4_ = fVar412;
          auVar91._28_4_ = 0x80000000;
          auVar193 = vsubps_avx(auVar193,local_620);
          fVar168 = auVar193._0_4_ * fVar168;
          fVar250 = auVar193._4_4_ * fVar250;
          auVar92._4_4_ = fVar250;
          auVar92._0_4_ = fVar168;
          fVar163 = auVar193._8_4_ * fVar163;
          auVar92._8_4_ = fVar163;
          fVar251 = auVar193._12_4_ * fVar251;
          auVar92._12_4_ = fVar251;
          fVar272 = auVar193._16_4_ * fVar272;
          auVar92._16_4_ = fVar272;
          fVar273 = auVar193._20_4_ * fVar273;
          auVar92._20_4_ = fVar273;
          fVar274 = auVar193._24_4_ * fVar274;
          auVar92._24_4_ = fVar274;
          auVar92._28_4_ = local_280._28_4_;
          auVar442 = ZEXT3264(auVar92);
          fVar294 = fVar252 * (fVar342 * fVar356 + local_520._0_4_);
          fVar295 = fVar276 * (fVar352 * fVar370 + local_520._4_4_);
          fVar296 = fVar319 * (fVar366 * fVar375 + local_520._8_4_);
          fVar298 = fVar344 * (fVar371 * fVar380 + local_520._12_4_);
          fVar327 = fVar381 * (fVar376 * fVar385 + local_520._16_4_);
          fVar331 = fVar297 * (fVar411 * fVar390 + local_520._20_4_);
          fVar341 = fVar299 * (fVar412 * fVar395 + local_520._24_4_);
          auVar194._0_4_ = fVar353 + fVar233 * fVar294;
          auVar194._4_4_ = fVar367 + fVar271 * fVar295;
          auVar194._8_4_ = fVar372 + fVar293 * fVar296;
          auVar194._12_4_ = fVar377 + fVar326 * fVar298;
          auVar194._16_4_ = fVar382 + fVar350 * fVar327;
          auVar194._20_4_ = fVar387 + fVar396 * fVar331;
          auVar194._24_4_ = fVar392 + fVar39 * fVar341;
          auVar194._28_4_ = fVar397 + auVar193._28_4_ + local_520._28_4_;
          auVar93._4_4_ = (float)local_800._4_4_ * fVar352;
          auVar93._0_4_ = (float)local_800._0_4_ * fVar342;
          auVar93._8_4_ = fStack_7f8 * fVar366;
          auVar93._12_4_ = fStack_7f4 * fVar371;
          auVar93._16_4_ = fStack_7f0 * fVar376;
          auVar93._20_4_ = fStack_7ec * fVar411;
          auVar93._24_4_ = fStack_7e8 * fVar412;
          auVar93._28_4_ = fVar275;
          auVar193 = vsubps_avx(auVar93,auVar194);
          auVar247._0_4_ = fVar354 + fVar249 * fVar294;
          auVar247._4_4_ = fVar368 + fVar253 * fVar295;
          auVar247._8_4_ = fVar373 + fVar277 * fVar296;
          auVar247._12_4_ = fVar378 + fVar322 * fVar298;
          auVar247._16_4_ = fVar383 + fVar346 * fVar327;
          auVar247._20_4_ = fVar388 + fVar386 * fVar331;
          auVar247._24_4_ = fVar393 + fVar37 * fVar341;
          auVar247._28_4_ = fVar398 + fVar275;
          auVar94._4_4_ = (float)local_820._4_4_ * fVar352;
          auVar94._0_4_ = (float)local_820._0_4_ * fVar342;
          auVar94._8_4_ = fStack_818 * fVar366;
          auVar94._12_4_ = fStack_814 * fVar371;
          auVar94._16_4_ = fStack_810 * fVar376;
          auVar94._20_4_ = fStack_80c * fVar411;
          auVar94._24_4_ = fStack_808 * fVar412;
          auVar94._28_4_ = fVar210;
          local_b20 = vsubps_avx(auVar94,auVar247);
          auVar287._0_4_ = fVar355 + fVar208 * fVar294;
          auVar287._4_4_ = fVar369 + fVar254 * fVar295;
          auVar287._8_4_ = fVar374 + fVar292 * fVar296;
          auVar287._12_4_ = fVar379 + fVar323 * fVar298;
          auVar287._16_4_ = fVar384 + fVar348 * fVar327;
          auVar287._20_4_ = fVar389 + fVar391 * fVar331;
          auVar287._24_4_ = fVar394 + fVar38 * fVar341;
          auVar287._28_4_ = fVar399 + auVar190._28_4_;
          auVar95._4_4_ = (float)local_840._4_4_ * fVar352;
          auVar95._0_4_ = (float)local_840._0_4_ * fVar342;
          auVar95._8_4_ = fStack_838 * fVar366;
          auVar95._12_4_ = fStack_834 * fVar371;
          auVar95._16_4_ = fStack_830 * fVar376;
          auVar95._20_4_ = fStack_82c * fVar411;
          auVar95._24_4_ = fStack_828 * fVar412;
          auVar95._28_4_ = fVar210;
          local_960 = vsubps_avx(auVar95,auVar287);
          fVar252 = fVar252 * (fVar168 * fVar356 + local_520._0_4_);
          fVar276 = fVar276 * (fVar250 * fVar370 + local_520._4_4_);
          fVar319 = fVar319 * (fVar163 * fVar375 + local_520._8_4_);
          fVar344 = fVar344 * (fVar251 * fVar380 + local_520._12_4_);
          fVar381 = fVar381 * (fVar272 * fVar385 + local_520._16_4_);
          fVar297 = fVar297 * (fVar273 * fVar390 + local_520._20_4_);
          fVar299 = fVar299 * (fVar274 * fVar395 + local_520._24_4_);
          auVar310._0_4_ = fVar353 + fVar233 * fVar252;
          auVar310._4_4_ = fVar367 + fVar271 * fVar276;
          auVar310._8_4_ = fVar372 + fVar293 * fVar319;
          auVar310._12_4_ = fVar377 + fVar326 * fVar344;
          auVar310._16_4_ = fVar382 + fVar350 * fVar381;
          auVar310._20_4_ = fVar387 + fVar396 * fVar297;
          auVar310._24_4_ = fVar392 + fVar39 * fVar299;
          auVar310._28_4_ = fVar397 + fVar210;
          auVar96._4_4_ = (float)local_800._4_4_ * fVar250;
          auVar96._0_4_ = (float)local_800._0_4_ * fVar168;
          auVar96._8_4_ = fStack_7f8 * fVar163;
          auVar96._12_4_ = fStack_7f4 * fVar251;
          auVar96._16_4_ = fStack_7f0 * fVar272;
          auVar96._20_4_ = fStack_7ec * fVar273;
          auVar96._24_4_ = fStack_7e8 * fVar274;
          auVar96._28_4_ = fStack_7e4;
          _local_8a0 = vsubps_avx(auVar96,auVar310);
          auVar311._0_4_ = fVar354 + fVar249 * fVar252;
          auVar311._4_4_ = fVar368 + fVar253 * fVar276;
          auVar311._8_4_ = fVar373 + fVar277 * fVar319;
          auVar311._12_4_ = fVar378 + fVar322 * fVar344;
          auVar311._16_4_ = fVar383 + fVar346 * fVar381;
          auVar311._20_4_ = fVar388 + fVar386 * fVar297;
          auVar311._24_4_ = fVar393 + fVar37 * fVar299;
          auVar311._28_4_ = fVar398 + local_8a0._28_4_;
          auVar97._4_4_ = (float)local_820._4_4_ * fVar250;
          auVar97._0_4_ = (float)local_820._0_4_ * fVar168;
          auVar97._8_4_ = fStack_818 * fVar163;
          auVar97._12_4_ = fStack_814 * fVar251;
          auVar97._16_4_ = fStack_810 * fVar272;
          auVar97._20_4_ = fStack_80c * fVar273;
          auVar97._24_4_ = fStack_808 * fVar274;
          auVar97._28_4_ = fStack_7e4;
          _local_8c0 = vsubps_avx(auVar97,auVar311);
          auVar288._0_4_ = fVar355 + fVar208 * fVar252;
          auVar288._4_4_ = fVar369 + fVar254 * fVar276;
          auVar288._8_4_ = fVar374 + fVar292 * fVar319;
          auVar288._12_4_ = fVar379 + fVar323 * fVar344;
          auVar288._16_4_ = fVar384 + fVar348 * fVar381;
          auVar288._20_4_ = fVar389 + fVar391 * fVar297;
          auVar288._24_4_ = fVar394 + fVar38 * fVar299;
          auVar288._28_4_ = fVar399 + local_960._28_4_ + local_520._28_4_;
          auVar98._4_4_ = (float)local_840._4_4_ * fVar250;
          auVar98._0_4_ = (float)local_840._0_4_ * fVar168;
          auVar98._8_4_ = fStack_838 * fVar163;
          auVar98._12_4_ = fStack_834 * fVar251;
          auVar98._16_4_ = fStack_830 * fVar272;
          auVar98._20_4_ = fStack_82c * fVar273;
          auVar98._24_4_ = fStack_828 * fVar274;
          auVar98._28_4_ = local_8c0._28_4_;
          _local_8e0 = vsubps_avx(auVar98,auVar288);
          auVar190 = vcmpps_avx(auVar34,_DAT_02020f00,5);
          auVar268._8_4_ = 0x7f800000;
          auVar268._0_8_ = 0x7f8000007f800000;
          auVar268._12_4_ = 0x7f800000;
          auVar268._16_4_ = 0x7f800000;
          auVar268._20_4_ = 0x7f800000;
          auVar268._24_4_ = 0x7f800000;
          auVar268._28_4_ = 0x7f800000;
          auVar267 = vblendvps_avx(auVar268,auVar91,auVar190);
          auVar363._8_4_ = 0x7fffffff;
          auVar363._0_8_ = 0x7fffffff7fffffff;
          auVar363._12_4_ = 0x7fffffff;
          auVar363._16_4_ = 0x7fffffff;
          auVar363._20_4_ = 0x7fffffff;
          auVar363._24_4_ = 0x7fffffff;
          auVar363._28_4_ = 0x7fffffff;
          auVar34 = vandps_avx(auVar363,local_300);
          auVar34 = vmaxps_avx(local_4e0,auVar34);
          auVar99._4_4_ = auVar34._4_4_ * 1.9073486e-06;
          auVar99._0_4_ = auVar34._0_4_ * 1.9073486e-06;
          auVar99._8_4_ = auVar34._8_4_ * 1.9073486e-06;
          auVar99._12_4_ = auVar34._12_4_ * 1.9073486e-06;
          auVar99._16_4_ = auVar34._16_4_ * 1.9073486e-06;
          auVar99._20_4_ = auVar34._20_4_ * 1.9073486e-06;
          auVar99._24_4_ = auVar34._24_4_ * 1.9073486e-06;
          auVar99._28_4_ = auVar34._28_4_;
          auVar34 = vandps_avx(auVar363,local_6a0);
          auVar34 = vcmpps_avx(auVar34,auVar99,1);
          auVar289._8_4_ = 0xff800000;
          auVar289._0_8_ = 0xff800000ff800000;
          auVar289._12_4_ = 0xff800000;
          auVar289._16_4_ = 0xff800000;
          auVar289._20_4_ = 0xff800000;
          auVar289._24_4_ = 0xff800000;
          auVar289._28_4_ = 0xff800000;
          auVar285 = vblendvps_avx(auVar289,auVar92,auVar190);
          auVar456 = auVar190 & auVar34;
          if ((((((((auVar456 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar456 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar456 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar456 >> 0x7f,0) != '\0') ||
                (auVar456 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar456 >> 0xbf,0) != '\0') ||
              (auVar456 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar456[0x1f] < '\0') {
            auVar33 = vandps_avx(auVar34,auVar190);
            auVar172 = vpackssdw_avx(auVar33._0_16_,auVar33._16_16_);
            auVar456 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar34 = vcmpps_avx(local_a40,auVar456,2);
            auVar473._8_4_ = 0xff800000;
            auVar473._0_8_ = 0xff800000ff800000;
            auVar473._12_4_ = 0xff800000;
            auVar473._16_4_ = 0xff800000;
            auVar473._20_4_ = 0xff800000;
            auVar473._24_4_ = 0xff800000;
            auVar473._28_4_ = 0xff800000;
            auVar474._8_4_ = 0x7f800000;
            auVar474._0_8_ = 0x7f8000007f800000;
            auVar474._12_4_ = 0x7f800000;
            auVar474._16_4_ = 0x7f800000;
            auVar474._20_4_ = 0x7f800000;
            auVar474._24_4_ = 0x7f800000;
            auVar474._28_4_ = 0x7f800000;
            auVar153 = vblendvps_avx(auVar474,auVar473,auVar34);
            auVar213 = vpmovsxwd_avx(auVar172);
            auVar442 = ZEXT1664(auVar213);
            auVar172 = vpunpckhwd_avx(auVar172,auVar172);
            auVar365._16_16_ = auVar172;
            auVar365._0_16_ = auVar213;
            auVar267 = vblendvps_avx(auVar267,auVar153,auVar365);
            auVar153 = vblendvps_avx(auVar473,auVar474,auVar34);
            auVar285 = vblendvps_avx(auVar285,auVar153,auVar365);
            auVar456 = vcmpps_avx(auVar456,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar155._0_4_ = auVar456._0_4_ ^ auVar33._0_4_;
            auVar155._4_4_ = auVar456._4_4_ ^ auVar33._4_4_;
            auVar155._8_4_ = auVar456._8_4_ ^ auVar33._8_4_;
            auVar155._12_4_ = auVar456._12_4_ ^ auVar33._12_4_;
            auVar155._16_4_ = auVar456._16_4_ ^ auVar33._16_4_;
            auVar155._20_4_ = auVar456._20_4_ ^ auVar33._20_4_;
            auVar155._24_4_ = auVar456._24_4_ ^ auVar33._24_4_;
            auVar155._28_4_ = auVar456._28_4_ ^ auVar33._28_4_;
            auVar33 = vorps_avx(auVar34,auVar155);
            auVar33 = vandps_avx(auVar190,auVar33);
          }
          auVar428 = ZEXT3264(auVar153);
          auVar241 = local_b20._0_28_;
          auVar409 = ZEXT3264(local_960);
          _local_a00 = auVar193;
        }
        auVar312 = ZEXT3264(local_940);
        _local_380 = local_500;
        local_360 = vminps_avx(local_320,auVar267);
        _local_340 = vmaxps_avx(local_500,auVar285);
        auVar419 = ZEXT3264(_local_340);
        auVar153 = vcmpps_avx(local_500,local_360,2);
        _local_580 = vandps_avx(auVar153,auVar142);
        local_640 = _local_580;
        auVar153 = vcmpps_avx(_local_340,local_320,2);
        local_660 = vandps_avx(auVar153,auVar142);
        auVar142 = vorps_avx(local_660,_local_580);
        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar142 >> 0x7f,0) == '\0') &&
              (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar142 >> 0xbf,0) == '\0') &&
            (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar142[0x1f]) {
          auVar340 = ZEXT864(0) << 0x20;
        }
        else {
          _local_5c0 = _local_340;
          local_5e0 = local_660;
          local_880 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_620._0_4_ = auVar33._0_4_ ^ local_880._0_4_;
          local_620._4_4_ = auVar33._4_4_ ^ local_880._4_4_;
          local_620._8_4_ = (float)(auVar33._8_4_ ^ local_880._8_4_);
          local_620._12_4_ = (float)(auVar33._12_4_ ^ local_880._12_4_);
          local_620._16_4_ = (float)(auVar33._16_4_ ^ local_880._16_4_);
          local_620._20_4_ = (float)(auVar33._20_4_ ^ local_880._20_4_);
          local_620._24_4_ = (float)(auVar33._24_4_ ^ local_880._24_4_);
          local_620._28_4_ = (float)((uint)auVar33._28_4_ ^ (uint)local_880._28_4_);
          auVar148._0_4_ =
               auVar193._0_4_ * (float)local_800._0_4_ +
               auVar241._0_4_ * (float)local_820._0_4_ + auVar409._0_4_ * (float)local_840._0_4_;
          auVar148._4_4_ =
               auVar193._4_4_ * (float)local_800._4_4_ +
               auVar241._4_4_ * (float)local_820._4_4_ + auVar409._4_4_ * (float)local_840._4_4_;
          auVar148._8_4_ =
               auVar193._8_4_ * fStack_7f8 +
               auVar241._8_4_ * fStack_818 + auVar409._8_4_ * fStack_838;
          auVar148._12_4_ =
               auVar193._12_4_ * fStack_7f4 +
               auVar241._12_4_ * fStack_814 + auVar409._12_4_ * fStack_834;
          auVar148._16_4_ =
               auVar193._16_4_ * fStack_7f0 +
               auVar241._16_4_ * fStack_810 + auVar409._16_4_ * fStack_830;
          auVar148._20_4_ =
               auVar193._20_4_ * fStack_7ec +
               auVar241._20_4_ * fStack_80c + auVar409._20_4_ * fStack_82c;
          auVar148._24_4_ =
               auVar193._24_4_ * fStack_7e8 +
               auVar241._24_4_ * fStack_808 + auVar409._24_4_ * fStack_828;
          auVar148._28_4_ = auVar33._28_4_ + auVar193._28_4_ + local_880._28_4_;
          auVar195._8_4_ = 0x7fffffff;
          auVar195._0_8_ = 0x7fffffff7fffffff;
          auVar195._12_4_ = 0x7fffffff;
          auVar195._16_4_ = 0x7fffffff;
          auVar195._20_4_ = 0x7fffffff;
          auVar195._24_4_ = 0x7fffffff;
          auVar195._28_4_ = 0x7fffffff;
          auVar142 = vandps_avx(auVar148,auVar195);
          auVar196._8_4_ = 0x3e99999a;
          auVar196._0_8_ = 0x3e99999a3e99999a;
          auVar196._12_4_ = 0x3e99999a;
          auVar196._16_4_ = 0x3e99999a;
          auVar196._20_4_ = 0x3e99999a;
          auVar196._24_4_ = 0x3e99999a;
          auVar196._28_4_ = 0x3e99999a;
          auVar142 = vcmpps_avx(auVar142,auVar196,1);
          auVar142 = vorps_avx(auVar142,local_620);
          auVar197._8_4_ = 3;
          auVar197._0_8_ = 0x300000003;
          auVar197._12_4_ = 3;
          auVar197._16_4_ = 3;
          auVar197._20_4_ = 3;
          auVar197._24_4_ = 3;
          auVar197._28_4_ = 3;
          auVar228._8_4_ = 2;
          auVar228._0_8_ = 0x200000002;
          auVar228._12_4_ = 2;
          auVar228._16_4_ = 2;
          auVar228._20_4_ = 2;
          auVar228._24_4_ = 2;
          auVar228._28_4_ = 2;
          auVar142 = vblendvps_avx(auVar228,auVar197,auVar142);
          local_600 = ZEXT432((uint)uVar126);
          auVar213 = vpshufd_avx(ZEXT416((uint)uVar126),0);
          auVar172 = vpcmpgtd_avx(auVar142._16_16_,auVar213);
          local_6a0._0_16_ = auVar213;
          auVar213 = vpcmpgtd_avx(auVar142._0_16_,auVar213);
          auVar198._16_16_ = auVar172;
          auVar198._0_16_ = auVar213;
          local_5a0 = vblendps_avx(ZEXT1632(auVar213),auVar198,0xf0);
          local_640 = vandnps_avx(local_5a0,_local_580);
          auVar142 = _local_580 & ~local_5a0;
          auVar340 = ZEXT464(0) << 0x20;
          auVar270 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_680._0_8_ = uVar126;
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar142 >> 0x7f,0) != '\0') ||
                (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0xbf,0) != '\0') ||
              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar142[0x1f] < '\0') {
            local_860._4_4_ = local_500._4_4_ + local_940._4_4_;
            local_860._0_4_ = local_500._0_4_ + local_940._0_4_;
            fStack_858 = local_500._8_4_ + local_940._8_4_;
            fStack_854 = local_500._12_4_ + local_940._12_4_;
            fStack_850 = local_500._16_4_ + local_940._16_4_;
            fStack_84c = local_500._20_4_ + local_940._20_4_;
            fStack_848 = local_500._24_4_ + local_940._24_4_;
            fStack_844 = local_500._28_4_ + fVar210;
            do {
              auVar257 = auVar270._0_16_;
              auVar199._8_4_ = 0x7f800000;
              auVar199._0_8_ = 0x7f8000007f800000;
              auVar199._12_4_ = 0x7f800000;
              auVar199._16_4_ = 0x7f800000;
              auVar199._20_4_ = 0x7f800000;
              auVar199._24_4_ = 0x7f800000;
              auVar199._28_4_ = 0x7f800000;
              auVar142 = vblendvps_avx(auVar199,local_500,local_640);
              auVar153 = vshufps_avx(auVar142,auVar142,0xb1);
              auVar153 = vminps_avx(auVar142,auVar153);
              auVar33 = vshufpd_avx(auVar153,auVar153,5);
              auVar153 = vminps_avx(auVar153,auVar33);
              auVar33 = vperm2f128_avx(auVar153,auVar153,1);
              auVar153 = vminps_avx(auVar153,auVar33);
              auVar153 = vcmpps_avx(auVar142,auVar153,0);
              auVar33 = local_640 & auVar153;
              auVar142 = local_640;
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0x7f,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0xbf,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                auVar142 = vandps_avx(auVar153,local_640);
              }
              uVar122 = vmovmskps_avx(auVar142);
              uVar32 = 0;
              if (uVar122 != 0) {
                for (; (uVar122 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar126 = (ulong)uVar32;
              *(undefined4 *)(local_640 + uVar126 * 4) = 0;
              fVar168 = local_540[uVar126];
              uVar32 = *(uint *)(local_380 + uVar126 * 4);
              fVar249 = local_b24;
              if ((float)local_980._0_4_ < 0.0) {
                fVar249 = sqrtf((float)local_980._0_4_);
                auVar257._8_4_ = 0x7fffffff;
                auVar257._0_8_ = 0x7fffffff7fffffff;
                auVar257._12_4_ = 0x7fffffff;
                auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar442 = ZEXT464(uVar32);
              auVar428 = ZEXT464((uint)fVar168);
              auVar213 = vminps_avx(_local_a80,_local_aa0);
              auVar172 = vmaxps_avx(_local_a80,_local_aa0);
              auVar134 = vminps_avx(_local_a90,_local_ab0);
              auVar215 = vminps_avx(auVar213,auVar134);
              auVar213 = vmaxps_avx(_local_a90,_local_ab0);
              auVar134 = vmaxps_avx(auVar172,auVar213);
              auVar172 = vandps_avx(auVar215,auVar257);
              auVar213 = vandps_avx(auVar134,auVar257);
              auVar172 = vmaxps_avx(auVar172,auVar213);
              auVar213 = vmovshdup_avx(auVar172);
              auVar213 = vmaxss_avx(auVar213,auVar172);
              auVar172 = vshufpd_avx(auVar172,auVar172,1);
              auVar172 = vmaxss_avx(auVar172,auVar213);
              fVar168 = auVar172._0_4_ * 1.9073486e-06;
              local_9a0._0_4_ = fVar249 * 1.9073486e-06;
              local_7e0._0_16_ = vshufps_avx(auVar134,auVar134,0xff);
              lVar125 = 4;
              do {
                fVar251 = auVar428._0_4_;
                fVar163 = 1.0 - fVar251;
                fVar249 = fVar163 * fVar163;
                fVar208 = fVar163 * fVar249;
                fVar233 = fVar251 * fVar251;
                fVar210 = fVar251 * fVar233;
                fVar250 = fVar251 * fVar163;
                local_b20._0_4_ = fVar250;
                auVar172 = vshufps_avx(ZEXT416((uint)(fVar210 * 0.16666667)),
                                       ZEXT416((uint)(fVar210 * 0.16666667)),0);
                auVar213 = ZEXT416((uint)((fVar210 * 4.0 + fVar208 +
                                          fVar251 * fVar250 * 12.0 + fVar163 * fVar250 * 6.0) *
                                         0.16666667));
                auVar213 = vshufps_avx(auVar213,auVar213,0);
                auVar134 = ZEXT416((uint)((fVar208 * 4.0 + fVar210 +
                                          fVar163 * fVar250 * 12.0 + fVar251 * fVar250 * 6.0) *
                                         0.16666667));
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar215 = vshufps_avx(auVar442._0_16_,auVar442._0_16_,0);
                auVar214._0_4_ = auVar215._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar214._4_4_ = auVar215._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar214._8_4_ = auVar215._8_4_ * fStack_968 + 0.0;
                auVar214._12_4_ = auVar215._12_4_ * fStack_964 + 0.0;
                auVar215 = vshufps_avx(ZEXT416((uint)(fVar208 * 0.16666667)),
                                       ZEXT416((uint)(fVar208 * 0.16666667)),0);
                auVar132._0_4_ =
                     auVar215._0_4_ * (float)local_a80._0_4_ +
                     auVar134._0_4_ * (float)local_aa0._0_4_ +
                     auVar172._0_4_ * (float)local_ab0._0_4_ +
                     auVar213._0_4_ * (float)local_a90._0_4_;
                auVar132._4_4_ =
                     auVar215._4_4_ * (float)local_a80._4_4_ +
                     auVar134._4_4_ * (float)local_aa0._4_4_ +
                     auVar172._4_4_ * (float)local_ab0._4_4_ +
                     auVar213._4_4_ * (float)local_a90._4_4_;
                auVar132._8_4_ =
                     auVar215._8_4_ * fStack_a78 +
                     auVar134._8_4_ * fStack_a98 +
                     auVar172._8_4_ * fStack_aa8 + auVar213._8_4_ * fStack_a88;
                auVar132._12_4_ =
                     auVar215._12_4_ * fStack_a74 +
                     auVar134._12_4_ * fStack_a94 +
                     auVar172._12_4_ * fStack_aa4 + auVar213._12_4_ * fStack_a84;
                local_960._0_16_ = auVar132;
                auVar172 = vsubps_avx(auVar214,auVar132);
                _local_a00 = auVar172;
                auVar172 = vdpps_avx(auVar172,auVar172,0x7f);
                fVar208 = auVar172._0_4_;
                local_be0 = auVar442._0_4_;
                if (fVar208 < 0.0) {
                  local_ae0._0_16_ = ZEXT416((uint)fVar163);
                  local_a40._0_4_ = fVar233;
                  local_b00._0_4_ = fVar249;
                  fVar210 = sqrtf(fVar208);
                  auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar249 = (float)local_b00._0_4_;
                  fVar233 = (float)local_a40._0_4_;
                  auVar213 = local_ae0._0_16_;
                }
                else {
                  auVar213 = vsqrtss_avx(auVar172,auVar172);
                  fVar210 = auVar213._0_4_;
                  auVar213 = ZEXT416((uint)fVar163);
                }
                fVar250 = auVar213._0_4_;
                auVar134 = vshufps_avx(ZEXT416((uint)(fVar233 * 0.5)),ZEXT416((uint)(fVar233 * 0.5))
                                       ,0);
                auVar215 = ZEXT416((uint)((fVar249 + (float)local_b20._0_4_ * 4.0) * 0.5));
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar173 = ZEXT416((uint)((fVar251 * -fVar251 - (float)local_b20._0_4_ * 4.0) * 0.5)
                                  );
                auVar173 = vshufps_avx(auVar173,auVar173,0);
                auVar133 = ZEXT416((uint)(fVar250 * -fVar250 * 0.5));
                auVar133 = vshufps_avx(auVar133,auVar133,0);
                auVar402._0_4_ =
                     (float)local_a80._0_4_ * auVar133._0_4_ +
                     (float)local_aa0._0_4_ * auVar173._0_4_ +
                     (float)local_ab0._0_4_ * auVar134._0_4_ +
                     (float)local_a90._0_4_ * auVar215._0_4_;
                auVar402._4_4_ =
                     (float)local_a80._4_4_ * auVar133._4_4_ +
                     (float)local_aa0._4_4_ * auVar173._4_4_ +
                     (float)local_ab0._4_4_ * auVar134._4_4_ +
                     (float)local_a90._4_4_ * auVar215._4_4_;
                auVar402._8_4_ =
                     fStack_a78 * auVar133._8_4_ +
                     fStack_a98 * auVar173._8_4_ +
                     fStack_aa8 * auVar134._8_4_ + fStack_a88 * auVar215._8_4_;
                auVar402._12_4_ =
                     fStack_a74 * auVar133._12_4_ +
                     fStack_a94 * auVar173._12_4_ +
                     fStack_aa4 * auVar134._12_4_ + fStack_a84 * auVar215._12_4_;
                auVar215 = vshufps_avx(auVar428._0_16_,auVar428._0_16_,0);
                auVar134 = ZEXT416((uint)(fVar250 - (fVar251 + fVar251)));
                auVar173 = vshufps_avx(auVar134,auVar134,0);
                auVar134 = ZEXT416((uint)(fVar251 - (fVar250 + fVar250)));
                auVar133 = vshufps_avx(auVar134,auVar134,0);
                auVar213 = vshufps_avx(auVar213,auVar213,0);
                auVar134 = vdpps_avx(auVar402,auVar402,0x7f);
                auVar174._0_4_ =
                     (float)local_a80._0_4_ * auVar213._0_4_ +
                     (float)local_aa0._0_4_ * auVar133._0_4_ +
                     (float)local_ab0._0_4_ * auVar215._0_4_ +
                     (float)local_a90._0_4_ * auVar173._0_4_;
                auVar174._4_4_ =
                     (float)local_a80._4_4_ * auVar213._4_4_ +
                     (float)local_aa0._4_4_ * auVar133._4_4_ +
                     (float)local_ab0._4_4_ * auVar215._4_4_ +
                     (float)local_a90._4_4_ * auVar173._4_4_;
                auVar174._8_4_ =
                     fStack_a78 * auVar213._8_4_ +
                     fStack_a98 * auVar133._8_4_ +
                     fStack_aa8 * auVar215._8_4_ + fStack_a88 * auVar173._8_4_;
                auVar174._12_4_ =
                     fStack_a74 * auVar213._12_4_ +
                     fStack_a94 * auVar133._12_4_ +
                     fStack_aa4 * auVar215._12_4_ + fStack_a84 * auVar173._12_4_;
                auVar213 = vblendps_avx(auVar134,_DAT_01feba10,0xe);
                auVar215 = vrsqrtss_avx(auVar213,auVar213);
                fVar233 = auVar215._0_4_;
                fVar249 = auVar134._0_4_;
                auVar215 = vdpps_avx(auVar402,auVar174,0x7f);
                auVar173 = vshufps_avx(auVar134,auVar134,0);
                auVar175._0_4_ = auVar174._0_4_ * auVar173._0_4_;
                auVar175._4_4_ = auVar174._4_4_ * auVar173._4_4_;
                auVar175._8_4_ = auVar174._8_4_ * auVar173._8_4_;
                auVar175._12_4_ = auVar174._12_4_ * auVar173._12_4_;
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar258._0_4_ = auVar402._0_4_ * auVar215._0_4_;
                auVar258._4_4_ = auVar402._4_4_ * auVar215._4_4_;
                auVar258._8_4_ = auVar402._8_4_ * auVar215._8_4_;
                auVar258._12_4_ = auVar402._12_4_ * auVar215._12_4_;
                auVar133 = vsubps_avx(auVar175,auVar258);
                auVar215 = vrcpss_avx(auVar213,auVar213);
                auVar213 = vmaxss_avx(ZEXT416((uint)fVar168),
                                      ZEXT416((uint)(local_be0 * (float)local_9a0._0_4_)));
                auVar215 = ZEXT416((uint)(auVar215._0_4_ * (2.0 - fVar249 * auVar215._0_4_)));
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                uVar126 = CONCAT44(auVar402._4_4_,auVar402._0_4_);
                auVar280._0_8_ = uVar126 ^ 0x8000000080000000;
                auVar280._8_4_ = -auVar402._8_4_;
                auVar280._12_4_ = -auVar402._12_4_;
                auVar173 = ZEXT416((uint)(fVar233 * 1.5 +
                                         fVar249 * -0.5 * fVar233 * fVar233 * fVar233));
                auVar173 = vshufps_avx(auVar173,auVar173,0);
                auVar237._0_4_ = auVar173._0_4_ * auVar133._0_4_ * auVar215._0_4_;
                auVar237._4_4_ = auVar173._4_4_ * auVar133._4_4_ * auVar215._4_4_;
                auVar237._8_4_ = auVar173._8_4_ * auVar133._8_4_ * auVar215._8_4_;
                auVar237._12_4_ = auVar173._12_4_ * auVar133._12_4_ * auVar215._12_4_;
                auVar303._0_4_ = auVar402._0_4_ * auVar173._0_4_;
                auVar303._4_4_ = auVar402._4_4_ * auVar173._4_4_;
                auVar303._8_4_ = auVar402._8_4_ * auVar173._8_4_;
                auVar303._12_4_ = auVar402._12_4_ * auVar173._12_4_;
                local_b20._0_16_ = auVar402;
                local_ae0._0_4_ = auVar213._0_4_;
                if (fVar249 < 0.0) {
                  local_a40._0_4_ = fVar210;
                  local_b00._0_16_ = auVar280;
                  local_9c0._0_16_ = auVar303;
                  local_9e0._0_16_ = auVar237;
                  fVar233 = sqrtf(fVar249);
                  auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar237 = local_9e0._0_16_;
                  auVar280 = local_b00._0_16_;
                  auVar303 = local_9c0._0_16_;
                  fVar249 = (float)local_ae0._0_4_;
                }
                else {
                  auVar134 = vsqrtss_avx(auVar134,auVar134);
                  fVar233 = auVar134._0_4_;
                  local_a40._0_4_ = fVar210;
                  fVar249 = auVar213._0_4_;
                }
                auVar213 = vdpps_avx(_local_a00,auVar303,0x7f);
                fVar233 = (fVar168 / fVar233) * ((float)local_a40._0_4_ + 1.0) +
                          fVar249 + (float)local_a40._0_4_ * fVar168;
                auVar134 = vdpps_avx(auVar280,auVar303,0x7f);
                auVar215 = vdpps_avx(_local_a00,auVar237,0x7f);
                auVar173 = vdpps_avx(_local_970,auVar303,0x7f);
                auVar133 = vdpps_avx(_local_a00,auVar280,0x7f);
                fVar210 = auVar134._0_4_ + auVar215._0_4_;
                fVar250 = auVar213._0_4_;
                auVar135._0_4_ = fVar250 * fVar250;
                auVar135._4_4_ = auVar213._4_4_ * auVar213._4_4_;
                auVar135._8_4_ = auVar213._8_4_ * auVar213._8_4_;
                auVar135._12_4_ = auVar213._12_4_ * auVar213._12_4_;
                auVar215 = vsubps_avx(auVar172,auVar135);
                local_a40._0_16_ = ZEXT416((uint)fVar210);
                auVar134 = vdpps_avx(_local_a00,_local_970,0x7f);
                fVar163 = auVar133._0_4_ - fVar250 * fVar210;
                fVar250 = auVar134._0_4_ - fVar250 * auVar173._0_4_;
                auVar134 = vrsqrtss_avx(auVar215,auVar215);
                fVar252 = auVar215._0_4_;
                fVar210 = auVar134._0_4_;
                fVar210 = fVar210 * 1.5 + fVar252 * -0.5 * fVar210 * fVar210 * fVar210;
                if (fVar252 < 0.0) {
                  local_b00._0_16_ = auVar213;
                  local_9c0._0_4_ = fVar233;
                  local_9e0._0_16_ = auVar173;
                  local_780._0_4_ = fVar163;
                  local_7a0._0_4_ = fVar250;
                  local_7c0._0_4_ = fVar210;
                  fVar252 = sqrtf(fVar252);
                  auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar233 = (float)local_9c0._0_4_;
                  fVar210 = (float)local_7c0._0_4_;
                  fVar163 = (float)local_780._0_4_;
                  fVar250 = (float)local_7a0._0_4_;
                  auVar173 = local_9e0._0_16_;
                  auVar213 = local_b00._0_16_;
                  fVar249 = (float)local_ae0._0_4_;
                }
                else {
                  auVar134 = vsqrtss_avx(auVar215,auVar215);
                  fVar252 = auVar134._0_4_;
                }
                auVar409 = ZEXT1664(local_b20._0_16_);
                auVar215 = vpermilps_avx(local_960._0_16_,0xff);
                auVar133 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xff);
                fVar163 = fVar163 * fVar210 - auVar133._0_4_;
                auVar259._0_8_ = auVar173._0_8_ ^ 0x8000000080000000;
                auVar259._8_4_ = auVar173._8_4_ ^ 0x80000000;
                auVar259._12_4_ = auVar173._12_4_ ^ 0x80000000;
                auVar281._0_4_ = -fVar163;
                auVar281._4_4_ = 0x80000000;
                auVar281._8_4_ = 0x80000000;
                auVar281._12_4_ = 0x80000000;
                auVar419 = ZEXT1664(local_a40._0_16_);
                auVar134 = vinsertps_avx(ZEXT416((uint)(fVar250 * fVar210)),auVar259,0x10);
                auVar173 = vmovsldup_avx(ZEXT416((uint)(local_a40._0_4_ * fVar250 * fVar210 -
                                                       auVar173._0_4_ * fVar163)));
                auVar134 = vdivps_avx(auVar134,auVar173);
                auVar176 = ZEXT416((uint)(fVar252 - auVar215._0_4_));
                auVar215 = vinsertps_avx(auVar213,auVar176,0x10);
                auVar238._0_4_ = auVar215._0_4_ * auVar134._0_4_;
                auVar238._4_4_ = auVar215._4_4_ * auVar134._4_4_;
                auVar238._8_4_ = auVar215._8_4_ * auVar134._8_4_;
                auVar238._12_4_ = auVar215._12_4_ * auVar134._12_4_;
                auVar134 = vinsertps_avx(auVar281,local_a40._0_16_,0x1c);
                auVar134 = vdivps_avx(auVar134,auVar173);
                auVar216._0_4_ = auVar215._0_4_ * auVar134._0_4_;
                auVar216._4_4_ = auVar215._4_4_ * auVar134._4_4_;
                auVar216._8_4_ = auVar215._8_4_ * auVar134._8_4_;
                auVar216._12_4_ = auVar215._12_4_ * auVar134._12_4_;
                auVar134 = vhaddps_avx(auVar238,auVar238);
                auVar215 = vhaddps_avx(auVar216,auVar216);
                fVar251 = fVar251 - auVar134._0_4_;
                local_be0 = local_be0 - auVar215._0_4_;
                auVar442 = ZEXT464((uint)local_be0);
                auVar260._8_4_ = 0x7fffffff;
                auVar260._0_8_ = 0x7fffffff7fffffff;
                auVar260._12_4_ = 0x7fffffff;
                auVar270 = ZEXT1664(auVar260);
                auVar213 = vandps_avx(auVar213,auVar260);
                if (fVar233 <= auVar213._0_4_) {
LAB_01219f77:
                  bVar100 = false;
                }
                else {
                  auVar213 = vandps_avx(auVar176,auVar260);
                  if ((float)local_7e0._0_4_ * 1.9073486e-06 + fVar249 + fVar233 <= auVar213._0_4_)
                  goto LAB_01219f77;
                  local_be0 = local_be0 + (float)local_900._0_4_;
                  auVar442 = ZEXT464((uint)local_be0);
                  bVar100 = true;
                  if ((((fVar234 <= local_be0) &&
                       (fVar249 = *(float *)(ray + k * 4 + 0x80), local_be0 <= fVar249)) &&
                      (0.0 <= fVar251)) && (fVar251 <= 1.0)) {
                    auVar172 = vrsqrtss_avx(auVar172,auVar172);
                    fVar233 = auVar172._0_4_;
                    pGVar27 = (context->scene->geometries).items[uVar120].ptr;
                    if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar172 = ZEXT416((uint)(fVar233 * 1.5 +
                                               fVar208 * -0.5 * fVar233 * fVar233 * fVar233));
                      auVar172 = vshufps_avx(auVar172,auVar172,0);
                      auVar177._0_4_ = auVar172._0_4_ * (float)local_a00._0_4_;
                      auVar177._4_4_ = auVar172._4_4_ * (float)local_a00._4_4_;
                      auVar177._8_4_ = auVar172._8_4_ * fStack_9f8;
                      auVar177._12_4_ = auVar172._12_4_ * fStack_9f4;
                      auVar136._0_4_ = local_b20._0_4_ + auVar133._0_4_ * auVar177._0_4_;
                      auVar136._4_4_ = local_b20._4_4_ + auVar133._4_4_ * auVar177._4_4_;
                      auVar136._8_4_ = local_b20._8_4_ + auVar133._8_4_ * auVar177._8_4_;
                      auVar136._12_4_ = local_b20._12_4_ + auVar133._12_4_ * auVar177._12_4_;
                      auVar172 = vshufps_avx(auVar177,auVar177,0xc9);
                      auVar213 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xc9);
                      auVar178._0_4_ = auVar213._0_4_ * auVar177._0_4_;
                      auVar178._4_4_ = auVar213._4_4_ * auVar177._4_4_;
                      auVar178._8_4_ = auVar213._8_4_ * auVar177._8_4_;
                      auVar178._12_4_ = auVar213._12_4_ * auVar177._12_4_;
                      auVar217._0_4_ = local_b20._0_4_ * auVar172._0_4_;
                      auVar217._4_4_ = local_b20._4_4_ * auVar172._4_4_;
                      auVar217._8_4_ = local_b20._8_4_ * auVar172._8_4_;
                      auVar217._12_4_ = local_b20._12_4_ * auVar172._12_4_;
                      auVar134 = vsubps_avx(auVar217,auVar178);
                      auVar172 = vshufps_avx(auVar134,auVar134,0xc9);
                      auVar213 = vshufps_avx(auVar136,auVar136,0xc9);
                      auVar218._0_4_ = auVar213._0_4_ * auVar172._0_4_;
                      auVar218._4_4_ = auVar213._4_4_ * auVar172._4_4_;
                      auVar218._8_4_ = auVar213._8_4_ * auVar172._8_4_;
                      auVar218._12_4_ = auVar213._12_4_ * auVar172._12_4_;
                      auVar172 = vshufps_avx(auVar134,auVar134,0xd2);
                      auVar137._0_4_ = auVar136._0_4_ * auVar172._0_4_;
                      auVar137._4_4_ = auVar136._4_4_ * auVar172._4_4_;
                      auVar137._8_4_ = auVar136._8_4_ * auVar172._8_4_;
                      auVar137._12_4_ = auVar136._12_4_ * auVar172._12_4_;
                      auVar172 = vsubps_avx(auVar218,auVar137);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        uVar8 = vextractps_avx(auVar172,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar172,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(int *)(ray + k * 4 + 0xe0) = auVar172._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar251;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_a08;
                        *(uint *)(ray + k * 4 + 0x120) = uVar120;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar213 = vshufps_avx(ZEXT416((uint)fVar251),ZEXT416((uint)fVar251),0);
                        local_740 = (RTCHitN  [16])vshufps_avx(auVar172,auVar172,0x55);
                        auVar134 = vshufps_avx(auVar172,auVar172,0xaa);
                        local_720 = vshufps_avx(auVar172,auVar172,0);
                        auStack_730 = auVar134;
                        local_710 = auVar213;
                        local_700 = ZEXT816(0) << 0x20;
                        local_6f0 = local_760._0_8_;
                        uStack_6e8 = local_760._8_8_;
                        local_6e0 = local_750._0_8_;
                        uStack_6d8 = local_750._8_8_;
                        uVar32 = context->user->instID[0];
                        _local_6d0 = CONCAT44(uVar32,uVar32);
                        _uStack_6c8 = CONCAT44(uVar32,uVar32);
                        uVar32 = context->user->instPrimID[0];
                        _uStack_6c0 = CONCAT44(uVar32,uVar32);
                        _uStack_6b8 = CONCAT44(uVar32,uVar32);
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        local_b40 = *local_a10;
                        uStack_b38 = local_a10[1];
                        local_a70.valid = (int *)&local_b40;
                        local_a70.geometryUserPtr = pGVar27->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_740;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar27->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar409 = ZEXT1664(local_b20._0_16_);
                          auVar419 = ZEXT1664(local_a40._0_16_);
                          (*pGVar27->intersectionFilterN)(&local_a70);
                          auVar340._8_56_ = extraout_var;
                          auVar340._0_8_ = extraout_XMM1_Qa;
                          auVar213 = auVar340._0_16_;
                        }
                        auVar112._8_8_ = uStack_b38;
                        auVar112._0_8_ = local_b40;
                        if (auVar112 == (undefined1  [16])0x0) {
                          auVar172 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar213 = vpcmpeqd_avx(auVar213,auVar213);
                          auVar172 = auVar172 ^ auVar213;
                          auVar340 = ZEXT864(0);
                          auVar270 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var31 = context->args->filter;
                          auVar340 = ZEXT1664(ZEXT816(0));
                          auVar270 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar213 = vpcmpeqd_avx(auVar134,auVar134);
                          if ((p_Var31 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar409 = ZEXT1664(auVar409._0_16_);
                            auVar419 = ZEXT1664(auVar419._0_16_);
                            (*p_Var31)(&local_a70);
                            auVar213 = vpcmpeqd_avx(auVar213,auVar213);
                            auVar270 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar113._8_8_ = uStack_b38;
                          auVar113._0_8_ = local_b40;
                          auVar134 = vpcmpeqd_avx(auVar113,_DAT_01feba10);
                          auVar172 = auVar134 ^ auVar213;
                          if (auVar113 != (undefined1  [16])0x0) {
                            auVar134 = auVar134 ^ auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar213;
                          }
                        }
                        auVar442 = ZEXT464((uint)local_be0);
                        auVar179._8_8_ = 0x100000001;
                        auVar179._0_8_ = 0x100000001;
                        if ((auVar179 & auVar172) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar249;
                        }
                      }
                    }
                  }
                }
                auVar142 = local_640;
                auVar428 = ZEXT464((uint)fVar251);
                bVar128 = lVar125 != 0;
                lVar125 = lVar125 + -1;
              } while ((!bVar100) && (bVar128));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar149._4_4_ = uVar8;
              auVar149._0_4_ = uVar8;
              auVar149._8_4_ = uVar8;
              auVar149._12_4_ = uVar8;
              auVar149._16_4_ = uVar8;
              auVar149._20_4_ = uVar8;
              auVar149._24_4_ = uVar8;
              auVar149._28_4_ = uVar8;
              auVar153 = vcmpps_avx(_local_860,auVar149,2);
              local_640 = vandps_avx(auVar153,local_640);
              auVar142 = auVar142 & auVar153;
              auVar312 = ZEXT3264(local_940);
              uVar126 = local_680._0_8_;
            } while ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar142 >> 0x7f,0) != '\0') ||
                       (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar142 >> 0xbf,0) != '\0') ||
                     (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar142[0x1f] < '\0');
          }
          auVar150._0_4_ =
               (float)local_8a0._0_4_ * (float)local_800._0_4_ +
               (float)local_8c0._0_4_ * (float)local_820._0_4_ +
               (float)local_8e0._0_4_ * (float)local_840._0_4_;
          auVar150._4_4_ =
               (float)local_8a0._4_4_ * (float)local_800._4_4_ +
               (float)local_8c0._4_4_ * (float)local_820._4_4_ +
               (float)local_8e0._4_4_ * (float)local_840._4_4_;
          auVar150._8_4_ =
               fStack_898 * fStack_7f8 + fStack_8b8 * fStack_818 + fStack_8d8 * fStack_838;
          auVar150._12_4_ =
               fStack_894 * fStack_7f4 + fStack_8b4 * fStack_814 + fStack_8d4 * fStack_834;
          auVar150._16_4_ =
               fStack_890 * fStack_7f0 + fStack_8b0 * fStack_810 + fStack_8d0 * fStack_830;
          auVar150._20_4_ =
               fStack_88c * fStack_7ec + fStack_8ac * fStack_80c + fStack_8cc * fStack_82c;
          auVar150._24_4_ =
               fStack_888 * fStack_7e8 + fStack_8a8 * fStack_808 + fStack_8c8 * fStack_828;
          auVar150._28_4_ = fStack_884 + fStack_8a4 + fStack_8c4;
          auVar200._8_4_ = 0x7fffffff;
          auVar200._0_8_ = 0x7fffffff7fffffff;
          auVar200._12_4_ = 0x7fffffff;
          auVar200._16_4_ = 0x7fffffff;
          auVar200._20_4_ = 0x7fffffff;
          auVar200._24_4_ = 0x7fffffff;
          auVar200._28_4_ = 0x7fffffff;
          auVar142 = vandps_avx(auVar150,auVar200);
          auVar201._8_4_ = 0x3e99999a;
          auVar201._0_8_ = 0x3e99999a3e99999a;
          auVar201._12_4_ = 0x3e99999a;
          auVar201._16_4_ = 0x3e99999a;
          auVar201._20_4_ = 0x3e99999a;
          auVar201._24_4_ = 0x3e99999a;
          auVar201._28_4_ = 0x3e99999a;
          auVar142 = vcmpps_avx(auVar142,auVar201,1);
          auVar153 = vorps_avx(auVar142,local_620);
          auVar202._0_4_ = auVar312._0_4_ + (float)local_5c0._0_4_;
          auVar202._4_4_ = auVar312._4_4_ + (float)local_5c0._4_4_;
          auVar202._8_4_ = auVar312._8_4_ + fStack_5b8;
          auVar202._12_4_ = auVar312._12_4_ + fStack_5b4;
          auVar202._16_4_ = auVar312._16_4_ + fStack_5b0;
          auVar202._20_4_ = auVar312._20_4_ + fStack_5ac;
          auVar202._24_4_ = auVar312._24_4_ + fStack_5a8;
          auVar202._28_4_ = auVar312._28_4_ + fStack_5a4;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar229._4_4_ = uVar8;
          auVar229._0_4_ = uVar8;
          auVar229._8_4_ = uVar8;
          auVar229._12_4_ = uVar8;
          auVar229._16_4_ = uVar8;
          auVar229._20_4_ = uVar8;
          auVar229._24_4_ = uVar8;
          auVar229._28_4_ = uVar8;
          auVar142 = vcmpps_avx(auVar202,auVar229,2);
          _local_8c0 = vandps_avx(auVar142,local_5e0);
          auVar203._8_4_ = 3;
          auVar203._0_8_ = 0x300000003;
          auVar203._12_4_ = 3;
          auVar203._16_4_ = 3;
          auVar203._20_4_ = 3;
          auVar203._24_4_ = 3;
          auVar203._28_4_ = 3;
          auVar230._8_4_ = 2;
          auVar230._0_8_ = 0x200000002;
          auVar230._12_4_ = 2;
          auVar230._16_4_ = 2;
          auVar230._20_4_ = 2;
          auVar230._24_4_ = 2;
          auVar230._28_4_ = 2;
          auVar142 = vblendvps_avx(auVar230,auVar203,auVar153);
          auVar172 = vpcmpgtd_avx(auVar142._16_16_,local_6a0._0_16_);
          auVar213 = vpshufd_avx(local_600._0_16_,0);
          auVar213 = vpcmpgtd_avx(auVar142._0_16_,auVar213);
          auVar204._16_16_ = auVar172;
          auVar204._0_16_ = auVar213;
          _local_8e0 = vblendps_avx(ZEXT1632(auVar213),auVar204,0xf0);
          local_660 = vandnps_avx(_local_8e0,_local_8c0);
          auVar142 = _local_8c0 & ~_local_8e0;
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar142 >> 0x7f,0) != '\0') ||
                (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0xbf,0) != '\0') ||
              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar142[0x1f] < '\0') {
            _local_860 = _local_340;
            local_8a0._4_4_ = auVar312._4_4_ + (float)local_340._4_4_;
            local_8a0._0_4_ = auVar312._0_4_ + (float)local_340._0_4_;
            fStack_898 = auVar312._8_4_ + fStack_338;
            fStack_894 = auVar312._12_4_ + fStack_334;
            fStack_890 = auVar312._16_4_ + fStack_330;
            fStack_88c = auVar312._20_4_ + fStack_32c;
            fStack_888 = auVar312._24_4_ + fStack_328;
            fStack_884 = auVar312._28_4_ + fStack_324;
            do {
              auVar261 = auVar270._0_16_;
              auVar205._8_4_ = 0x7f800000;
              auVar205._0_8_ = 0x7f8000007f800000;
              auVar205._12_4_ = 0x7f800000;
              auVar205._16_4_ = 0x7f800000;
              auVar205._20_4_ = 0x7f800000;
              auVar205._24_4_ = 0x7f800000;
              auVar205._28_4_ = 0x7f800000;
              auVar142 = vblendvps_avx(auVar205,_local_860,local_660);
              auVar153 = vshufps_avx(auVar142,auVar142,0xb1);
              auVar153 = vminps_avx(auVar142,auVar153);
              auVar33 = vshufpd_avx(auVar153,auVar153,5);
              auVar153 = vminps_avx(auVar153,auVar33);
              auVar33 = vperm2f128_avx(auVar153,auVar153,1);
              auVar153 = vminps_avx(auVar153,auVar33);
              auVar153 = vcmpps_avx(auVar142,auVar153,0);
              auVar33 = local_660 & auVar153;
              auVar142 = local_660;
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0x7f,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0xbf,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                auVar142 = vandps_avx(auVar153,local_660);
              }
              uVar122 = vmovmskps_avx(auVar142);
              uVar32 = 0;
              if (uVar122 != 0) {
                for (; (uVar122 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar126 = (ulong)uVar32;
              *(undefined4 *)(local_660 + uVar126 * 4) = 0;
              fVar168 = local_560[uVar126];
              uVar32 = *(uint *)(local_320 + uVar126 * 4);
              fVar249 = local_b28;
              if ((float)local_980._0_4_ < 0.0) {
                fVar249 = sqrtf((float)local_980._0_4_);
                auVar261._8_4_ = 0x7fffffff;
                auVar261._0_8_ = 0x7fffffff7fffffff;
                auVar261._12_4_ = 0x7fffffff;
                auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar428 = ZEXT464(uVar32);
              auVar419 = ZEXT464((uint)fVar168);
              auVar213 = vminps_avx(_local_a80,_local_aa0);
              auVar172 = vmaxps_avx(_local_a80,_local_aa0);
              auVar134 = vminps_avx(_local_a90,_local_ab0);
              auVar215 = vminps_avx(auVar213,auVar134);
              auVar213 = vmaxps_avx(_local_a90,_local_ab0);
              auVar134 = vmaxps_avx(auVar172,auVar213);
              auVar172 = vandps_avx(auVar215,auVar261);
              auVar213 = vandps_avx(auVar134,auVar261);
              auVar172 = vmaxps_avx(auVar172,auVar213);
              auVar213 = vmovshdup_avx(auVar172);
              auVar213 = vmaxss_avx(auVar213,auVar172);
              auVar172 = vshufpd_avx(auVar172,auVar172,1);
              auVar172 = vmaxss_avx(auVar172,auVar213);
              fVar168 = auVar172._0_4_ * 1.9073486e-06;
              local_a40._0_4_ = fVar249 * 1.9073486e-06;
              local_7e0._0_16_ = vshufps_avx(auVar134,auVar134,0xff);
              lVar125 = 4;
              do {
                fVar251 = auVar419._0_4_;
                fVar163 = 1.0 - fVar251;
                fVar249 = fVar163 * fVar163;
                fVar208 = fVar163 * fVar249;
                fVar233 = fVar251 * fVar251;
                fVar210 = fVar251 * fVar233;
                fVar250 = fVar251 * fVar163;
                local_b20._0_4_ = fVar250;
                auVar172 = vshufps_avx(ZEXT416((uint)(fVar210 * 0.16666667)),
                                       ZEXT416((uint)(fVar210 * 0.16666667)),0);
                auVar213 = ZEXT416((uint)((fVar210 * 4.0 + fVar208 +
                                          fVar251 * fVar250 * 12.0 + fVar163 * fVar250 * 6.0) *
                                         0.16666667));
                auVar213 = vshufps_avx(auVar213,auVar213,0);
                auVar134 = ZEXT416((uint)((fVar208 * 4.0 + fVar210 +
                                          fVar163 * fVar250 * 12.0 + fVar251 * fVar250 * 6.0) *
                                         0.16666667));
                auVar134 = vshufps_avx(auVar134,auVar134,0);
                auVar215 = vshufps_avx(auVar428._0_16_,auVar428._0_16_,0);
                auVar219._0_4_ = auVar215._0_4_ * (float)local_970._0_4_ + 0.0;
                auVar219._4_4_ = auVar215._4_4_ * (float)local_970._4_4_ + 0.0;
                auVar219._8_4_ = auVar215._8_4_ * fStack_968 + 0.0;
                auVar219._12_4_ = auVar215._12_4_ * fStack_964 + 0.0;
                auVar215 = vshufps_avx(ZEXT416((uint)(fVar208 * 0.16666667)),
                                       ZEXT416((uint)(fVar208 * 0.16666667)),0);
                auVar138._0_4_ =
                     auVar215._0_4_ * (float)local_a80._0_4_ +
                     auVar134._0_4_ * (float)local_aa0._0_4_ +
                     auVar172._0_4_ * (float)local_ab0._0_4_ +
                     auVar213._0_4_ * (float)local_a90._0_4_;
                auVar138._4_4_ =
                     auVar215._4_4_ * (float)local_a80._4_4_ +
                     auVar134._4_4_ * (float)local_aa0._4_4_ +
                     auVar172._4_4_ * (float)local_ab0._4_4_ +
                     auVar213._4_4_ * (float)local_a90._4_4_;
                auVar138._8_4_ =
                     auVar215._8_4_ * fStack_a78 +
                     auVar134._8_4_ * fStack_a98 +
                     auVar172._8_4_ * fStack_aa8 + auVar213._8_4_ * fStack_a88;
                auVar138._12_4_ =
                     auVar215._12_4_ * fStack_a74 +
                     auVar134._12_4_ * fStack_a94 +
                     auVar172._12_4_ * fStack_aa4 + auVar213._12_4_ * fStack_a84;
                local_960._0_16_ = auVar138;
                auVar172 = vsubps_avx(auVar219,auVar138);
                _local_a00 = auVar172;
                auVar172 = vdpps_avx(auVar172,auVar172,0x7f);
                fVar208 = auVar172._0_4_;
                local_be0 = auVar428._0_4_;
                if (fVar208 < 0.0) {
                  local_ae0._0_16_ = ZEXT416((uint)fVar163);
                  local_9a0._0_4_ = fVar233;
                  local_b00._0_4_ = fVar249;
                  fVar210 = sqrtf(fVar208);
                  auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar249 = (float)local_b00._0_4_;
                  fVar233 = (float)local_9a0._0_4_;
                  auVar213 = local_ae0._0_16_;
                }
                else {
                  auVar213 = vsqrtss_avx(auVar172,auVar172);
                  fVar210 = auVar213._0_4_;
                  auVar213 = ZEXT416((uint)fVar163);
                }
                fVar250 = auVar213._0_4_;
                auVar134 = vshufps_avx(ZEXT416((uint)(fVar233 * 0.5)),ZEXT416((uint)(fVar233 * 0.5))
                                       ,0);
                auVar215 = ZEXT416((uint)((fVar249 + (float)local_b20._0_4_ * 4.0) * 0.5));
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar173 = ZEXT416((uint)((fVar251 * -fVar251 - (float)local_b20._0_4_ * 4.0) * 0.5)
                                  );
                auVar173 = vshufps_avx(auVar173,auVar173,0);
                auVar133 = ZEXT416((uint)(fVar250 * -fVar250 * 0.5));
                auVar133 = vshufps_avx(auVar133,auVar133,0);
                auVar403._0_4_ =
                     (float)local_a80._0_4_ * auVar133._0_4_ +
                     (float)local_aa0._0_4_ * auVar173._0_4_ +
                     (float)local_ab0._0_4_ * auVar134._0_4_ +
                     (float)local_a90._0_4_ * auVar215._0_4_;
                auVar403._4_4_ =
                     (float)local_a80._4_4_ * auVar133._4_4_ +
                     (float)local_aa0._4_4_ * auVar173._4_4_ +
                     (float)local_ab0._4_4_ * auVar134._4_4_ +
                     (float)local_a90._4_4_ * auVar215._4_4_;
                auVar403._8_4_ =
                     fStack_a78 * auVar133._8_4_ +
                     fStack_a98 * auVar173._8_4_ +
                     fStack_aa8 * auVar134._8_4_ + fStack_a88 * auVar215._8_4_;
                auVar403._12_4_ =
                     fStack_a74 * auVar133._12_4_ +
                     fStack_a94 * auVar173._12_4_ +
                     fStack_aa4 * auVar134._12_4_ + fStack_a84 * auVar215._12_4_;
                auVar215 = vshufps_avx(auVar419._0_16_,auVar419._0_16_,0);
                auVar134 = ZEXT416((uint)(fVar250 - (fVar251 + fVar251)));
                auVar173 = vshufps_avx(auVar134,auVar134,0);
                auVar134 = ZEXT416((uint)(fVar251 - (fVar250 + fVar250)));
                auVar133 = vshufps_avx(auVar134,auVar134,0);
                auVar213 = vshufps_avx(auVar213,auVar213,0);
                auVar134 = vdpps_avx(auVar403,auVar403,0x7f);
                auVar180._0_4_ =
                     (float)local_a80._0_4_ * auVar213._0_4_ +
                     (float)local_aa0._0_4_ * auVar133._0_4_ +
                     (float)local_ab0._0_4_ * auVar215._0_4_ +
                     (float)local_a90._0_4_ * auVar173._0_4_;
                auVar180._4_4_ =
                     (float)local_a80._4_4_ * auVar213._4_4_ +
                     (float)local_aa0._4_4_ * auVar133._4_4_ +
                     (float)local_ab0._4_4_ * auVar215._4_4_ +
                     (float)local_a90._4_4_ * auVar173._4_4_;
                auVar180._8_4_ =
                     fStack_a78 * auVar213._8_4_ +
                     fStack_a98 * auVar133._8_4_ +
                     fStack_aa8 * auVar215._8_4_ + fStack_a88 * auVar173._8_4_;
                auVar180._12_4_ =
                     fStack_a74 * auVar213._12_4_ +
                     fStack_a94 * auVar133._12_4_ +
                     fStack_aa4 * auVar215._12_4_ + fStack_a84 * auVar173._12_4_;
                auVar213 = vblendps_avx(auVar134,_DAT_01feba10,0xe);
                auVar215 = vrsqrtss_avx(auVar213,auVar213);
                fVar233 = auVar215._0_4_;
                fVar249 = auVar134._0_4_;
                auVar215 = vdpps_avx(auVar403,auVar180,0x7f);
                auVar173 = vshufps_avx(auVar134,auVar134,0);
                auVar181._0_4_ = auVar180._0_4_ * auVar173._0_4_;
                auVar181._4_4_ = auVar180._4_4_ * auVar173._4_4_;
                auVar181._8_4_ = auVar180._8_4_ * auVar173._8_4_;
                auVar181._12_4_ = auVar180._12_4_ * auVar173._12_4_;
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar262._0_4_ = auVar403._0_4_ * auVar215._0_4_;
                auVar262._4_4_ = auVar403._4_4_ * auVar215._4_4_;
                auVar262._8_4_ = auVar403._8_4_ * auVar215._8_4_;
                auVar262._12_4_ = auVar403._12_4_ * auVar215._12_4_;
                auVar133 = vsubps_avx(auVar181,auVar262);
                auVar215 = vrcpss_avx(auVar213,auVar213);
                auVar213 = vmaxss_avx(ZEXT416((uint)fVar168),
                                      ZEXT416((uint)(local_be0 * (float)local_a40._0_4_)));
                auVar442 = ZEXT1664(auVar213);
                auVar215 = ZEXT416((uint)(auVar215._0_4_ * (2.0 - fVar249 * auVar215._0_4_)));
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                uVar126 = CONCAT44(auVar403._4_4_,auVar403._0_4_);
                auVar282._0_8_ = uVar126 ^ 0x8000000080000000;
                auVar282._8_4_ = -auVar403._8_4_;
                auVar282._12_4_ = -auVar403._12_4_;
                auVar173 = ZEXT416((uint)(fVar233 * 1.5 +
                                         fVar249 * -0.5 * fVar233 * fVar233 * fVar233));
                auVar173 = vshufps_avx(auVar173,auVar173,0);
                auVar239._0_4_ = auVar173._0_4_ * auVar133._0_4_ * auVar215._0_4_;
                auVar239._4_4_ = auVar173._4_4_ * auVar133._4_4_ * auVar215._4_4_;
                auVar239._8_4_ = auVar173._8_4_ * auVar133._8_4_ * auVar215._8_4_;
                auVar239._12_4_ = auVar173._12_4_ * auVar133._12_4_ * auVar215._12_4_;
                auVar304._0_4_ = auVar403._0_4_ * auVar173._0_4_;
                auVar304._4_4_ = auVar403._4_4_ * auVar173._4_4_;
                auVar304._8_4_ = auVar403._8_4_ * auVar173._8_4_;
                auVar304._12_4_ = auVar403._12_4_ * auVar173._12_4_;
                local_b20._0_16_ = auVar403;
                local_ae0._0_4_ = auVar213._0_4_;
                if (fVar249 < 0.0) {
                  local_9a0._0_4_ = fVar210;
                  local_b00._0_16_ = auVar282;
                  local_9c0._0_16_ = auVar304;
                  local_9e0._0_16_ = auVar239;
                  fVar249 = sqrtf(fVar249);
                  auVar442 = ZEXT464((uint)local_ae0._0_4_);
                  auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar239 = local_9e0._0_16_;
                  auVar282 = local_b00._0_16_;
                  auVar304 = local_9c0._0_16_;
                  fVar210 = (float)local_9a0._0_4_;
                }
                else {
                  auVar213 = vsqrtss_avx(auVar134,auVar134);
                  fVar249 = auVar213._0_4_;
                }
                auVar213 = vdpps_avx(_local_a00,auVar304,0x7f);
                fVar249 = (fVar168 / fVar249) * (fVar210 + 1.0) + auVar442._0_4_ + fVar210 * fVar168
                ;
                auVar134 = vdpps_avx(auVar282,auVar304,0x7f);
                auVar215 = vdpps_avx(_local_a00,auVar239,0x7f);
                auVar173 = vdpps_avx(_local_970,auVar304,0x7f);
                auVar133 = vdpps_avx(_local_a00,auVar282,0x7f);
                fVar233 = auVar134._0_4_ + auVar215._0_4_;
                fVar210 = auVar213._0_4_;
                auVar139._0_4_ = fVar210 * fVar210;
                auVar139._4_4_ = auVar213._4_4_ * auVar213._4_4_;
                auVar139._8_4_ = auVar213._8_4_ * auVar213._8_4_;
                auVar139._12_4_ = auVar213._12_4_ * auVar213._12_4_;
                auVar215 = vsubps_avx(auVar172,auVar139);
                auVar134 = vdpps_avx(_local_a00,_local_970,0x7f);
                fVar250 = auVar133._0_4_ - fVar210 * fVar233;
                fVar163 = auVar134._0_4_ - fVar210 * auVar173._0_4_;
                auVar134 = vrsqrtss_avx(auVar215,auVar215);
                fVar252 = auVar215._0_4_;
                fVar210 = auVar134._0_4_;
                fVar210 = fVar210 * 1.5 + fVar252 * -0.5 * fVar210 * fVar210 * fVar210;
                if (fVar252 < 0.0) {
                  local_9a0._0_16_ = auVar213;
                  local_b00._0_4_ = fVar249;
                  local_9c0._0_16_ = ZEXT416((uint)fVar233);
                  local_9e0._0_16_ = auVar173;
                  local_780._0_4_ = fVar250;
                  local_7a0._0_4_ = fVar163;
                  local_7c0._0_4_ = fVar210;
                  fVar252 = sqrtf(fVar252);
                  auVar442 = ZEXT464((uint)local_ae0._0_4_);
                  auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar210 = (float)local_7c0._0_4_;
                  fVar250 = (float)local_780._0_4_;
                  fVar163 = (float)local_7a0._0_4_;
                  auVar173 = local_9e0._0_16_;
                  fVar249 = (float)local_b00._0_4_;
                  auVar213 = local_9a0._0_16_;
                  auVar134 = local_9c0._0_16_;
                }
                else {
                  auVar134 = vsqrtss_avx(auVar215,auVar215);
                  fVar252 = auVar134._0_4_;
                  auVar134 = ZEXT416((uint)fVar233);
                }
                auVar409 = ZEXT1664(local_b20._0_16_);
                auVar182 = vpermilps_avx(local_960._0_16_,0xff);
                auVar176 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xff);
                fVar233 = fVar250 * fVar210 - auVar176._0_4_;
                auVar263._0_8_ = auVar173._0_8_ ^ 0x8000000080000000;
                auVar263._8_4_ = auVar173._8_4_ ^ 0x80000000;
                auVar263._12_4_ = auVar173._12_4_ ^ 0x80000000;
                auVar283._0_4_ = -fVar233;
                auVar283._4_4_ = 0x80000000;
                auVar283._8_4_ = 0x80000000;
                auVar283._12_4_ = 0x80000000;
                auVar215 = vinsertps_avx(ZEXT416((uint)(fVar163 * fVar210)),auVar263,0x10);
                auVar133 = vmovsldup_avx(ZEXT416((uint)(auVar134._0_4_ * fVar163 * fVar210 -
                                                       auVar173._0_4_ * fVar233)));
                auVar215 = vdivps_avx(auVar215,auVar133);
                auVar182 = ZEXT416((uint)(fVar252 - auVar182._0_4_));
                auVar173 = vinsertps_avx(auVar213,auVar182,0x10);
                auVar240._0_4_ = auVar173._0_4_ * auVar215._0_4_;
                auVar240._4_4_ = auVar173._4_4_ * auVar215._4_4_;
                auVar240._8_4_ = auVar173._8_4_ * auVar215._8_4_;
                auVar240._12_4_ = auVar173._12_4_ * auVar215._12_4_;
                auVar134 = vinsertps_avx(auVar283,auVar134,0x1c);
                auVar134 = vdivps_avx(auVar134,auVar133);
                auVar220._0_4_ = auVar173._0_4_ * auVar134._0_4_;
                auVar220._4_4_ = auVar173._4_4_ * auVar134._4_4_;
                auVar220._8_4_ = auVar173._8_4_ * auVar134._8_4_;
                auVar220._12_4_ = auVar173._12_4_ * auVar134._12_4_;
                auVar134 = vhaddps_avx(auVar240,auVar240);
                auVar215 = vhaddps_avx(auVar220,auVar220);
                fVar251 = fVar251 - auVar134._0_4_;
                local_be0 = local_be0 - auVar215._0_4_;
                auVar428 = ZEXT464((uint)local_be0);
                auVar264._8_4_ = 0x7fffffff;
                auVar264._0_8_ = 0x7fffffff7fffffff;
                auVar264._12_4_ = 0x7fffffff;
                auVar270 = ZEXT1664(auVar264);
                auVar213 = vandps_avx(auVar213,auVar264);
                if (fVar249 <= auVar213._0_4_) {
LAB_0121ac31:
                  bVar100 = false;
                }
                else {
                  auVar213 = vandps_avx(auVar182,auVar264);
                  if ((float)local_7e0._0_4_ * 1.9073486e-06 + auVar442._0_4_ + fVar249 <=
                      auVar213._0_4_) goto LAB_0121ac31;
                  local_be0 = local_be0 + (float)local_900._0_4_;
                  auVar428 = ZEXT464((uint)local_be0);
                  bVar100 = true;
                  if ((((fVar234 <= local_be0) &&
                       (fVar249 = *(float *)(ray + k * 4 + 0x80), local_be0 <= fVar249)) &&
                      (0.0 <= fVar251)) && (fVar251 <= 1.0)) {
                    auVar172 = vrsqrtss_avx(auVar172,auVar172);
                    fVar233 = auVar172._0_4_;
                    pGVar27 = (context->scene->geometries).items[uVar120].ptr;
                    if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar172 = ZEXT416((uint)(fVar233 * 1.5 +
                                               fVar208 * -0.5 * fVar233 * fVar233 * fVar233));
                      auVar172 = vshufps_avx(auVar172,auVar172,0);
                      auVar183._0_4_ = auVar172._0_4_ * (float)local_a00._0_4_;
                      auVar183._4_4_ = auVar172._4_4_ * (float)local_a00._4_4_;
                      auVar183._8_4_ = auVar172._8_4_ * fStack_9f8;
                      auVar183._12_4_ = auVar172._12_4_ * fStack_9f4;
                      auVar140._0_4_ = local_b20._0_4_ + auVar176._0_4_ * auVar183._0_4_;
                      auVar140._4_4_ = local_b20._4_4_ + auVar176._4_4_ * auVar183._4_4_;
                      auVar140._8_4_ = local_b20._8_4_ + auVar176._8_4_ * auVar183._8_4_;
                      auVar140._12_4_ = local_b20._12_4_ + auVar176._12_4_ * auVar183._12_4_;
                      auVar172 = vshufps_avx(auVar183,auVar183,0xc9);
                      auVar213 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xc9);
                      auVar184._0_4_ = auVar213._0_4_ * auVar183._0_4_;
                      auVar184._4_4_ = auVar213._4_4_ * auVar183._4_4_;
                      auVar184._8_4_ = auVar213._8_4_ * auVar183._8_4_;
                      auVar184._12_4_ = auVar213._12_4_ * auVar183._12_4_;
                      auVar221._0_4_ = local_b20._0_4_ * auVar172._0_4_;
                      auVar221._4_4_ = local_b20._4_4_ * auVar172._4_4_;
                      auVar221._8_4_ = local_b20._8_4_ * auVar172._8_4_;
                      auVar221._12_4_ = local_b20._12_4_ * auVar172._12_4_;
                      auVar134 = vsubps_avx(auVar221,auVar184);
                      auVar172 = vshufps_avx(auVar134,auVar134,0xc9);
                      auVar213 = vshufps_avx(auVar140,auVar140,0xc9);
                      auVar222._0_4_ = auVar213._0_4_ * auVar172._0_4_;
                      auVar222._4_4_ = auVar213._4_4_ * auVar172._4_4_;
                      auVar222._8_4_ = auVar213._8_4_ * auVar172._8_4_;
                      auVar222._12_4_ = auVar213._12_4_ * auVar172._12_4_;
                      auVar172 = vshufps_avx(auVar134,auVar134,0xd2);
                      auVar141._0_4_ = auVar140._0_4_ * auVar172._0_4_;
                      auVar141._4_4_ = auVar140._4_4_ * auVar172._4_4_;
                      auVar141._8_4_ = auVar140._8_4_ * auVar172._8_4_;
                      auVar141._12_4_ = auVar140._12_4_ * auVar172._12_4_;
                      auVar172 = vsubps_avx(auVar222,auVar141);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar27->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        uVar8 = vextractps_avx(auVar172,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar172,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(int *)(ray + k * 4 + 0xe0) = auVar172._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar251;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_a08;
                        *(uint *)(ray + k * 4 + 0x120) = uVar120;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar213 = vshufps_avx(ZEXT416((uint)fVar251),ZEXT416((uint)fVar251),0);
                        local_740 = (RTCHitN  [16])vshufps_avx(auVar172,auVar172,0x55);
                        auVar134 = vshufps_avx(auVar172,auVar172,0xaa);
                        local_720 = vshufps_avx(auVar172,auVar172,0);
                        auStack_730 = auVar134;
                        local_710 = auVar213;
                        local_700 = ZEXT816(0) << 0x20;
                        local_6f0 = local_760._0_8_;
                        uStack_6e8 = local_760._8_8_;
                        local_6e0 = local_750._0_8_;
                        uStack_6d8 = local_750._8_8_;
                        uVar32 = context->user->instID[0];
                        _local_6d0 = CONCAT44(uVar32,uVar32);
                        _uStack_6c8 = CONCAT44(uVar32,uVar32);
                        uVar32 = context->user->instPrimID[0];
                        _uStack_6c0 = CONCAT44(uVar32,uVar32);
                        _uStack_6b8 = CONCAT44(uVar32,uVar32);
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        local_b40 = *local_a10;
                        uStack_b38 = local_a10[1];
                        local_a70.valid = (int *)&local_b40;
                        local_a70.geometryUserPtr = pGVar27->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_740;
                        local_a70.N = 4;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar27->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar409 = ZEXT1664(local_b20._0_16_);
                          auVar442 = ZEXT1664(auVar442._0_16_);
                          (*pGVar27->intersectionFilterN)(&local_a70);
                          auVar270._8_56_ = extraout_var_00;
                          auVar270._0_8_ = extraout_XMM1_Qa_00;
                          auVar213 = auVar270._0_16_;
                        }
                        auVar114._8_8_ = uStack_b38;
                        auVar114._0_8_ = local_b40;
                        if (auVar114 == (undefined1  [16])0x0) {
                          auVar172 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar213 = vpcmpeqd_avx(auVar213,auVar213);
                          auVar172 = auVar172 ^ auVar213;
                          auVar340 = ZEXT864(0);
                          auVar270 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var31 = context->args->filter;
                          auVar340 = ZEXT1664(ZEXT816(0));
                          auVar270 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar213 = vpcmpeqd_avx(auVar134,auVar134);
                          if ((p_Var31 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar409 = ZEXT1664(auVar409._0_16_);
                            auVar442 = ZEXT1664(auVar442._0_16_);
                            (*p_Var31)(&local_a70);
                            auVar213 = vpcmpeqd_avx(auVar213,auVar213);
                            auVar270 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar340 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar115._8_8_ = uStack_b38;
                          auVar115._0_8_ = local_b40;
                          auVar134 = vpcmpeqd_avx(auVar115,_DAT_01feba10);
                          auVar172 = auVar134 ^ auVar213;
                          if (auVar115 != (undefined1  [16])0x0) {
                            auVar134 = auVar134 ^ auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])local_a70.hit);
                            *(undefined1 (*) [16])(local_a70.ray + 0xc0) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x10));
                            *(undefined1 (*) [16])(local_a70.ray + 0xd0) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x20));
                            *(undefined1 (*) [16])(local_a70.ray + 0xe0) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x30));
                            *(undefined1 (*) [16])(local_a70.ray + 0xf0) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x40));
                            *(undefined1 (*) [16])(local_a70.ray + 0x100) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x50));
                            *(undefined1 (*) [16])(local_a70.ray + 0x110) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x60));
                            *(undefined1 (*) [16])(local_a70.ray + 0x120) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x70));
                            *(undefined1 (*) [16])(local_a70.ray + 0x130) = auVar213;
                            auVar213 = vmaskmovps_avx(auVar134,*(undefined1 (*) [16])
                                                                (local_a70.hit + 0x80));
                            *(undefined1 (*) [16])(local_a70.ray + 0x140) = auVar213;
                          }
                        }
                        auVar428 = ZEXT464((uint)local_be0);
                        auVar185._8_8_ = 0x100000001;
                        auVar185._0_8_ = 0x100000001;
                        if ((auVar185 & auVar172) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar249;
                        }
                      }
                    }
                  }
                }
                auVar142 = local_660;
                auVar419 = ZEXT464((uint)fVar251);
                bVar128 = lVar125 != 0;
                lVar125 = lVar125 + -1;
              } while ((!bVar100) && (bVar128));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar151._4_4_ = uVar8;
              auVar151._0_4_ = uVar8;
              auVar151._8_4_ = uVar8;
              auVar151._12_4_ = uVar8;
              auVar151._16_4_ = uVar8;
              auVar151._20_4_ = uVar8;
              auVar151._24_4_ = uVar8;
              auVar151._28_4_ = uVar8;
              auVar153 = vcmpps_avx(_local_8a0,auVar151,2);
              local_660 = vandps_avx(auVar153,local_660);
              auVar142 = auVar142 & auVar153;
              auVar312 = ZEXT3264(local_940);
              uVar126 = local_680._0_8_;
            } while ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar142 >> 0x7f,0) != '\0') ||
                       (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar142 >> 0xbf,0) != '\0') ||
                     (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar142[0x1f] < '\0');
          }
          auVar142 = vandps_avx(local_5a0,_local_580);
          auVar153 = vandps_avx(_local_8e0,_local_8c0);
          auVar231._0_4_ = auVar312._0_4_ + local_380._0_4_;
          auVar231._4_4_ = auVar312._4_4_ + local_380._4_4_;
          auVar231._8_4_ = auVar312._8_4_ + local_380._8_4_;
          auVar231._12_4_ = auVar312._12_4_ + local_380._12_4_;
          auVar231._16_4_ = auVar312._16_4_ + local_380._16_4_;
          auVar231._20_4_ = auVar312._20_4_ + local_380._20_4_;
          auVar231._24_4_ = auVar312._24_4_ + local_380._24_4_;
          auVar231._28_4_ = auVar312._28_4_ + local_380._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar269._4_4_ = uVar8;
          auVar269._0_4_ = uVar8;
          auVar269._8_4_ = uVar8;
          auVar269._12_4_ = uVar8;
          auVar269._16_4_ = uVar8;
          auVar269._20_4_ = uVar8;
          auVar269._24_4_ = uVar8;
          auVar269._28_4_ = uVar8;
          auVar33 = vcmpps_avx(auVar231,auVar269,2);
          auVar142 = vandps_avx(auVar33,auVar142);
          auVar290._0_4_ = auVar312._0_4_ + local_340._0_4_;
          auVar290._4_4_ = auVar312._4_4_ + local_340._4_4_;
          auVar290._8_4_ = auVar312._8_4_ + local_340._8_4_;
          auVar290._12_4_ = auVar312._12_4_ + local_340._12_4_;
          auVar290._16_4_ = auVar312._16_4_ + local_340._16_4_;
          auVar290._20_4_ = auVar312._20_4_ + local_340._20_4_;
          auVar290._24_4_ = auVar312._24_4_ + local_340._24_4_;
          auVar290._28_4_ = auVar312._28_4_ + local_340._28_4_;
          auVar33 = vcmpps_avx(auVar290,auVar269,2);
          auVar153 = vandps_avx(auVar33,auVar153);
          auVar153 = vorps_avx(auVar142,auVar153);
          if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar153 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar153 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar153 >> 0x7f,0) != '\0') ||
                (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar153 >> 0xbf,0) != '\0') ||
              (auVar153 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar153[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar121 * 0x60) = auVar153;
            auVar142 = vblendvps_avx(_local_340,_local_380,auVar142);
            *(undefined1 (*) [32])(auStack_160 + uVar121 * 0x60) = auVar142;
            auVar117._8_8_ = uStack_908;
            auVar117._0_8_ = local_910;
            uVar9 = vmovlps_avx(auVar117);
            *(undefined8 *)(afStack_140 + uVar121 * 0x18) = uVar9;
            auStack_138[uVar121 * 0x18] = (int)uVar126 + 1;
            uVar121 = (ulong)((int)uVar121 + 1);
          }
        }
        auVar270 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    do {
      if ((int)uVar121 == 0) {
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar156._4_4_ = uVar8;
        auVar156._0_4_ = uVar8;
        auVar156._8_4_ = uVar8;
        auVar156._12_4_ = uVar8;
        auVar156._16_4_ = uVar8;
        auVar156._20_4_ = uVar8;
        auVar156._24_4_ = uVar8;
        auVar156._28_4_ = uVar8;
        auVar142 = vcmpps_avx(local_2c0,auVar156,2);
        uVar120 = vmovmskps_avx(auVar142);
        uVar120 = (uint)local_8e8 - 1 & (uint)local_8e8 & uVar120;
        if (uVar120 == 0) {
          return;
        }
        goto LAB_012183f2;
      }
      uVar127 = (ulong)((int)uVar121 - 1);
      lVar125 = uVar127 * 0x60;
      auVar142 = *(undefined1 (*) [32])(auStack_160 + lVar125);
      auVar152._0_4_ = auVar312._0_4_ + auVar142._0_4_;
      auVar152._4_4_ = auVar312._4_4_ + auVar142._4_4_;
      auVar152._8_4_ = auVar312._8_4_ + auVar142._8_4_;
      auVar152._12_4_ = auVar312._12_4_ + auVar142._12_4_;
      auVar152._16_4_ = auVar312._16_4_ + auVar142._16_4_;
      auVar152._20_4_ = auVar312._20_4_ + auVar142._20_4_;
      auVar152._24_4_ = auVar312._24_4_ + auVar142._24_4_;
      auVar152._28_4_ = auVar312._28_4_ + auVar142._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar248._4_4_ = uVar8;
      auVar248._0_4_ = uVar8;
      auVar248._8_4_ = uVar8;
      auVar248._12_4_ = uVar8;
      auVar248._16_4_ = uVar8;
      auVar248._20_4_ = uVar8;
      auVar248._24_4_ = uVar8;
      auVar248._28_4_ = uVar8;
      auVar33 = vcmpps_avx(auVar152,auVar248,2);
      auVar153 = vandps_avx(auVar33,*(undefined1 (*) [32])(auStack_180 + lVar125));
      _local_740 = auVar153;
      auVar33 = *(undefined1 (*) [32])(auStack_180 + lVar125) & auVar33;
      bVar105 = (auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar106 = (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar104 = (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar103 = SUB321(auVar33 >> 0x7f,0) == '\0';
      bVar102 = (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar101 = SUB321(auVar33 >> 0xbf,0) == '\0';
      bVar128 = (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar100 = -1 < auVar33[0x1f];
      if (((((((!bVar105 || !bVar106) || !bVar104) || !bVar103) || !bVar102) || !bVar101) ||
          !bVar128) || !bVar100) {
        auVar232._8_4_ = 0x7f800000;
        auVar232._0_8_ = 0x7f8000007f800000;
        auVar232._12_4_ = 0x7f800000;
        auVar232._16_4_ = 0x7f800000;
        auVar232._20_4_ = 0x7f800000;
        auVar232._24_4_ = 0x7f800000;
        auVar232._28_4_ = 0x7f800000;
        auVar142 = vblendvps_avx(auVar232,auVar142,auVar153);
        auVar33 = vshufps_avx(auVar142,auVar142,0xb1);
        auVar33 = vminps_avx(auVar142,auVar33);
        auVar34 = vshufpd_avx(auVar33,auVar33,5);
        auVar33 = vminps_avx(auVar33,auVar34);
        auVar34 = vperm2f128_avx(auVar33,auVar33,1);
        auVar33 = vminps_avx(auVar33,auVar34);
        auVar142 = vcmpps_avx(auVar142,auVar33,0);
        auVar33 = auVar153 & auVar142;
        if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0x7f,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar33 >> 0xbf,0) != '\0') ||
            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar33[0x1f] < '\0') {
          auVar153 = vandps_avx(auVar142,auVar153);
        }
        fVar168 = afStack_140[uVar127 * 0x18 + 1];
        uVar126 = (ulong)auStack_138[uVar127 * 0x18];
        uVar122 = vmovmskps_avx(auVar153);
        uVar32 = 0;
        if (uVar122 != 0) {
          for (; (uVar122 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
          }
        }
        fVar249 = afStack_140[uVar127 * 0x18];
        *(undefined4 *)(local_740 + (ulong)uVar32 * 4) = 0;
        if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_740 >> 0x7f,0) != '\0') ||
              (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_740 >> 0xbf,0) != '\0') ||
            (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_740[0x1f] < '\0') {
          uVar127 = uVar121;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar125) = _local_740;
        auVar172 = vshufps_avx(ZEXT416((uint)(fVar168 - fVar249)),ZEXT416((uint)(fVar168 - fVar249))
                               ,0);
        local_380._4_4_ = fVar249 + auVar172._4_4_ * 0.14285715;
        local_380._0_4_ = fVar249 + auVar172._0_4_ * 0.0;
        fStack_378 = fVar249 + auVar172._8_4_ * 0.2857143;
        fStack_374 = fVar249 + auVar172._12_4_ * 0.42857146;
        fStack_370 = fVar249 + auVar172._0_4_ * 0.5714286;
        fStack_36c = fVar249 + auVar172._4_4_ * 0.71428573;
        fStack_368 = fVar249 + auVar172._8_4_ * 0.8571429;
        fStack_364 = fVar249 + auVar172._12_4_;
        local_910 = *(undefined8 *)(local_380 + (ulong)uVar32 * 4);
        uStack_908 = 0;
      }
      uVar121 = uVar127;
    } while (((((((bVar105 && bVar106) && bVar104) && bVar103) && bVar102) && bVar101) && bVar128)
             && bVar100);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }